

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O2

void __thiscall
Tagliatelle<TTA>::PerformLabelingMem
          (Tagliatelle<TTA> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  Mat1b *pMVar3;
  long lVar4;
  pointer puVar5;
  pointer piVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  char cVar8;
  uint uVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  undefined4 *puVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int c;
  long lVar21;
  ulong uVar22;
  void *__child_stack;
  int iVar23;
  long lVar24;
  long lVar25;
  char cVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  int r;
  long lVar31;
  void *__arg;
  long lVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  double dVar45;
  long *local_3f8;
  long *local_3e0;
  MemMat<int> img_labels;
  ulong local_308;
  ulong local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  MemMat<unsigned_char> img;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_128;
  long local_120;
  allocator_type local_109;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_108;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar23 = *(int *)&pMVar3->field_0x8;
  lVar17 = (long)iVar23;
  iVar12 = *(int *)&pMVar3->field_0xc;
  lVar38 = (long)iVar12;
  local_108 = accesses;
  TTA::MemAlloc(((iVar23 + 1) / 2) * ((iVar12 + 1) / 2) + 1);
  TTA::MemSetup();
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar2;
  local_f8.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  lVar36 = lVar38 + -2;
  iVar27 = (int)lVar36;
  if (iVar23 != 1) {
    uVar16 = 0xfffffffffffffffe;
    while( true ) {
      lVar28 = (long)(int)uVar16;
      uVar13 = lVar28 + 2;
      if (iVar27 <= (int)uVar13) break;
      piVar1 = (int *)(img.accesses_._16_8_ + 8 + lVar28 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(img.img_._16_8_ + 2 + lVar28) != '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + 0xc + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(img.img_._16_8_ + 3 + lVar28);
LAB_002afe59:
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = uVar9;
        lVar28 = img_labels.accesses_._16_8_;
        lVar43 = img_labels.img_._16_8_;
        if (cVar26 == '\0') goto LAB_002b005b;
LAB_002afee4:
        iVar11 = (int)uVar13;
        lVar34 = (long)iVar11;
        lVar44 = lVar34 << 0x20;
        lVar24 = lVar34 * 4;
        lVar42 = 0;
        lVar28 = img_labels.accesses_._16_8_;
        lVar43 = img_labels.img_._16_8_;
        do {
          uVar13 = lVar34 + lVar42 + 2;
          lVar40 = lVar44 >> 0x1e;
          iVar35 = (int)lVar42;
          if (lVar36 <= (long)uVar13) {
            piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x200000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar24 = lVar44 + 0x200000000 >> 0x20;
            if (iVar27 < iVar11 + iVar35 + 2) {
              if ((*(char *)(img.img_._16_8_ + lVar24) == '\0') &&
                 (piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + lVar24 * 4
                                  ), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar24 + img.img_._16_8_ + *(long *)img.img_._72_8_) == '\0')) {
LAB_002b0339:
                piVar1 = (int *)(lVar28 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar43 + lVar24 * 4) = 0;
                goto LAB_002b0726;
              }
            }
            else if (*(char *)(img.img_._16_8_ + lVar24) == '\0') {
              lVar34 = *(long *)img.accesses_._72_8_;
              piVar1 = (int *)(lVar34 + img.accesses_._16_8_ + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img.img_._72_8_;
              cVar26 = *(char *)(lVar24 + lVar42 + img.img_._16_8_);
              piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x300000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              if (cVar26 == '\0') {
                lVar44 = lVar44 + 0x300000000 >> 0x20;
                if ((*(char *)(img.img_._16_8_ + lVar44) == '\0') &&
                   (piVar1 = (int *)(lVar34 + img.accesses_._16_8_ + lVar44 * 4),
                   *piVar1 = *piVar1 + 1, *(char *)(lVar42 + img.img_._16_8_ + lVar44) == '\0'))
                goto LAB_002b0339;
                uVar9 = TTA::MemNewLabel();
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar24 * 4) = uVar9;
                goto LAB_002b0726;
              }
            }
            else {
              piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x300000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
            }
            *(int *)(lVar28 + lVar40) = *(int *)(lVar28 + lVar40) + 1;
            uVar10 = *(undefined4 *)(lVar43 + lVar40);
            piVar1 = (int *)(lVar28 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar43 + lVar24 * 4) = uVar10;
            goto LAB_002b0726;
          }
          lVar25 = img.accesses_._16_8_ + lVar24;
          piVar1 = (int *)(lVar25 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = img.img_._16_8_ + lVar34;
          if (*(char *)(lVar42 + 2 + lVar21) == '\0') {
            lVar18 = *(long *)img.accesses_._72_8_;
            piVar1 = (int *)(lVar18 + 8 + lVar25 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar19 = *(long *)img.img_._72_8_;
            cVar26 = *(char *)(lVar19 + 2 + lVar21 + lVar42);
            piVar1 = (int *)(lVar25 + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            cVar8 = *(char *)(lVar42 + 3 + lVar21);
            if (cVar26 == '\0') {
              if (cVar8 == '\0') {
                piVar1 = (int *)(img.accesses_._16_8_ + lVar18 + lVar24 + 0xc + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar19 + lVar34) == '\0') {
                  uVar16 = (ulong)(iVar11 + iVar35 + 2);
                  goto LAB_002b0261;
                }
                uVar9 = TTA::MemNewLabel();
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 + 8 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                lVar28 = img_labels.accesses_._16_8_;
                lVar43 = img_labels.img_._16_8_;
              }
              else {
                uVar9 = TTA::MemNewLabel();
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 + 8 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                lVar28 = img_labels.accesses_._16_8_;
                lVar43 = img_labels.img_._16_8_;
              }
            }
            else {
              if (cVar8 == '\0') goto LAB_002b0037;
              piVar1 = (int *)(lVar28 + lVar24 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = *(uint *)(lVar43 + lVar24 + lVar42 * 4);
              piVar1 = (int *)(lVar28 + lVar24 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          else {
            piVar1 = (int *)(lVar25 + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 3 + lVar21) == '\0') goto LAB_002b0037;
            piVar1 = (int *)(lVar28 + lVar24 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = *(uint *)(lVar43 + lVar24 + lVar42 * 4);
            piVar1 = (int *)(lVar28 + lVar24 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
          }
          *(uint *)(lVar43 + lVar24 + 8 + lVar42 * 4) = uVar9;
          lVar44 = lVar44 + 0x200000000;
          lVar42 = lVar42 + 2;
        } while( true );
      }
      lVar43 = *(long *)img.accesses_._72_8_;
      piVar1 = (int *)(lVar43 + img.accesses_._16_8_ + 8 + lVar28 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img.img_._72_8_;
      cVar8 = *(char *)(lVar28 + 2 + lVar24 + img.img_._16_8_);
      piVar1 = (int *)(img.accesses_._16_8_ + 0xc + lVar28 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(img.img_._16_8_ + 3 + lVar28);
      if (cVar8 != '\0') goto LAB_002afe59;
      if (cVar26 != '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = uVar9;
        goto LAB_002afee4;
      }
      piVar1 = (int *)(lVar43 + img.accesses_._16_8_ + 0xc + lVar28 * 4);
      *piVar1 = *piVar1 + 1;
      uVar16 = uVar13;
      if (*(char *)(lVar24 + img.img_._16_8_ + 3 + lVar28) != '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = uVar9;
        goto LAB_002afee4;
      }
LAB_002b0261:
      piVar1 = (int *)(img_labels.accesses_._16_8_ + uVar13 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + uVar13 * 4) = 0;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + 8 + lVar28 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(img.img_._16_8_ + 2 + lVar28);
    if (iVar27 < (int)uVar13) {
      if ((cVar26 == '\0') &&
         (piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ + 8 + lVar28 * 4),
         *piVar1 = *piVar1 + 1,
         *(char *)(lVar28 + 2 + img.img_._16_8_ + *(long *)img.img_._72_8_) == '\0')) {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = 0;
      }
      else {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = uVar9;
      }
    }
    else {
      if (cVar26 == '\0') {
        lVar43 = *(long *)img.accesses_._72_8_;
        piVar1 = (int *)(lVar43 + img.accesses_._16_8_ + 8 + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = *(long *)img.img_._72_8_;
        cVar26 = *(char *)(lVar28 + 2 + lVar24 + img.img_._16_8_);
        piVar1 = (int *)(img.accesses_._16_8_ + 0xc + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
        if (((cVar26 == '\0') && (*(char *)(img.img_._16_8_ + 3 + lVar28) == '\0')) &&
           (piVar1 = (int *)(lVar43 + img.accesses_._16_8_ + 0xc + lVar28 * 4),
           *piVar1 = *piVar1 + 1, *(char *)(lVar24 + img.img_._16_8_ + 3 + lVar28) == '\0')) {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = 0;
          goto LAB_002b0726;
        }
      }
      else {
        piVar1 = (int *)(img.accesses_._16_8_ + 0xc + lVar28 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar9 = TTA::MemNewLabel();
      piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar28 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(img_labels.img_._16_8_ + 8 + lVar28 * 4) = uVar9;
    }
LAB_002b0726:
    lVar28 = 1;
    uVar16 = 2;
    local_148 = 3;
    lVar43 = 0;
LAB_002b0738:
    if ((long)uVar16 < (long)*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74)
    {
      lVar24 = *(long *)img.accesses_._72_8_;
      lVar44 = lVar24 * uVar16;
      *(int *)(img.accesses_._16_8_ + lVar44) = *(int *)(img.accesses_._16_8_ + lVar44) + 1;
      lVar34 = *(long *)img.img_._72_8_;
      lVar42 = lVar34 * uVar16;
      cVar26 = *(char *)(img.img_._16_8_ + lVar42);
      if (2 < iVar12) {
        if (cVar26 == '\0') {
          lVar25 = lVar24 * (uVar16 | 1);
          piVar1 = (int *)(img.accesses_._16_8_ + lVar25);
          *piVar1 = *piVar1 + 1;
          lVar40 = (uVar16 | 1) * lVar34;
          cVar26 = *(char *)(img.img_._16_8_ + lVar40);
          piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar44);
          *piVar1 = *piVar1 + 1;
          cVar8 = *(char *)(img.img_._16_8_ + 1 + lVar42);
          if (cVar26 == '\0') {
            if (cVar8 == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar25);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(img.img_._16_8_ + 1 + lVar40) != '\0') {
                uVar9 = TTA::MemNewLabel();
                piVar1 = (int *)(img_labels.accesses_._16_8_ +
                                *(long *)img_labels.accesses_._72_8_ * uVar16);
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = uVar9
                ;
                local_3e0 = (long *)0x0;
                goto LAB_002b2171;
              }
              piVar1 = (int *)(img_labels.accesses_._16_8_ +
                              *(long *)img_labels.accesses_._72_8_ * uVar16);
              *piVar1 = *piVar1 + 1;
              puVar14 = (undefined4 *)
                        (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_);
              local_3e0 = (long *)0x0;
              goto LAB_002b0ed3;
            }
          }
          else if (cVar8 == '\0') {
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(img_labels.accesses_._16_8_ +
                            *(long *)img_labels.accesses_._72_8_ * uVar16);
            *piVar1 = *piVar1 + 1;
            *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = uVar9;
            local_3e0 = (long *)0x0;
            goto LAB_002b6307;
          }
          lVar42 = lVar24 * (uVar16 - 1);
          piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar42);
          *piVar1 = *piVar1 + 1;
          lVar44 = (uVar16 - 1) * lVar34;
          if (*(char *)(img.img_._16_8_ + 1 + lVar44) != '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * (uVar16 - 2));
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + (uVar16 - 2) * lVar34);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
            local_3e0 = (long *)0x0;
            goto LAB_002b5619;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + 8 + lVar42);
          *piVar1 = *piVar1 + 1;
          cVar8 = *(char *)(img.img_._16_8_ + 2 + lVar44);
          *(int *)(img.accesses_._16_8_ + lVar42) = *(int *)(img.accesses_._16_8_ + lVar42) + 1;
          cVar26 = *(char *)(img.img_._16_8_ + lVar44);
          if (cVar8 != '\0') goto LAB_002b0c0a;
          if (cVar26 != '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * (uVar16 - 2));
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + (uVar16 - 2) * lVar34);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
            local_3e0 = (long *)0x0;
            goto LAB_002b47b5;
          }
        }
        else {
          lVar25 = lVar24 * (uVar16 - 1);
          piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar25);
          *piVar1 = *piVar1 + 1;
          lVar40 = (uVar16 - 1) * lVar34;
          if (*(char *)(img.img_._16_8_ + 1 + lVar40) != '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * (uVar16 - 2));
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + (uVar16 - 2) * lVar34);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
            local_3e0 = (long *)0x0;
            goto LAB_002bbafc;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar44);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(img.img_._16_8_ + 1 + lVar42) == '\0') {
            *(int *)(img.accesses_._16_8_ + lVar25) = *(int *)(img.accesses_._16_8_ + lVar25) + 1;
            if (*(char *)(img.img_._16_8_ + lVar40) != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * (uVar16 - 2));
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + (uVar16 - 2) * lVar34);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
              local_3e0 = (long *)0x0;
              goto LAB_002b8cf4;
            }
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(img_labels.accesses_._16_8_ +
                            *(long *)img_labels.accesses_._72_8_ * uVar16);
            *piVar1 = *piVar1 + 1;
            *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = uVar9;
            local_3e0 = (long *)0x0;
            goto LAB_002b8673;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + 8 + lVar25);
          *piVar1 = *piVar1 + 1;
          cVar8 = *(char *)(img.img_._16_8_ + 2 + lVar40);
          *(int *)(img.accesses_._16_8_ + lVar25) = *(int *)(img.accesses_._16_8_ + lVar25) + 1;
          cVar26 = *(char *)(img.img_._16_8_ + lVar40);
          if (cVar8 != '\0') {
LAB_002b0c0a:
            lVar44 = uVar16 - 2;
            if (cVar26 == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar24 * lVar44);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar44 * lVar34);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
            }
            else {
              piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar24 * lVar44);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(img.img_._16_8_ + 1 + lVar34 * lVar44);
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              lVar42 = lVar24 * lVar44;
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              lVar44 = lVar44 * lVar34;
              uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar44);
              if (cVar26 == '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar42);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(img_labels.img_._16_8_ + 8 + lVar44));
                piVar1 = (int *)(img_labels.accesses_._16_8_ +
                                *(long *)img_labels.accesses_._72_8_ * uVar16);
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = uVar9
                ;
              }
              else {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar9;
              }
            }
            local_3e0 = (long *)0x0;
            goto LAB_002b3d3b;
          }
          if (cVar26 != '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * (uVar16 - 2));
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + (uVar16 - 2) * lVar34);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
            local_3e0 = (long *)0x0;
            goto LAB_002b47b5;
          }
        }
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * uVar16
                        );
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = uVar9;
        local_3e0 = (long *)0x0;
LAB_002b31c3:
        uVar13 = uVar16 | 1;
        lVar24 = uVar16 - 1;
        iVar11 = (int)local_3e0;
        lVar25 = (long)iVar11;
        lVar42 = lVar25 << 0x20;
        lVar34 = lVar25 * 4;
        lVar44 = 8;
        lVar40 = 0;
LAB_002b31ef:
        lVar21 = lVar42 >> 0x1e;
        if (lVar40 + lVar25 + 2 < lVar36) {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar34 +
                           8 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar19 = lVar42 >> 0x20;
          if (*(char *)(lVar40 + 2 + uVar16 * lVar18 + img.img_._16_8_ + lVar25) == '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * local_148 + img.accesses_._16_8_ +
                             lVar34 + 8 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 2 + img.img_._16_8_ + lVar25 + lVar18 * local_148) != '\0') {
              local_3e0 = (long *)((ulong)(iVar11 + 2) + lVar40);
              lVar44 = lVar42 + 0x300000000 >> 0x20;
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar16 +
                              (lVar42 + 0x300000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              if (*(char *)(lVar44 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
                lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                ;
                piVar1 = (int *)(lVar21 + lVar24);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                uVar10 = *(undefined4 *)(lVar21 + lVar34);
                piVar1 = (int *)(lVar24 + lVar25 * 4 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar34 + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
                goto LAB_002b6307;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * lVar24) != '\0') {
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * lVar43 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                                lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar34 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 8 +
                                 lVar40 * 4);
                piVar1 = (int *)(lVar21 + lVar24 * uVar16 + img_labels.accesses_._16_8_);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar21 + lVar34 * uVar16 +
                                                               img_labels.img_._16_8_));
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                          lVar25 * 4 + 8 + lVar40 * 4) = uVar9;
                goto LAB_002b5619;
              }
              lVar18 = lVar42 + 0x400000000 >> 0x20;
              piVar1 = (int *)((lVar42 + 0x400000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              if (*(char *)(lVar18 + lVar34 * lVar24 + img.img_._16_8_) == '\0') goto LAB_002b3c13;
              lVar24 = uVar16 - 2;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.accesses_._72_8_;
              lVar42 = lVar21 * uVar16 + img_labels.accesses_._16_8_;
              if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * lVar24) == '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar21 * lVar24 + lVar18 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_002b3cb2;
              }
              lVar24 = img_labels.accesses_._16_8_ + lVar21 * lVar43 + lVar25 * 4;
LAB_002b3aa1:
              piVar1 = (int *)(lVar24 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar24 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 8 +
                               lVar40 * 4);
              piVar1 = (int *)(lVar42 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar24 * uVar16 + img_labels.img_._16_8_ + lVar19 * 4);
              goto LAB_002b3cd7;
            }
            piVar1 = (int *)(img.accesses_._16_8_ + lVar34 + *(long *)img.accesses_._72_8_ * uVar16
                             + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = *(long *)img.img_._72_8_;
            lVar18 = img.img_._16_8_ + lVar25;
            if (*(char *)(lVar40 + 3 + uVar16 * lVar21 + lVar18) == '\0') {
              local_3e0 = (long *)((ulong)(iVar11 + 2) + lVar40);
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * local_148 + img.accesses_._16_8_ +
                               lVar25 * 4 + 0xc + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar40 + 3 + lVar18 + lVar21 * local_148) == '\0') {
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                puVar14 = (undefined4 *)
                          (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                           lVar25 * 4 + lVar44);
                goto LAB_002b0ed3;
              }
LAB_002b376f:
              uVar9 = TTA::MemNewLabel();
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                        lVar25 * 4 + 8 + lVar40 * 4) = uVar9;
              goto LAB_002b2171;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34
                             + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar18 + lVar21 * lVar28) != '\0') {
LAB_002b4281:
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar43 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              local_3e0 = (long *)(ulong)(iVar11 + (int)lVar40 + 2);
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        (lVar34 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (lVar34 * uVar16 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
              goto LAB_002b5619;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34
                             + 0x10 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 4 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_ + lVar25)
                == '\0') goto code_r0x002b3351;
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar24 * lVar43 + img_labels.accesses_._16_8_ + lVar25 * 4 + 0x10 +
                            lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_3e0 = (long *)(ulong)(iVar11 + (int)lVar40 + 2);
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)
                      (lVar34 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 0x10 + lVar40 * 4);
            piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                            lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4)
                 = uVar10;
          }
          else {
            local_3e0 = (long *)((ulong)(iVar11 + 2) + lVar40);
            lVar34 = lVar42 + 0x300000000 >> 0x20;
            piVar1 = (int *)((lVar42 + 0x300000000 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar34 + img.img_._16_8_ + lVar18 * lVar24) != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar43 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar34 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 8 +
                               lVar40 * 4);
              piVar1 = (int *)(lVar21 + lVar24 * uVar16 + img_labels.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar21 + lVar34 * uVar16 +
                                                             img_labels.img_._16_8_));
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                        lVar25 * 4 + 8 + lVar40 * 4) = uVar9;
              goto LAB_002bbafc;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar34 + lVar44 * uVar16 + img.img_._16_8_) == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar21 + lVar24);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar21 + lVar34);
              piVar1 = (int *)(lVar24 + lVar25 * 4 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
              goto LAB_002bdc67;
            }
            lVar18 = lVar42 + 0x400000000 >> 0x20;
            piVar1 = (int *)((lVar42 + 0x400000000 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar18 + img.img_._16_8_ + lVar44 * lVar24) == '\0') {
LAB_002b3c13:
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar21 + lVar24);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar21 + lVar34);
              piVar1 = (int *)(lVar24 + lVar25 * 4 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
              goto LAB_002bcf4e;
            }
            lVar24 = uVar16 - 2;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            lVar42 = lVar44 * uVar16 + img_labels.accesses_._16_8_;
            if (*(char *)(lVar34 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_) != '\0') {
              lVar24 = img_labels.accesses_._16_8_ + lVar44 * lVar43 + lVar25 * 4;
              goto LAB_002b3aa1;
            }
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * lVar24 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
LAB_002b3cb2:
            lVar24 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)((uVar16 - 2) * lVar24 + img_labels.img_._16_8_ + lVar18 * 4);
            piVar1 = (int *)(lVar42 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar24 * uVar16 + img_labels.img_._16_8_ + lVar19 * 4);
LAB_002b3cd7:
            uVar9 = TTA::MemMerge(uVar9,uVar30);
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar25 * 4
                      + 8 + lVar40 * 4) = uVar9;
          }
LAB_002b3d3b:
          lVar24 = uVar16 - 1;
          iVar11 = (int)local_3e0;
          lVar25 = (long)iVar11;
          lVar42 = lVar25 << 0x20;
          lVar34 = lVar25 * 4;
          lVar44 = 8;
          lVar40 = 0;
LAB_002b3d7a:
          lVar21 = lVar42 >> 0x1e;
          if (lVar36 <= lVar40 + lVar25 + 2) {
            local_3e0 = (long *)((ulong)(iVar11 + 2) + lVar40);
            if (iVar27 < (int)local_3e0) goto LAB_002bd13c;
            lVar44 = lVar42 + 0x200000000 >> 0x20;
            piVar1 = (int *)((lVar42 + 0x200000000 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar44 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * (uVar16 | 1) +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * (uVar16 | 1));
              lVar34 = lVar42 + 0x300000000 >> 0x20;
              piVar1 = (int *)((lVar42 + 0x300000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img.img_._72_8_;
              cVar8 = *(char *)(lVar34 + lVar42 * uVar16 + img.img_._16_8_);
              if (cVar26 != '\0') {
                if (cVar8 != '\0') {
                  piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24);
                  goto LAB_002b44e9;
                }
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                goto LAB_002b478b;
              }
              if (cVar8 == '\0') goto LAB_002b77c1;
              lVar24 = *(long *)img_labels.accesses_._72_8_;
            }
            else {
              piVar1 = (int *)((lVar42 + 0x300000000 >> 0x1e) +
                              img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar42 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar34 * lVar24)
              ;
LAB_002b44e9:
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              if (cVar26 == '\0') {
LAB_002b478b:
                lVar24 = img_labels.accesses_._16_8_ + lVar24 * uVar16;
                *(int *)(lVar21 + lVar24) = *(int *)(lVar21 + lVar24) + 1;
                lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                uVar10 = *(undefined4 *)(lVar21 + lVar34);
                goto LAB_002b47a8;
              }
            }
            piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
LAB_002be807:
            piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
LAB_002be819:
            *(uint *)(lVar24 + lVar44 * 4) = uVar9;
            goto LAB_002c0aee;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar34 +
                           8 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar19 = img.img_._16_8_ + lVar25;
          iVar35 = (int)lVar40;
          if (*(char *)(lVar40 + 2 + uVar16 * lVar18 + lVar19) != '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34
                             + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar19 + lVar18 * lVar28) != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar43 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              local_3e0 = (long *)(ulong)(iVar11 + iVar35 + 2);
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        (lVar34 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (lVar34 * uVar16 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
              goto LAB_002bbafc;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar34
                             + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar40 + 3 + uVar16 * lVar18 + img.img_._16_8_ + lVar25) == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar21 + lVar24);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar21 + lVar34);
              piVar1 = (int *)(lVar24 + lVar25 * 4 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              local_3e0 = (long *)(ulong)(iVar11 + iVar35 + 2);
              *(undefined4 *)(lVar34 + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
              goto LAB_002bdc67;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34
                             + 0x10 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 4 + img.img_._16_8_ + lVar25 + lVar18 * lVar28) == '\0')
            goto LAB_002b4305;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar34
                             + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar40 + 3 +
                              *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_ + lVar25);
LAB_002b4006:
            lVar18 = *(long *)img_labels.accesses_._72_8_;
            if (cVar26 == '\0') {
              piVar1 = (int *)(lVar43 * lVar18 + img_labels.accesses_._16_8_ + lVar34 + 0x10 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar43 * lVar21 + img_labels.img_._16_8_ + lVar34 + 0x10 +
                               lVar40 * 4);
              piVar1 = (int *)(lVar18 * uVar16 + img_labels.accesses_._16_8_ + lVar34 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar21 * uVar16 +
                                                    img_labels.img_._16_8_ + lVar34 + lVar40 * 4));
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + lVar34 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
            }
            else {
              piVar1 = (int *)(lVar43 * lVar18 + img_labels.accesses_._16_8_ + lVar34 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              lVar21 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar43 * lVar21 + img_labels.img_._16_8_ + lVar34 + 8 + lVar40 * 4);
              piVar1 = (int *)(lVar18 * uVar16 + img_labels.accesses_._16_8_ + lVar34 + 8 +
                              lVar40 * 4);
              *piVar1 = *piVar1 + 1;
            }
LAB_002b422d:
            *(uint *)(img_labels.img_._16_8_ + lVar34 + lVar21 * uVar16 + 8 + lVar40 * 4) = uVar9;
            lVar42 = lVar42 + 0x200000000;
            lVar40 = lVar40 + 2;
            lVar44 = lVar44 + 8;
            goto LAB_002b3d7a;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * local_148 + img.accesses_._16_8_ + lVar34
                           + 8 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar40 + 2 + lVar19 + lVar18 * local_148);
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar34 +
                           0xc + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          lVar19 = img.img_._16_8_ + lVar25;
          cVar8 = *(char *)(lVar40 + 3 + uVar16 * lVar18 + lVar19);
          if (cVar26 == '\0') {
            if (cVar8 != '\0') {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ +
                               lVar34 + 0xc + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar40 + 3 + lVar19 + lVar18 * lVar28) == '\0') {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ +
                                 lVar34 + 0x10 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar40 + 4 + lVar28 * lVar21 + img.img_._16_8_ + lVar25) == '\0') {
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar24 * lVar43 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                                  lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_3e0 = (long *)(ulong)(iVar11 + iVar35 + 2);
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(undefined4 *)
                            (lVar34 * lVar43 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4)
                  ;
                  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar25 * 4 + 8 +
                                  lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (lVar34 * uVar16 + img_labels.img_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4) = uVar10
                  ;
                  goto LAB_002b47b5;
                }
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ +
                                 lVar34 + 0xc + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar40 + 3 + img.img_._16_8_ + lVar25 + lVar21 * lVar43);
                lVar18 = *(long *)img_labels.accesses_._72_8_;
                lVar19 = lVar43 * lVar18 + img_labels.accesses_._16_8_ + lVar34;
                piVar1 = (int *)(lVar19 + 8 + lVar40 * 4);
                *piVar1 = *piVar1 + 1;
                lVar21 = *(long *)img_labels.img_._72_8_;
                lVar32 = lVar43 * lVar21 + img_labels.img_._16_8_ + lVar34;
                uVar9 = *(uint *)(lVar32 + 8 + lVar40 * 4);
                if (cVar26 == '\0') {
                  piVar1 = (int *)(lVar19 + 0x10 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar32 + 0x10 + lVar40 * 4));
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                   img_labels.accesses_._16_8_ + lVar34 + 8 + lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar21 = *(long *)img_labels.img_._72_8_;
                }
                else {
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 + lVar18 * uVar16 + 8 +
                                  lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                }
                goto LAB_002b422d;
              }
              goto LAB_002b4281;
            }
            local_3e0 = (long *)((ulong)(iVar11 + 2) + lVar40);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * local_148 + img.accesses_._16_8_ +
                             lVar25 * 4 + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar40 + 3 + lVar19 + lVar18 * local_148) == '\0') {
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar40 * 4);
              *piVar1 = *piVar1 + 1;
              puVar14 = (undefined4 *)
                        (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         lVar25 * 4 + lVar44);
              goto LAB_002b0ed3;
            }
            goto LAB_002b376f;
          }
          if (cVar8 == '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar21 + lVar24);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
            uVar10 = *(undefined4 *)(lVar21 + lVar34);
            piVar1 = (int *)(lVar24 + lVar25 * 4 + 8 + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            local_3e0 = (long *)(ulong)(iVar11 + iVar35 + 2);
            *(undefined4 *)(lVar34 + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
            goto LAB_002b6307;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34 +
                           0xc + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar40 + 3 + lVar19 + lVar18 * lVar28) != '\0') goto LAB_002b4281;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34 +
                           0x10 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar40 + 4 + lVar28 * lVar18 + img.img_._16_8_ + lVar25) != '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar34
                             + 0xc + lVar40 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar40 + 3 + img.img_._16_8_ + lVar25 + lVar18 * lVar43);
            goto LAB_002b4006;
          }
LAB_002b4305:
          lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar21 + lVar24);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
          uVar10 = *(undefined4 *)(lVar21 + lVar34);
          piVar1 = (int *)(lVar24 + lVar25 * 4 + 8 + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          local_3e0 = (long *)(ulong)(iVar11 + iVar35 + 2);
          *(undefined4 *)(lVar34 + lVar25 * 4 + 8 + lVar40 * 4) = uVar10;
LAB_002bcf4e:
          local_300 = uVar16 | 1;
          local_308 = uVar16 - 1;
          uVar13 = (long)(int)local_3e0;
LAB_002bcfa3:
          local_3e0 = (long *)(uVar13 + 2);
          iVar11 = (int)uVar13;
          if (lVar36 <= (long)local_3e0) {
            if (iVar27 < (int)local_3e0) goto LAB_002bd13c;
            lVar44 = (long)(int)local_3e0;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar44 + lVar24 * uVar16 + img.img_._16_8_) == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * local_300 +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar24 * local_300);
              lVar24 = (uVar13 << 0x20) + 0x300000000;
              lVar34 = lVar24 >> 0x20;
              piVar1 = (int *)((lVar24 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img.img_._72_8_;
              cVar8 = *(char *)(lVar34 + lVar24 * uVar16 + img.img_._16_8_);
              if (cVar26 != '\0') {
                if (cVar8 != '\0') {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_
                                  + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar24 * local_308);
                  goto joined_r0x002be9ad;
                }
                goto LAB_002beece;
              }
              if (cVar8 != '\0') {
                piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * local_308 +
                                lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar24 * local_308);
joined_r0x002bac8d:
                if (cVar26 == '\0') goto LAB_002bbaf2;
                goto LAB_002bbab0;
              }
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * local_300 +
                              lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar24 * local_300);
              goto joined_r0x002c0aae;
            }
            lVar34 = (uVar13 << 0x20) + 0x300000000;
            piVar1 = (int *)((lVar34 >> 0x1e) +
                            img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * local_308);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)((lVar34 >> 0x20) + img.img_._16_8_ + lVar24 * local_308);
joined_r0x002be9ad:
            if (cVar26 == '\0') goto LAB_002beece;
            lVar24 = uVar16 - 2;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar44 + lVar34 * lVar24 + img.img_._16_8_) != '\0') {
              lVar42 = (long)iVar11;
              piVar1 = (int *)(local_308 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * local_308) == '\0') {
                lVar42 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar42 * lVar24 + img_labels.accesses_._16_8_ + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar24 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
                goto LAB_002c009b;
              }
              lVar34 = (uVar13 << 0x20) + 0x100000000;
              piVar1 = (int *)((lVar34 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar34 >> 0x20) +
                                *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar25 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar25 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar40 = *(long *)img_labels.img_._72_8_;
              lVar24 = lVar24 * lVar40 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + lVar42 * 4);
              if (cVar26 == '\0') {
                piVar1 = (int *)(lVar25 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + lVar44 * 4));
LAB_002c0721:
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                goto LAB_002ba185;
              }
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(img_labels.img_._16_8_ + lVar40 * uVar16 + lVar44 * 4) = uVar9;
              goto LAB_002c0aee;
            }
            lVar42 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar42 * lVar24 + img_labels.accesses_._16_8_ + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar24 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
LAB_002c009b:
            piVar1 = (int *)(lVar42 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
            goto LAB_002ba170;
          }
          lVar24 = *(long *)img.accesses_._72_8_;
          lVar42 = lVar24 * uVar16 + img.accesses_._16_8_;
          piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          lVar44 = lVar34 * uVar16 + img.img_._16_8_;
          if (*(char *)((long)local_3e0 + lVar44) == '\0') {
            piVar1 = (int *)(lVar24 * local_300 + img.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)local_3e0 + lVar34 * local_300 + img.img_._16_8_) == '\0') {
              lVar24 = (uVar13 << 0x20) + 0x300000000;
              lVar34 = lVar24 >> 0x20;
              piVar1 = (int *)((lVar24 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img.img_._72_8_;
              if (*(char *)(lVar34 + lVar24 * uVar16 + img.img_._16_8_) == '\0') {
                piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * local_300 +
                                lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar34 + img.img_._16_8_ + lVar24 * local_300) == '\0') {
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  goto LAB_002c01c4;
                }
                uVar9 = TTA::MemNewLabel();
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                goto LAB_002befcd;
              }
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * local_308 +
                              lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar34 + img.img_._16_8_ + lVar24 * local_308) != '\0')
              goto LAB_002b126d;
              lVar24 = (uVar13 << 0x20) + 0x400000000;
              piVar1 = (int *)((lVar24 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar24 = lVar24 >> 0x20;
              if (*(char *)(lVar24 + local_308 * *(long *)img.img_._72_8_ + img.img_._16_8_) != '\0'
                 ) goto LAB_002bd811;
LAB_002bfe82:
              uVar9 = TTA::MemNewLabel();
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
LAB_002bfea8:
              piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                       (long)local_3e0 * 4) = uVar9;
              goto LAB_002b31c3;
            }
            piVar1 = (int *)(lVar42 + 0xc + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar44 + 3 + uVar13) == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
              piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
              goto LAB_002b6307;
            }
            lVar44 = lVar24 * local_308 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar44 + 0xc + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = lVar34 * local_308 + img.img_._16_8_;
            if (*(char *)(uVar13 + 3 + lVar24) != '\0') {
              lVar24 = uVar16 - 2;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              if (*(char *)((long)local_3e0 + lVar34 * lVar24 + img.img_._16_8_) == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar24 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ +
                                                     (long)iVar11 * 4));
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         (long)local_3e0 * 4) = uVar9;
                goto LAB_002b5619;
              }
              lVar44 = (long)iVar11;
              piVar1 = (int *)(local_308 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * local_308) == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar24 * lVar42 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4);
                goto LAB_002bfc4e;
              }
              lVar34 = (uVar13 << 0x20) + 0x100000000;
              piVar1 = (int *)((lVar34 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar34 >> 0x20) +
                                *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img_labels.img_._72_8_;
              lVar24 = lVar24 * lVar42 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + lVar44 * 4);
              if (cVar26 != '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + (long)local_3e0 * 4) = uVar9;
                goto LAB_002b5619;
              }
              piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + (long)local_3e0 * 4));
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              goto LAB_002b6998;
            }
            piVar1 = (int *)(lVar44 + 0x10 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar24 + 4 + uVar13);
          }
          else {
            lVar40 = lVar24 * local_308 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar40 + 0xc + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = lVar34 * local_308 + img.img_._16_8_;
            if (*(char *)(uVar13 + 3 + lVar24) != '\0') {
              lVar24 = uVar16 - 2;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              if (*(char *)((long)local_3e0 + lVar34 * lVar24 + img.img_._16_8_) == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar24 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ +
                                                     (long)iVar11 * 4));
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         (long)local_3e0 * 4) = uVar9;
                goto LAB_002bbafc;
              }
              lVar44 = (long)iVar11;
              piVar1 = (int *)(local_308 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * local_308) == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar24 * lVar42 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ +
                                                     lVar44 * 4));
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         (long)local_3e0 * 4) = uVar9;
                goto LAB_002bbafc;
              }
              lVar34 = (uVar13 << 0x20) + 0x100000000;
              piVar1 = (int *)((lVar34 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar34 >> 0x20) +
                                *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img_labels.img_._72_8_;
              lVar24 = lVar24 * lVar42 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + lVar44 * 4);
              if (cVar26 != '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + (long)local_3e0 * 4) = uVar9;
                goto LAB_002bbafc;
              }
              piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + (long)local_3e0 * 4));
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              goto LAB_002b24a5;
            }
            piVar1 = (int *)(lVar42 + 0xc + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar44 + 3 + uVar13) == '\0') goto LAB_002bd4f5;
            piVar1 = (int *)(lVar40 + 0x10 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar24 + 4 + uVar13);
          }
          if (cVar26 == '\0') goto LAB_002bd0df;
          lVar24 = uVar16 - 2;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + 0xc +
                          uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
          if (*(char *)(uVar13 + 3 + lVar34) == '\0') {
            lVar42 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar42 * lVar24 + img_labels.accesses_._16_8_ + 0x10 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar24 * lVar34 + img_labels.img_._16_8_ + 0x10 + uVar13 * 4);
            lVar44 = (long)iVar11;
            piVar1 = (int *)(lVar42 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
LAB_002bda46:
            uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4);
LAB_002bda4d:
            uVar9 = TTA::MemMerge(uVar9,uVar30);
            lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
          }
          else {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar34 + (long)local_3e0) != '\0') {
              lVar44 = (long)iVar11;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * local_308 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              if (*(char *)(lVar44 + local_308 * lVar34 + img.img_._16_8_) == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar24 * lVar42 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4);
                goto LAB_002bfd68;
              }
              lVar42 = (uVar13 << 0x20) + 0x100000000;
              piVar1 = (int *)((lVar42 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar42 >> 0x20) + img.img_._16_8_ + lVar34 * lVar24);
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img_labels.img_._72_8_;
              lVar24 = lVar24 * lVar42 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + lVar44 * 4);
              if (cVar26 == '\0') {
                piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + (long)local_3e0 * 4));
                lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002bc9b8:
                piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         (long)local_3e0 * 4) = uVar9;
              }
              else {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + (long)local_3e0 * 4) = uVar9;
              }
              goto LAB_002b3d3b;
            }
            lVar42 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar42 * lVar24 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar24 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
            lVar44 = (long)iVar11;
            piVar1 = (int *)(lVar42 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
LAB_002bfd61:
            uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4);
LAB_002bfd68:
            uVar9 = TTA::MemMerge(uVar9,uVar30);
            lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
          }
          piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
          goto LAB_002b3d3b;
        }
        local_3e0 = (long *)((ulong)(iVar11 + 2) + lVar40);
        if (iVar27 < (int)local_3e0) goto LAB_002bd13c;
        lVar44 = lVar42 + 0x200000000 >> 0x20;
        piVar1 = (int *)((lVar42 + 0x200000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar44 + lVar34 * uVar16 + img.img_._16_8_) != '\0') {
          piVar1 = (int *)((lVar42 + 0x300000000 >> 0x1e) +
                          img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)((lVar42 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar34 * lVar24);
joined_r0x002b3b7b:
          if (cVar26 == '\0') goto LAB_002b3b81;
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
          piVar1 = (int *)(lVar21 + lVar24 * uVar16 + img_labels.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar21 + lVar34 * uVar16 + img_labels.img_._16_8_);
LAB_002ba170:
          uVar9 = TTA::MemMerge(uVar9,uVar30);
          goto LAB_002ba175;
        }
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar13 + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar13);
        lVar34 = lVar42 + 0x300000000 >> 0x20;
        piVar1 = (int *)((lVar42 + 0x300000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img.img_._72_8_;
        cVar8 = *(char *)(lVar34 + lVar42 * uVar16 + img.img_._16_8_);
        if (cVar26 != '\0') {
          if (cVar8 != '\0') {
            piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24);
            goto joined_r0x002b3b7b;
          }
LAB_002b3b81:
          lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
          *(int *)(lVar21 + lVar24) = *(int *)(lVar21 + lVar24) + 1;
          lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
          uVar10 = *(undefined4 *)(lVar21 + lVar34);
LAB_002b47a8:
          piVar1 = (int *)(lVar24 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar34 + lVar44 * 4) = uVar10;
          goto LAB_002c0aee;
        }
        if (cVar8 != '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                          lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24) != '\0') goto LAB_002bbab0;
          goto LAB_002bbaf2;
        }
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar13 + lVar34 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar42 * uVar13;
        goto LAB_002bb5c5;
      }
      if (iVar12 == 2) {
        if (cVar26 == '\0') {
          lVar25 = lVar24 * (uVar16 | 1);
          piVar1 = (int *)(img.accesses_._16_8_ + lVar25);
          *piVar1 = *piVar1 + 1;
          lVar40 = (uVar16 | 1) * lVar34;
          if (*(char *)(img.img_._16_8_ + lVar40) == '\0') {
            piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar44);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(img.img_._16_8_ + 1 + lVar42) == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar25);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(img.img_._16_8_ + 1 + lVar40);
              goto joined_r0x002b0ad6;
            }
            lVar24 = lVar24 * (uVar16 - 1);
            piVar1 = (int *)(img.accesses_._16_8_ + 4 + lVar24);
            *piVar1 = *piVar1 + 1;
            lVar34 = lVar34 * (uVar16 - 1);
            if (*(char *)(img.img_._16_8_ + 1 + lVar34) == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + lVar24);
              *piVar1 = *piVar1 + 1;
              goto LAB_002b08b1;
            }
          }
          else {
            piVar1 = (int *)(img.accesses_._16_8_ + 4 + *(long *)img.accesses_._72_8_ * uVar16);
            *piVar1 = *piVar1 + 1;
            lVar24 = *(long *)img.img_._72_8_;
            if (*(char *)(img.img_._16_8_ + 1 + lVar24 * uVar16) == '\0') goto LAB_002b0adc;
            lVar34 = uVar16 - 1;
            piVar1 = (int *)(img.accesses_._16_8_ + 4 + *(long *)img.accesses_._72_8_ * lVar34);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(img.img_._16_8_ + 1 + lVar24 * lVar34) == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar34);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(img.img_._16_8_ + lVar34 * *(long *)img.img_._72_8_);
              goto joined_r0x002b0ab8;
            }
          }
        }
        else {
          lVar24 = uVar16 - 1;
          piVar1 = (int *)(img.accesses_._16_8_ + 4 + *(long *)img.accesses_._72_8_ * lVar24);
          *piVar1 = *piVar1 + 1;
          if ((*(char *)(img.img_._16_8_ + 1 + lVar34 * lVar24) == '\0') &&
             (piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24),
             *piVar1 = *piVar1 + 1,
             *(char *)(img.img_._16_8_ + lVar24 * *(long *)img.img_._72_8_) == '\0'))
          goto LAB_002b0adc;
        }
LAB_002b08bb:
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * (uVar16 - 2));
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + (uVar16 - 2) * lVar34);
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * uVar16) = uVar10;
      }
      else {
        if (cVar26 == '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * (uVar16 | 1));
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(img.img_._16_8_ + lVar34 * (uVar16 | 1));
joined_r0x002b0ad6:
          if (cVar26 == '\0') {
            piVar1 = (int *)(img_labels.accesses_._16_8_ +
                            *(long *)img_labels.accesses_._72_8_ * uVar16);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = 0;
            goto LAB_002c0aee;
          }
        }
        else {
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * (uVar16 - 1));
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar34 * (uVar16 - 1);
LAB_002b08b1:
          cVar26 = *(char *)(img.img_._16_8_ + lVar34);
joined_r0x002b0ab8:
          if (cVar26 != '\0') goto LAB_002b08bb;
        }
LAB_002b0adc:
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * uVar16
                        );
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * uVar16) = uVar9;
      }
      goto LAB_002c0aee;
    }
    if (this->o_rows == false) goto LAB_002c9b2c;
    lVar24 = (long)(iVar23 + -1);
    lVar43 = (long)(iVar23 + -2);
    lVar28 = (long)(iVar23 + -3);
    uVar16 = 0xfffffffffffffffe;
LAB_002c1370:
    lVar34 = (long)(int)uVar16;
    uVar16 = lVar34 + 2;
    if ((int)uVar16 < iVar27) {
      lVar44 = *(long *)img.accesses_._72_8_;
      lVar25 = lVar44 * lVar24 + img.accesses_._16_8_;
      piVar1 = (int *)(lVar25 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)img.img_._72_8_;
      lVar21 = lVar42 * lVar24 + img.img_._16_8_;
      lVar40 = img_labels.accesses_._16_8_;
      if (*(char *)(lVar34 + 2 + lVar21) == '\0') {
        piVar1 = (int *)(lVar25 + 0xc + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar21 + 3 + lVar34) == '\0') {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 +
                           img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          local_2e8 = *(long *)img_labels.img_._72_8_;
LAB_002c1b57:
          iVar23 = (int)uVar16;
          local_138 = img_labels.img_._16_8_;
          goto LAB_002c1b5a;
        }
        lVar25 = lVar44 * lVar43 + img.accesses_._16_8_;
        piVar1 = (int *)(lVar25 + 0xc + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        lVar21 = lVar42 * lVar43 + img.img_._16_8_;
        if (*(char *)(lVar34 + 3 + lVar21) != '\0') {
          local_148 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(local_148 * lVar28 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          local_308 = img_labels.img_._16_8_;
LAB_002c43cb:
          local_2f8 = local_148;
          uVar13 = local_308;
          local_308 = uVar16 & 0xffffffff;
          lVar34 = lVar40;
          goto LAB_002c4b9e;
        }
        piVar1 = (int *)(lVar25 + 0x10 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        cVar8 = *(char *)(lVar21 + 4 + lVar34);
        piVar1 = (int *)(lVar25 + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar21 + 2 + lVar34);
joined_r0x002c176f:
        if (cVar8 == '\0') {
          if (cVar26 != '\0') {
            local_3e0 = (long *)img_labels.accesses_._72_8_;
            local_148 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(local_148 * lVar28 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            local_3f8 = (long *)img_labels.img_._72_8_;
            local_150 = *(long *)img_labels.img_._72_8_;
            local_138 = img_labels.img_._16_8_;
            local_120 = img_labels.accesses_._16_8_;
            local_1d8 = img_labels.img_._16_8_;
            local_1e0 = img_labels.accesses_._16_8_;
            local_2c0 = img_labels.img_._16_8_;
            local_2c8 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            local_2f0 = img_labels.accesses_._16_8_;
            local_188 = img_labels.img_._16_8_;
            local_168 = img_labels.accesses_._16_8_;
            local_180 = img_labels.accesses_._16_8_;
            local_170 = img_labels.img_._16_8_;
            local_178 = img_labels.accesses_._16_8_;
            local_1b0 = img_labels.img_._16_8_;
            local_1b8 = img_labels.accesses_._16_8_;
            local_198 = img_labels.img_._16_8_;
            local_1a8 = img_labels.accesses_._16_8_;
            local_1f0 = img_labels.img_._16_8_;
            local_2d0 = img_labels.accesses_._16_8_;
            local_1c8 = img_labels.img_._16_8_;
            local_1d0 = img_labels.accesses_._16_8_;
            uVar13 = img_labels.img_._16_8_;
            uVar15 = uVar16 & 0xffffffff;
            local_308 = img_labels.img_._16_8_;
            local_2f8 = local_148;
            local_2e8 = local_150;
            local_1e8 = local_150;
            local_1c0 = local_150;
            local_1a0 = local_148;
            local_190 = local_150;
            local_128 = local_150;
            goto LAB_002c4188;
          }
          uVar9 = TTA::MemNewLabel();
          local_2f8 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002c1ad7;
        }
        if (cVar26 == '\0') {
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + 0x10 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(local_158 * lVar28 + img_labels.img_._16_8_ + 0x10 + lVar34 * 4);
          piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * lVar28 + 0xc + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar34 + 3 + img.img_._16_8_ + lVar42 * lVar28);
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          lVar42 = lVar44 * lVar28 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar42 + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          lVar40 = local_158 * lVar28 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar40 + 8 + lVar34 * 4);
          if (cVar26 != '\0') {
            piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + 8 + lVar34 * 4) = uVar9;
            local_120 = img_labels.accesses_._16_8_;
            lVar34 = img_labels.accesses_._16_8_;
            uVar13 = img_labels.img_._16_8_;
            local_138 = img_labels.img_._16_8_;
            local_3f8 = (long *)img_labels.img_._72_8_;
            local_3e0 = (long *)img_labels.accesses_._72_8_;
            local_2f8 = lVar44;
            local_2f0 = img_labels.accesses_._16_8_;
            local_2e8 = local_158;
            local_2d8 = img_labels.img_._16_8_;
            local_2d0 = img_labels.accesses_._16_8_;
            local_2c8 = img_labels.accesses_._16_8_;
            local_2c0 = img_labels.img_._16_8_;
            local_1f0 = img_labels.img_._16_8_;
            local_1e8 = local_158;
            local_1e0 = img_labels.accesses_._16_8_;
            local_1d8 = img_labels.img_._16_8_;
            local_1d0 = img_labels.accesses_._16_8_;
            local_1c8 = img_labels.img_._16_8_;
            local_1c0 = local_158;
            local_1b8 = img_labels.accesses_._16_8_;
            local_1b0 = img_labels.img_._16_8_;
            local_1a8 = img_labels.accesses_._16_8_;
            local_1a0 = lVar44;
            local_198 = img_labels.img_._16_8_;
            local_190 = local_158;
            local_188 = img_labels.img_._16_8_;
            local_180 = img_labels.accesses_._16_8_;
            local_178 = img_labels.accesses_._16_8_;
            local_170 = img_labels.img_._16_8_;
            local_168 = img_labels.accesses_._16_8_;
            goto LAB_002c2a4a;
          }
          piVar1 = (int *)(lVar42 + 0x10 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar40 + 0x10 + lVar34 * 4));
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
        }
        *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + 8 + lVar34 * 4) = uVar9;
        local_120 = img_labels.accesses_._16_8_;
        lVar34 = img_labels.accesses_._16_8_;
        uVar13 = img_labels.img_._16_8_;
        local_138 = img_labels.img_._16_8_;
        local_3f8 = (long *)img_labels.img_._72_8_;
        local_3e0 = (long *)img_labels.accesses_._72_8_;
        local_2f8 = lVar44;
        local_2f0 = img_labels.accesses_._16_8_;
        local_2e8 = local_158;
        local_2d8 = img_labels.img_._16_8_;
        local_2d0 = img_labels.accesses_._16_8_;
        local_2c8 = img_labels.accesses_._16_8_;
        local_2c0 = img_labels.img_._16_8_;
        local_1f0 = img_labels.img_._16_8_;
        local_1e8 = local_158;
        local_1e0 = img_labels.accesses_._16_8_;
        local_1d8 = img_labels.img_._16_8_;
        local_1d0 = img_labels.accesses_._16_8_;
        local_1c8 = img_labels.img_._16_8_;
        local_1c0 = local_158;
        local_1b8 = img_labels.accesses_._16_8_;
        local_1b0 = img_labels.img_._16_8_;
        local_1a8 = img_labels.accesses_._16_8_;
        local_1a0 = lVar44;
        local_198 = img_labels.img_._16_8_;
        local_190 = local_158;
        local_188 = img_labels.img_._16_8_;
        local_180 = img_labels.accesses_._16_8_;
        local_178 = img_labels.accesses_._16_8_;
        local_170 = img_labels.img_._16_8_;
        local_168 = img_labels.accesses_._16_8_;
LAB_002c2a4a:
        iVar23 = (int)uVar16;
        lVar25 = (long)iVar23;
        lVar21 = lVar25 << 0x20;
        lVar40 = lVar25 * 4;
        lVar42 = 0;
        local_308 = uVar13;
        local_150 = local_158;
        local_148 = lVar44;
        local_140 = lVar34;
        local_128 = local_158;
        do {
          uVar16 = lVar42 + lVar25 + 2;
          lVar18 = lVar21 >> 0x1e;
          iVar12 = (int)lVar42;
          if (lVar36 <= (long)uVar16) {
            iVar12 = iVar23 + 2 + iVar12;
            lVar40 = local_140;
            if (iVar27 < iVar12) goto LAB_002c85f7;
            lVar42 = lVar21 + 0x200000000 >> 0x20;
            piVar1 = (int *)((lVar21 + 0x200000000 >> 0x1e) +
                            img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
            *piVar1 = *piVar1 + 1;
            lVar36 = *(long *)img.img_._72_8_;
            lVar40 = lVar36 * lVar24 + img.img_._16_8_;
            lVar25 = lVar21 + 0x300000000 >> 0x20;
            if (*(char *)(lVar42 + lVar40) == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                              lVar25 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar40 + lVar25) == '\0') {
                piVar1 = (int *)(lVar34 + lVar44 * lVar24 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(uVar13 + local_158 * lVar24 + lVar42 * 4) = 0;
                goto LAB_002c9b2c;
              }
              piVar1 = (int *)(lVar44 * lVar28 + lVar34 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar10 = *(undefined4 *)(lVar28 * local_158 + uVar13 + lVar42 * 4);
              piVar1 = (int *)(lVar44 * lVar24 + lVar34 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
            }
            else {
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 +
                              lVar25 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar25 + img.img_._16_8_ + lVar36 * lVar43) == '\0') {
                lVar34 = lVar34 + lVar44 * lVar24;
                piVar1 = (int *)(lVar18 + lVar34);
                *piVar1 = *piVar1 + 1;
                lVar36 = uVar13 + local_158 * lVar24;
                uVar10 = *(undefined4 *)(lVar18 + lVar36);
                piVar1 = (int *)(lVar34 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar36 + lVar42 * 4) = uVar10;
                goto LAB_002c9b2c;
              }
              piVar1 = (int *)(lVar44 * lVar28 + lVar34 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar10 = *(undefined4 *)(lVar28 * local_158 + uVar13 + lVar42 * 4);
              piVar1 = (int *)(lVar44 * lVar24 + lVar34 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
            }
            *(undefined4 *)(local_158 * lVar24 + uVar13 + lVar42 * 4) = uVar10;
            goto LAB_002c9b2c;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar40 +
                           8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar19 = *(long *)img.img_._72_8_;
          lVar32 = lVar19 * lVar24 + img.img_._16_8_ + lVar25;
          if (*(char *)(lVar42 + 2 + lVar32) == '\0') {
            piVar1 = (int *)(img.accesses_._16_8_ + lVar40 + *(long *)img.accesses_._72_8_ * lVar24
                             + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 3 + lVar32) == '\0') {
              iVar23 = iVar23 + iVar12;
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 +
                               img_labels.accesses_._16_8_ + lVar25 * 4 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              local_2e8 = *(long *)img_labels.img_._72_8_;
              lVar42 = lVar42 + lVar25;
              goto LAB_002c4f8d;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar40
                             + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_ + lVar25;
            if (*(char *)(lVar42 + 3 + lVar18) != '\0') {
              piVar1 = (int *)(lVar44 * lVar28 + lVar34 + lVar25 * 4 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              local_308 = (ulong)(iVar23 + iVar12 + 2);
              uVar16 = lVar25 + 2 + lVar42;
              local_2f8 = lVar44;
              goto LAB_002c4b9e;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar40
                             + 0x10 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 4 + lVar18) == '\0') goto LAB_002c31d8;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar40
                             + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 3 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_ + lVar25)
                == '\0') {
              lVar44 = local_140 + lVar40 + local_148 * lVar28;
              piVar1 = (int *)(lVar44 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = local_308 + lVar40 + local_150 * lVar28;
              uVar9 = *(uint *)(lVar34 + 8 + lVar42 * 4);
              piVar1 = (int *)(lVar44 + 0x10 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + 0x10 + lVar42 * 4));
              local_2f8 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + lVar40 + 8 +
                              lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              local_2e8 = *(long *)img_labels.img_._72_8_;
LAB_002c2ec9:
              lVar39 = local_2e8 * lVar24 + img_labels.img_._16_8_;
              local_1d8 = img_labels.img_._16_8_;
              local_1e0 = img_labels.accesses_._16_8_;
              local_2c0 = img_labels.img_._16_8_;
              local_2c8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_2f0 = img_labels.accesses_._16_8_;
              local_188 = img_labels.img_._16_8_;
              local_168 = img_labels.accesses_._16_8_;
              local_180 = img_labels.accesses_._16_8_;
              local_170 = img_labels.img_._16_8_;
              local_178 = img_labels.accesses_._16_8_;
              local_1b0 = img_labels.img_._16_8_;
              local_1b8 = img_labels.accesses_._16_8_;
              local_198 = img_labels.img_._16_8_;
              local_1a8 = img_labels.accesses_._16_8_;
              local_1f0 = img_labels.img_._16_8_;
              local_2d0 = img_labels.accesses_._16_8_;
              local_1c8 = img_labels.img_._16_8_;
              local_1d0 = img_labels.accesses_._16_8_;
              local_308 = img_labels.img_._16_8_;
              local_140 = img_labels.accesses_._16_8_;
              local_138 = img_labels.img_._16_8_;
              local_120 = img_labels.accesses_._16_8_;
              uVar13 = img_labels.img_._16_8_;
              lVar34 = img_labels.accesses_._16_8_;
              lVar44 = local_2f8;
              local_3f8 = (long *)img_labels.img_._72_8_;
              local_3e0 = (long *)img_labels.accesses_._72_8_;
              local_1e8 = local_2e8;
              local_1c0 = local_2e8;
              local_1a0 = local_2f8;
              local_190 = local_2e8;
              local_158 = local_2e8;
              local_150 = local_2e8;
              local_148 = local_2f8;
              local_128 = local_2e8;
            }
            else {
              piVar1 = (int *)(lVar34 + lVar40 + lVar44 * lVar28 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = *(uint *)(uVar13 + lVar40 + local_158 * lVar28 + 8 + lVar42 * 4);
              piVar1 = (int *)(local_148 * lVar24 + local_140 + lVar40 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar39 = local_150 * lVar24 + local_308;
              local_158 = local_150;
              uVar13 = local_308;
              lVar34 = local_140;
              lVar44 = local_148;
            }
          }
          else {
            piVar1 = (int *)(img.accesses_._16_8_ + lVar40 + *(long *)img.accesses_._72_8_ * lVar43
                             + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar25 + lVar19 * lVar43) != '\0') {
              piVar1 = (int *)(lVar44 * lVar28 + lVar34 + lVar25 * 4 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = *(uint *)(local_158 * lVar28 + uVar13 + lVar25 * 4 + 8 + lVar42 * 4);
              piVar1 = (int *)(lVar25 * 4 + lVar44 * lVar24 + lVar34 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar15 = (ulong)(iVar23 + iVar12 + 2);
              local_150 = local_158;
              local_120 = local_120;
              uVar22 = local_308;
              lVar40 = local_140;
              lVar34 = local_128;
              goto LAB_002c6cd0;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar40
                             + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar19 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar42 + 3 + lVar19 * lVar24 + img.img_._16_8_ + lVar25) == '\0') {
              lVar34 = lVar34 + lVar44 * lVar24;
              piVar1 = (int *)(lVar18 + lVar34);
              *piVar1 = *piVar1 + 1;
              lVar44 = uVar13 + local_158 * lVar24;
              uVar10 = *(undefined4 *)(lVar18 + lVar44);
              piVar1 = (int *)(lVar34 + lVar25 * 4 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = (ulong)(iVar23 + iVar12 + 2);
              *(undefined4 *)(lVar44 + lVar25 * 4 + 8 + lVar42 * 4) = uVar10;
              goto LAB_002c1370;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar40
                             + 0x10 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + 4 + img.img_._16_8_ + lVar25 + lVar19 * lVar43) == '\0') {
              lVar34 = lVar34 + lVar44 * lVar24;
              piVar1 = (int *)(lVar18 + lVar34);
              *piVar1 = *piVar1 + 1;
              lVar44 = uVar13 + local_158 * lVar24;
              uVar10 = *(undefined4 *)(lVar18 + lVar44);
              piVar1 = (int *)(lVar34 + lVar25 * 4 + 8 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 + lVar25 * 4 + 8 + lVar42 * 4) = uVar10;
              uVar16 = (ulong)(iVar23 + iVar12 + 2);
              goto LAB_002c5e54;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar40
                             + 0xc + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar32 = lVar44 * lVar28 + lVar34;
            lVar18 = local_158 * lVar28 + uVar13;
            lVar19 = lVar44 * lVar24 + lVar34;
            lVar39 = local_158 * lVar24 + uVar13;
            if (*(char *)(lVar42 + 3 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_ + lVar25)
                == '\0') {
              piVar1 = (int *)(lVar32 + lVar40 + 0x10 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = *(uint *)(lVar18 + lVar40 + 0x10 + lVar42 * 4);
              piVar1 = (int *)(lVar19 + lVar40 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar39 + lVar40 + lVar42 * 4));
              local_2f8 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + lVar40 + 8 +
                              lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              local_2e8 = *(long *)img_labels.img_._72_8_;
              goto LAB_002c2ec9;
            }
            piVar1 = (int *)(lVar32 + lVar40 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = *(uint *)(lVar18 + lVar40 + 8 + lVar42 * 4);
            piVar1 = (int *)(lVar19 + lVar40 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
          }
          *(uint *)(lVar39 + lVar40 + 8 + lVar42 * 4) = uVar9;
          lVar21 = lVar21 + 0x200000000;
          lVar42 = lVar42 + 2;
        } while( true );
      }
      lVar18 = lVar44 * lVar43 + img.accesses_._16_8_;
      piVar1 = (int *)(lVar18 + 0xc + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar19 = lVar42 * lVar43 + img.img_._16_8_;
      if (*(char *)(lVar34 + 3 + lVar19) != '\0') {
        local_2f8 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(local_2f8 * lVar28 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        local_2e8 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(local_2e8 * lVar28 + img_labels.img_._16_8_ + 8 + lVar34 * 4);
        piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002c1526:
        uVar15 = uVar16 & 0xffffffff;
        local_148 = local_2f8;
        local_150 = local_2e8;
        local_120 = img_labels.accesses_._16_8_;
        uVar22 = img_labels.img_._16_8_;
        lVar40 = img_labels.accesses_._16_8_;
        lVar34 = local_2e8;
        uVar13 = img_labels.img_._16_8_;
        local_3f8 = (long *)img_labels.img_._72_8_;
        local_3e0 = (long *)img_labels.accesses_._72_8_;
        local_2f0 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_2d0 = img_labels.accesses_._16_8_;
        local_2c8 = img_labels.accesses_._16_8_;
        local_2c0 = img_labels.img_._16_8_;
        local_1f0 = img_labels.img_._16_8_;
        local_1e8 = local_2e8;
        local_1e0 = img_labels.accesses_._16_8_;
        local_1d8 = img_labels.img_._16_8_;
        local_1d0 = img_labels.accesses_._16_8_;
        local_1c8 = img_labels.img_._16_8_;
        local_1c0 = local_2e8;
        local_1b8 = img_labels.accesses_._16_8_;
        local_1b0 = img_labels.img_._16_8_;
        local_1a8 = img_labels.accesses_._16_8_;
        local_1a0 = local_2f8;
        local_198 = img_labels.img_._16_8_;
        local_190 = local_2e8;
        local_188 = img_labels.img_._16_8_;
        local_180 = img_labels.accesses_._16_8_;
        local_178 = img_labels.accesses_._16_8_;
        local_170 = img_labels.img_._16_8_;
        local_168 = img_labels.accesses_._16_8_;
        local_138 = img_labels.img_._16_8_;
        goto LAB_002c6cd0;
      }
      piVar1 = (int *)(lVar25 + 0xc + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar21 + 3 + lVar34) != '\0') {
        piVar1 = (int *)(lVar18 + 0x10 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        cVar8 = *(char *)(lVar19 + 4 + lVar34);
        piVar1 = (int *)(lVar18 + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar19 + 2 + lVar34);
        goto joined_r0x002c176f;
      }
      piVar1 = (int *)(lVar18 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar19 + 2 + lVar34) == '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_
                         + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * lVar24 + img_labels.img_._16_8_ + 8 + lVar34 * 4
                 ) = uVar9;
      }
      else {
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar42 * lVar28 + img_labels.img_._16_8_ + 8 + lVar34 * 4);
        piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar42 * lVar24 + img_labels.img_._16_8_ + 8 + lVar34 * 4) = uVar10;
      }
      goto LAB_002c1370;
    }
    lVar36 = *(long *)img.accesses_._72_8_;
    lVar42 = lVar36 * lVar24 + img.accesses_._16_8_;
    piVar1 = (int *)(lVar42 + 8 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img.img_._72_8_;
    lVar40 = lVar44 * lVar24 + img.img_._16_8_;
    cVar26 = *(char *)(lVar34 + 2 + lVar40);
    if (iVar27 < (int)uVar16) {
      if (cVar26 == '\0') {
LAB_002c95fc:
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_
                         + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)
         (lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 + lVar34 * 4) = 0;
        goto LAB_002c9b2c;
      }
      piVar1 = (int *)(img.accesses_._16_8_ + lVar36 * lVar43 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + 2 + img.img_._16_8_ + lVar44 * lVar43) == '\0') {
LAB_002c994a:
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_
                         + 8 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 + lVar34 * 4
                 ) = uVar9;
        goto LAB_002c9b2c;
      }
LAB_002c90a4:
      lVar36 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
    }
    else {
      if ((cVar26 == '\0') &&
         (piVar1 = (int *)(lVar42 + 0xc + lVar34 * 4), *piVar1 = *piVar1 + 1,
         *(char *)(lVar40 + 3 + lVar34) == '\0')) goto LAB_002c95fc;
      lVar36 = img.accesses_._16_8_ + lVar36 * lVar43;
      piVar1 = (int *)(lVar36 + 0xc + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar43 = img.img_._16_8_ + lVar44 * lVar43;
      if (*(char *)(lVar34 + 3 + lVar43) != '\0') goto LAB_002c90a4;
      piVar1 = (int *)(lVar36 + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar43 + 2 + lVar34) == '\0') goto LAB_002c994a;
      lVar36 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
    }
    lVar43 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(undefined4 *)(lVar28 * lVar43 + img_labels.img_._16_8_ + 8 + lVar34 * 4);
    piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar43 * lVar24 + img_labels.img_._16_8_ + 8 + lVar34 * 4) = uVar10;
    goto LAB_002c9b2c;
  }
  iVar23 = -2;
LAB_002afbfe:
  while( true ) {
    iVar12 = iVar23;
    lVar36 = (long)iVar12;
    iVar23 = iVar12 + 2;
    if (iVar27 <= iVar23) break;
    piVar1 = (int *)(img.accesses_._16_8_ + 8 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(img.img_._16_8_ + 2 + lVar36);
    piVar1 = (int *)(img.accesses_._16_8_ + 0xc + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    cVar8 = *(char *)(img.img_._16_8_ + 3 + lVar36);
    if (cVar26 == '\0') {
      if (cVar8 != '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + 8 + lVar36 * 4) = uVar9;
        goto LAB_002afcaf;
      }
      piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar36 * 4) = 0;
    }
    else {
      uVar9 = TTA::MemNewLabel();
      piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(img_labels.img_._16_8_ + 8 + lVar36 * 4) = uVar9;
      if (cVar8 != '\0') {
LAB_002afcaf:
        lVar24 = lVar36 << 0x20;
        lVar28 = lVar24 + 0x500000000;
        lVar43 = lVar36 * 4;
        lVar25 = lVar24 + 0x400000000;
        lVar42 = 0;
        lVar34 = img_labels.accesses_._16_8_;
        lVar44 = img_labels.img_._16_8_;
        do {
          lVar24 = lVar24 + 0x200000000;
          lVar40 = lVar24 >> 0x1e;
          if ((long)iVar27 <= lVar36 + lVar42 + 4) {
            piVar1 = (int *)(img.accesses_._16_8_ + (lVar25 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar25 = lVar25 >> 0x20;
            cVar26 = *(char *)(img.img_._16_8_ + lVar25);
            if (iVar27 < iVar12 + (int)lVar42 + 4) {
              if (cVar26 == '\0') {
LAB_002b04a8:
                piVar1 = (int *)(lVar34 + lVar25 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar44 + lVar25 * 4) = 0;
              }
              else {
LAB_002b0359:
                *(int *)(lVar34 + lVar40) = *(int *)(lVar34 + lVar40) + 1;
                uVar10 = *(undefined4 *)(lVar44 + lVar40);
                piVar1 = (int *)(lVar34 + lVar25 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar44 + lVar25 * 4) = uVar10;
              }
            }
            else {
              piVar1 = (int *)(img.accesses_._16_8_ + (lVar28 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              if (cVar26 != '\0') goto LAB_002b0359;
              if (*(char *)(img.img_._16_8_ + (lVar28 >> 0x20)) == '\0') goto LAB_002b04a8;
              uVar9 = TTA::MemNewLabel();
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar36 = img_labels.img_._16_8_;
LAB_002b04a2:
              *(uint *)(lVar36 + lVar25 * 4) = uVar9;
            }
            goto LAB_002c9b2c;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + lVar43 + 0x10 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar42 + 4 + img.img_._16_8_ + lVar36);
          piVar1 = (int *)(img.accesses_._16_8_ + lVar43 + 0x14 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          cVar8 = *(char *)(lVar42 + 5 + img.img_._16_8_ + lVar36);
          if (cVar26 == '\0') {
            if (cVar8 == '\0') {
              piVar1 = (int *)(lVar34 + lVar36 * 4 + 0x10 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 + lVar36 * 4 + 0x10 + lVar42 * 4) = 0;
              goto LAB_002afdd9;
            }
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar43 + 0x10 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = img_labels.accesses_._16_8_;
            lVar44 = img_labels.img_._16_8_;
          }
          else {
            if (cVar8 == '\0') goto LAB_002afd8e;
            piVar1 = (int *)(lVar34 + lVar43 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = *(uint *)(lVar44 + lVar43 + 8 + lVar42 * 4);
            piVar1 = (int *)(lVar34 + lVar43 + 0x10 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
          }
          *(uint *)(lVar44 + lVar43 + 0x10 + lVar42 * 4) = uVar9;
          lVar28 = lVar28 + 0x200000000;
          lVar42 = lVar42 + 2;
          lVar25 = lVar25 + 0x200000000;
        } while( true );
      }
    }
  }
  piVar1 = (int *)(img.accesses_._16_8_ + 8 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  cVar26 = *(char *)(img.img_._16_8_ + 2 + lVar36);
  if (iVar27 < iVar23) {
joined_r0x002b061e:
    if (cVar26 == '\0') {
      piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar36 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + 8 + lVar36 * 4) = 0;
      goto LAB_002c9b2c;
    }
  }
  else {
    piVar1 = (int *)(img.accesses_._16_8_ + 0xc + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    if (cVar26 == '\0') {
      cVar26 = *(char *)(img.img_._16_8_ + 3 + lVar36);
      goto joined_r0x002b061e;
    }
  }
  uVar9 = TTA::MemNewLabel();
  piVar1 = (int *)(img_labels.accesses_._16_8_ + 8 + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(img_labels.img_._16_8_ + 8 + lVar36 * 4) = uVar9;
LAB_002c9b2c:
  uVar9 = TTA::MemFlatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar9;
  local_2f8 = 1;
  __arg = (void *)0x0;
  do {
    piVar6 = TTA::mem_rtable_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = TTA::mem_rtable_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (lVar17 <= (long)__arg) {
      local_100 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,&local_100,
                 &local_109);
      pvVar7 = local_108;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                (local_108,&local_f0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
      dVar45 = MemMat<unsigned_char>::GetTotalAccesses(&img);
      *(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start =
           (long)(dVar45 - 9.223372036854776e+18) & (long)dVar45 >> 0x3f | (long)dVar45;
      dVar45 = MemMat<int>::GetTotalAccesses(&img_labels);
      (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[1] =
           (long)dVar45 >> 0x3f & (long)(dVar45 - 9.223372036854776e+18) | (long)dVar45;
      dVar45 = TTA::MemTotalAccesses();
      __child_stack =
           (void *)((long)dVar45 >> 0x3f & (long)(dVar45 - 9.223372036854776e+18) | (long)dVar45);
      (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start[2] = (unsigned_long)__child_stack;
      cv::Mat_<int>::clone
                (&local_f0,(__fn *)&img_labels.img_,__child_stack,
                 (int)(long)(dVar45 - 9.223372036854776e+18),__arg);
      cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          super_Mat,&local_f0.super_Mat);
      cv::Mat::~Mat(&local_f0.super_Mat);
      MemMat<int>::~MemMat(&img_labels);
      MemMat<unsigned_char>::~MemMat(&img);
      return;
    }
    uVar16 = (ulong)__arg | 1;
    for (lVar36 = 0; lVar36 < lVar38; lVar36 = lVar36 + 2) {
      lVar28 = *(long *)img_labels.accesses_._72_8_;
      lVar24 = (long)__arg * lVar28 + img_labels.accesses_._16_8_;
      iVar23 = *(int *)(lVar24 + lVar36 * 4);
      *(int *)(lVar24 + lVar36 * 4) = iVar23 + 1;
      lVar43 = *(long *)img_labels.img_._72_8_;
      lVar34 = (long)__arg * lVar43 + img_labels.img_._16_8_;
      lVar44 = (long)*(int *)(lVar34 + lVar36 * 4);
      if (lVar44 < 1) {
        *(int *)(lVar24 + lVar36 * 4) = iVar23 + 2;
        *(undefined4 *)(lVar34 + lVar36 * 4) = 0;
        if (lVar36 + 1 < lVar38) {
          piVar1 = (int *)(lVar24 + 4 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar34 + 4 + lVar36 * 4) = 0;
          if ((long)uVar16 < lVar17) {
            lVar24 = lVar28 * local_2f8 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar24 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            lVar28 = lVar43 * local_2f8 + img_labels.img_._16_8_;
            *(undefined4 *)(lVar28 + lVar36 * 4) = 0;
            piVar1 = (int *)(lVar24 + 4 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
LAB_002c9d9a:
            *(undefined4 *)(lVar28 + 4 + lVar36 * 4) = 0;
          }
        }
        else if ((long)uVar16 < lVar17) {
          piVar1 = (int *)(lVar28 * local_2f8 + img_labels.accesses_._16_8_ + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          lVar28 = lVar43 * local_2f8 + img_labels.img_._16_8_;
LAB_002c9e2b:
          *(undefined4 *)(lVar28 + lVar36 * 4) = 0;
        }
      }
      else {
        piVar6[lVar44] = piVar6[lVar44] + 1;
        uVar9 = puVar5[lVar44];
        lVar44 = *(long *)img.accesses_._72_8_;
        lVar25 = (long)__arg * lVar44 + img.accesses_._16_8_;
        piVar1 = (int *)(lVar25 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img.img_._72_8_;
        lVar40 = (long)__arg * lVar42 + img.img_._16_8_;
        uVar30 = uVar9;
        if (*(char *)(lVar36 + lVar40) == '\0') {
          uVar30 = 0;
        }
        piVar1 = (int *)(lVar24 + lVar36 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(lVar34 + lVar36 * 4) = uVar30;
        if (lVar36 + 1 < lVar38) {
          piVar1 = (int *)(lVar25 + 4 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = uVar9;
          if (*(char *)(lVar36 + 1 + lVar40) == '\0') {
            uVar30 = 0;
          }
          piVar1 = (int *)(lVar24 + 4 + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar34 + 4 + lVar36 * 4) = uVar30;
          if ((long)uVar16 < lVar17) {
            lVar44 = lVar44 * local_2f8 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar44 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = lVar42 * local_2f8 + img.img_._16_8_;
            lVar24 = lVar28 * local_2f8 + img_labels.accesses_._16_8_;
            uVar30 = uVar9;
            if (*(char *)(lVar36 + lVar34) == '\0') {
              uVar30 = 0;
            }
            piVar1 = (int *)(lVar24 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            lVar28 = lVar43 * local_2f8 + img_labels.img_._16_8_;
            *(uint *)(lVar28 + lVar36 * 4) = uVar30;
            piVar1 = (int *)(lVar44 + 4 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar36 + 1 + lVar34);
            piVar1 = (int *)(lVar24 + 4 + lVar36 * 4);
            *piVar1 = *piVar1 + 1;
            if (cVar26 == '\0') goto LAB_002c9d9a;
            *(uint *)(lVar28 + 4 + lVar36 * 4) = uVar9;
          }
        }
        else if ((long)uVar16 < lVar17) {
          piVar1 = (int *)(lVar44 * local_2f8 + img.accesses_._16_8_ + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar36 + lVar42 * local_2f8 + img.img_._16_8_);
          piVar1 = (int *)(lVar28 * local_2f8 + img_labels.accesses_._16_8_ + lVar36 * 4);
          *piVar1 = *piVar1 + 1;
          lVar28 = lVar43 * local_2f8 + img_labels.img_._16_8_;
          if (cVar26 == '\0') goto LAB_002c9e2b;
          *(uint *)(lVar28 + lVar36 * 4) = uVar9;
        }
      }
    }
    __arg = (void *)((long)__arg + 2);
    local_2f8 = local_2f8 + 2;
  } while( true );
LAB_002b0037:
  *(int *)(lVar28 + lVar40) = *(int *)(lVar28 + lVar40) + 1;
  uVar10 = *(undefined4 *)(lVar43 + lVar40);
  piVar1 = (int *)(lVar28 + lVar34 * 4 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  uVar13 = (ulong)(iVar11 + iVar35 + 2);
  *(undefined4 *)(lVar43 + lVar34 * 4 + 8 + lVar42 * 4) = uVar10;
LAB_002b005b:
  iVar11 = (int)uVar13;
  lVar34 = (long)iVar11;
  lVar44 = lVar34 << 0x20;
  lVar24 = lVar34 * 4;
  lVar42 = 0;
  do {
    uVar13 = lVar34 + lVar42 + 2;
    lVar40 = lVar44 >> 0x1e;
    iVar35 = (int)lVar42;
    if (lVar36 <= (long)uVar13) {
      piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x200000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar34 = lVar44 + 0x200000000 >> 0x20;
      lVar24 = *(long *)img.accesses_._72_8_ + img.accesses_._16_8_;
      if (iVar27 < iVar11 + iVar35 + 2) {
        if (*(char *)(img.img_._16_8_ + lVar34) == '\0') {
          piVar1 = (int *)(lVar24 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar34 + img.img_._16_8_ + lVar42) == '\0') {
LAB_002c8a9d:
            piVar1 = (int *)(lVar28 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar43 + lVar34 * 4) = 0;
            goto LAB_002b0726;
          }
          piVar1 = (int *)(lVar24 + (lVar44 + 0x100000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(img.img_._16_8_ + lVar42 + (lVar44 + 0x100000000 >> 0x20));
        }
        else {
          piVar1 = (int *)(lVar24 + (lVar44 + 0x100000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)((lVar44 + 0x100000000 >> 0x20) +
                            img.img_._16_8_ + *(long *)img.img_._72_8_);
        }
joined_r0x002b0572:
        if (cVar26 != '\0') {
          *(int *)(lVar28 + lVar40) = *(int *)(lVar28 + lVar40) + 1;
          uVar10 = *(undefined4 *)(lVar43 + lVar40);
          piVar1 = (int *)(lVar28 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar43 + lVar34 * 4) = uVar10;
          goto LAB_002b0726;
        }
      }
      else {
        if (*(char *)(img.img_._16_8_ + lVar34) != '\0') {
          piVar1 = (int *)(lVar24 + (lVar44 + 0x100000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)((lVar44 + 0x100000000 >> 0x20) +
                            img.img_._16_8_ + *(long *)img.img_._72_8_);
          piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x300000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          goto joined_r0x002b0572;
        }
        piVar1 = (int *)(lVar24 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img.img_._72_8_ + img.img_._16_8_;
        cVar26 = *(char *)(lVar34 + lVar42);
        piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x300000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        lVar25 = lVar44 + 0x300000000 >> 0x20;
        if (cVar26 != '\0') {
          piVar1 = (int *)(lVar24 + (lVar44 + 0x100000000 >> 0x1e));
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + (lVar44 + 0x100000000 >> 0x20)) == '\0') {
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar34 * 4) = uVar9;
          }
          else {
            *(int *)(lVar28 + lVar40) = *(int *)(lVar28 + lVar40) + 1;
            uVar10 = *(undefined4 *)(lVar43 + lVar40);
            piVar1 = (int *)(lVar28 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar43 + lVar34 * 4) = uVar10;
          }
          goto LAB_002b0726;
        }
        if ((*(char *)(img.img_._16_8_ + lVar25) == '\0') &&
           (piVar1 = (int *)(lVar24 + lVar25 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(lVar42 + lVar25) == '\0')) goto LAB_002c8a9d;
      }
      uVar9 = TTA::MemNewLabel();
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(img_labels.img_._16_8_ + lVar34 * 4) = uVar9;
      goto LAB_002b0726;
    }
    lVar28 = img.accesses_._16_8_ + lVar24;
    piVar1 = (int *)(lVar28 + 8 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar43 = img.img_._16_8_ + lVar34;
    if (*(char *)(lVar42 + 2 + lVar43) == '\0') {
      lVar25 = *(long *)img.accesses_._72_8_ + img.accesses_._16_8_;
      piVar1 = (int *)(lVar25 + lVar24 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar21 = *(long *)img.img_._72_8_ + img.img_._16_8_;
      if (*(char *)(lVar42 + 2 + lVar21 + lVar34) == '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + (lVar44 + 0x300000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        uVar16 = (ulong)(iVar11 + 2) + lVar42;
        lVar28 = lVar44 + 0x300000000 >> 0x20;
        if ((*(char *)(img.img_._16_8_ + lVar28) == '\0') &&
           (piVar1 = (int *)(lVar25 + lVar28 * 4), *piVar1 = *piVar1 + 1,
           *(char *)(lVar21 + lVar28) == '\0')) goto LAB_002b0261;
      }
      else {
        piVar1 = (int *)(lVar28 + 0xc + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + 3 + lVar43) == '\0') {
          piVar1 = (int *)(lVar25 + lVar24 + 4 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 1 + lVar21 + lVar34) == '\0') goto LAB_002b0152;
          goto LAB_002b0126;
        }
        piVar1 = (int *)(lVar25 + (lVar44 + 0x100000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        uVar16 = (ulong)(iVar11 + 2) + lVar42;
        if (*(char *)(lVar21 + (lVar44 + 0x100000000 >> 0x20)) != '\0') goto LAB_002b01f4;
      }
LAB_002b022a:
      uVar9 = TTA::MemNewLabel();
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * 4 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(img_labels.img_._16_8_ + lVar34 * 4 + 8 + lVar42 * 4) = uVar9;
      uVar13 = uVar16;
      goto LAB_002afee4;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ + 4 + lVar28 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(*(long *)img.img_._72_8_ + 1 + lVar43 + lVar42);
    piVar1 = (int *)(lVar28 + 0xc + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    cVar8 = *(char *)(lVar42 + 3 + lVar43);
    if (cVar26 == '\0') {
      if (cVar8 != '\0') {
        uVar16 = (ulong)(iVar11 + iVar35 + 2);
        goto LAB_002b022a;
      }
LAB_002b0152:
      uVar9 = TTA::MemNewLabel();
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
    }
    else {
      if (cVar8 != '\0') goto LAB_002b018c;
LAB_002b0126:
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar24 + lVar42 * 4);
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
    }
    *(uint *)(img_labels.img_._16_8_ + lVar24 + 8 + lVar42 * 4) = uVar9;
    lVar44 = lVar44 + 0x200000000;
    lVar42 = lVar42 + 2;
    lVar28 = img_labels.accesses_._16_8_;
    lVar43 = img_labels.img_._16_8_;
  } while( true );
code_r0x002b3351:
  uVar9 = TTA::MemNewLabel();
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                   lVar34 + 8 + lVar40 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar34 + 8 +
           lVar40 * 4) = uVar9;
  lVar42 = lVar42 + 0x200000000;
  lVar40 = lVar40 + 2;
  lVar44 = lVar44 + 8;
  goto LAB_002b31ef;
LAB_002bd4f5:
  lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
  piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
  uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
LAB_002bdc67:
  lVar24 = (long)(int)local_3e0;
  local_3e0 = (long *)(lVar24 + 2);
  if (iVar27 <= (int)local_3e0) {
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 8 + lVar24 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    uVar13 = uVar16 | 1;
    cVar26 = *(char *)(lVar24 + 2 + lVar34 * uVar16 + img.img_._16_8_);
    if (iVar27 < (int)local_3e0) {
      if (cVar26 == '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar13 + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * uVar13) == '\0') {
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = 0;
        }
        else {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar13 + img.accesses_._16_8_ + 4 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar24 + 1 + uVar13 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0') {
LAB_002bf4f6:
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                     lVar24 * 4) = uVar9;
          }
          else {
LAB_002bf4be:
            lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar34 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
            uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
            piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
          }
        }
        goto LAB_002c0aee;
      }
      piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = uVar16 - 1;
      cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * uVar13);
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
      cVar8 = *(char *)(lVar24 + 2 + lVar34);
      if (cVar26 == '\0') {
        if (cVar8 == '\0') goto LAB_002c00d8;
LAB_002c0003:
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)((uVar16 - 2) * lVar42 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        goto LAB_002c0040;
      }
      if (cVar8 == '\0') goto LAB_002bf4be;
      piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + lVar24) == '\0') {
LAB_002becdc:
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
      }
      else {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 2) + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + 1 + *(long *)img.img_._72_8_ * (uVar16 - 2) + img.img_._16_8_);
LAB_002c0260:
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        lVar40 = lVar44 * (uVar16 - 2) + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar40 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        lVar34 = (uVar16 - 2) * lVar42 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar34 + lVar24 * 4);
        if (cVar26 != '\0') {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
          goto LAB_002c0aee;
        }
        piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002c02ba:
        uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
      }
      uVar9 = TTA::MemMerge(uVar9,uVar30);
    }
    else {
      if (cVar26 != '\0') {
        piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = uVar16 - 1;
        cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * uVar13);
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
        cVar8 = *(char *)(lVar24 + 3 + lVar34);
        if (cVar26 == '\0') goto joined_r0x002bffda;
        lVar44 = *(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_;
        if (cVar8 == '\0') {
          piVar1 = (int *)(lVar44 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
LAB_002bec66:
          if (*(char *)(lVar34 + 2 + lVar24) != '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 1) + img.accesses_._16_8_ +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar24 + (uVar16 - 1) * lVar34 + img.img_._16_8_) != '\0') {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 2) + img.accesses_._16_8_ +
                               4 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * (uVar16 - 2));
              goto LAB_002c0260;
            }
            goto LAB_002becdc;
          }
          goto LAB_002bf4be;
        }
        piVar1 = (int *)(lVar44 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002bdfea:
        lVar44 = uVar16 - 2;
        if (*(char *)(lVar34 + lVar24) == '\0') goto LAB_002becdc;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar24 + 1 + lVar34 * lVar44 + img.img_._16_8_) == '\0') {
          lVar42 = *(long *)img_labels.accesses_._72_8_ * lVar44 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar42 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar44 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + lVar24 * 4);
          piVar1 = (int *)(lVar42 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002c02ba;
        }
        piVar1 = (int *)((uVar16 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * (uVar16 - 1)) == '\0') {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar24 + 2 + *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_);
          goto LAB_002c0260;
        }
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * lVar44 + img_labels.accesses_._16_8_ + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar44 * lVar42 + img_labels.img_._16_8_ + lVar24 * 4);
LAB_002c0040:
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar42 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
        goto LAB_002c0aee;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar13 + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * uVar13);
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      cVar8 = *(char *)(lVar24 + 3 + lVar34 * uVar16 + img.img_._16_8_);
      if (cVar26 == '\0') {
        if (cVar8 == '\0') {
          piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 0xc +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * uVar13) != '\0') goto LAB_002c00d8;
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = 0;
          goto LAB_002c0aee;
        }
        lVar44 = uVar16 - 1;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar44) != '\0') goto LAB_002c0003;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + 2 + lVar44 * *(long *)img.img_._72_8_ + img.img_._16_8_);
      }
      else {
        piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * uVar13);
        if (cVar8 == '\0') {
          if (cVar26 == '\0') goto LAB_002bf4f6;
          goto LAB_002bf4be;
        }
        lVar44 = uVar16 - 1;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
        cVar8 = *(char *)(lVar24 + 3 + lVar34);
        if (cVar26 != '\0') {
          lVar44 = *(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_;
          if (cVar8 == '\0') {
            piVar1 = (int *)(lVar44 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_002bec66;
          }
          piVar1 = (int *)(lVar44 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002bdfea;
        }
joined_r0x002bffda:
        if (cVar8 != '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
          piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
          goto LAB_002c0aee;
        }
        piVar1 = (int *)((uVar16 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar34 + 2 + lVar24);
      }
      if (cVar26 != '\0') goto LAB_002c0003;
LAB_002c00d8:
      uVar9 = TTA::MemNewLabel();
    }
    piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ + 8
                    + lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) =
         uVar9;
    goto LAB_002c0aee;
  }
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 8 + lVar24 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img.img_._72_8_;
  uVar13 = uVar16 | 1;
  if (*(char *)(lVar24 + 2 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar13 + img.accesses_._16_8_ + 8 + lVar24 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * uVar13);
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    cVar8 = *(char *)(lVar24 + 3 + lVar34 * uVar16 + img.img_._16_8_);
    if (cVar26 == '\0') {
      if (cVar8 == '\0') {
        piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 0xc +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * uVar13) != '\0') {
          uVar9 = TTA::MemNewLabel();
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                   lVar24 * 4) = uVar9;
          goto LAB_002b2171;
        }
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                         + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        puVar14 = (undefined4 *)
                  (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                  (long)local_3e0 * 4);
        goto LAB_002b0ed3;
      }
      lVar44 = uVar16 - 1;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar44) != '\0') {
LAB_002bf174:
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
        goto LAB_002b5619;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0x10 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
      cVar26 = *(char *)(lVar24 + 4 + lVar34);
      piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      cVar8 = *(char *)(lVar24 + 2 + lVar34);
      if (cVar26 == '\0') {
LAB_002c05db:
        if (cVar8 != '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
          piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
          goto LAB_002b47b5;
        }
LAB_002c0ec1:
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                         + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4
                 ) = uVar9;
        goto LAB_002b31c3;
      }
      if (cVar8 != '\0') goto LAB_002bea92;
LAB_002c0a3d:
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 0x10 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 0x10 + lVar24 * 4);
      piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
      goto LAB_002b3d3b;
    }
    piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 + lVar24 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * uVar13);
    if (cVar8 == '\0') {
      if (cVar26 == '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                         + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4
                 ) = uVar9;
        goto LAB_002b6307;
      }
      lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar34 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
      uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
      piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
      goto LAB_002b6307;
    }
    lVar34 = uVar16 - 1;
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0xc +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
    cVar8 = *(char *)(lVar24 + 3 + lVar44);
    if (cVar26 == '\0') {
      if (cVar8 != '\0') goto LAB_002bf174;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0x10 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar44 + 4 + lVar24);
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img.img_._72_8_;
      cVar8 = *(char *)(lVar24 + 2 + lVar34 * lVar44 + img.img_._16_8_);
      if (cVar26 == '\0') goto LAB_002c05db;
      if (cVar8 == '\0') goto LAB_002c0a3d;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 2) + img.accesses_._16_8_ + 0xc +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar24 + 3 + img.img_._16_8_ + lVar44 * (uVar16 - 2));
LAB_002beac9:
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      lVar40 = lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      lVar42 = (uVar16 - 2) * lVar44 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar42 + 8 + lVar24 * 4);
      if (cVar26 != '\0') {
LAB_002beb0c:
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002beb17:
        *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4) = uVar9;
        goto LAB_002b3d3b;
      }
      piVar1 = (int *)(lVar40 + 0x10 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar42 + 0x10 + lVar24 * 4);
LAB_002c10b5:
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                       8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4)
           = uVar9;
      goto LAB_002b3d3b;
    }
    if (cVar8 != '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = uVar16 - 2;
      if (*(char *)(lVar44 + lVar24) == '\0') {
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar42 * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4)
                             );
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                         + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4
                 ) = uVar9;
        goto LAB_002b5619;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 4 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar24 + 1 + lVar44 * lVar42 + img.img_._16_8_) == '\0') {
        lVar44 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar44 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar34 + lVar24 * 4);
        piVar1 = (int *)(lVar44 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
      }
      else {
        piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 2 + img.img_._16_8_ + lVar44 * lVar34) != '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar42 * lVar44 + img_labels.img_._16_8_ + lVar24 * 4);
          piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
          goto LAB_002b5619;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + 2 + *(long *)img.img_._72_8_ * lVar42 + img.img_._16_8_);
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        lVar25 = lVar44 * lVar42 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar25 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar40 = *(long *)img_labels.img_._72_8_;
        lVar34 = lVar42 * lVar40 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar34 + lVar24 * 4);
        if (cVar26 != '\0') {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar40 * uVar16 + 8 + lVar24 * 4) = uVar9;
          goto LAB_002b5619;
        }
        piVar1 = (int *)(lVar25 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + 8 + lVar24 * 4));
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                       8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4)
           = uVar9;
      goto LAB_002b5619;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0x10 +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar44 + 4 + lVar24) == '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
      if (*(char *)(lVar24 + 2 + lVar44) == '\0') goto LAB_002c0a02;
      piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = uVar16 - 2;
      if (*(char *)(lVar44 + lVar24) == '\0') {
        lVar42 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar42 * lVar34 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar34 * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        goto LAB_002c113e;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar24 + 1 + *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_);
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      lVar40 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar40 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)img_labels.img_._72_8_;
      lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar34 + lVar24 * 4);
      if (cVar26 != '\0') {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002c09f2;
      }
      piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
      goto LAB_002c114c;
    }
    lVar42 = uVar16 - 2;
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 0xc +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img.img_._72_8_;
    lVar40 = *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_;
    if (*(char *)(lVar24 + 3 + lVar44 * lVar42 + img.img_._16_8_) == '\0') {
      piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar24 + 2 + img.img_._16_8_ + lVar44 * lVar34) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + lVar24 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar24 + lVar34 * lVar44 + img.img_._16_8_) == '\0') {
          lVar44 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar44 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + 8 + lVar24 * 4);
          piVar1 = (int *)(lVar44 + 0x10 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar34 + 0x10 + lVar24 * 4);
          goto LAB_002c12bb;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 1 + img.img_._16_8_ + lVar44 * lVar42) != '\0') {
          lVar44 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar44 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + lVar24 * 4);
          piVar1 = (int *)(lVar44 + 0x10 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar34 + 0x10 + lVar24 * 4);
          goto LAB_002c12f4;
        }
        goto LAB_002b3d3b;
      }
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + 0x10 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar42 * lVar44 + img_labels.img_._16_8_ + 0x10 + lVar24 * 4);
    }
    else {
      piVar1 = (int *)(lVar40 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar24 + img.img_._16_8_ + lVar44 * lVar34) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar24 + 1 + lVar44 * lVar42 + img.img_._16_8_) == '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar34 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar42 + lVar24 * 4);
          piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar24 + 2 + img.img_._16_8_ + lVar44 * lVar34) != '\0') {
            lVar34 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar42 * lVar44 + img_labels.img_._16_8_ + lVar24 * 4);
            goto LAB_002c089c;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar24 + 2 + *(long *)img.img_._72_8_ * lVar42 + img.img_._16_8_);
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          lVar40 = lVar34 * lVar42 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar40 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          lVar42 = lVar42 * lVar44 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar42 + lVar24 * 4);
          if (cVar26 != '\0') goto LAB_002beb0c;
          piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
        }
        uVar30 = *(uint *)(lVar42 + 8 + lVar24 * 4);
        goto LAB_002c10b5;
      }
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar42 * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
    }
    piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
  }
  else {
    piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 4 + lVar24 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    lVar44 = uVar16 - 1;
    cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * uVar13);
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    lVar42 = lVar34 * lVar44 + img.img_._16_8_;
    cVar8 = *(char *)(lVar24 + 3 + lVar42);
    if (cVar26 == '\0') {
      if (cVar8 != '\0') {
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
        goto LAB_002bbafc;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 2 + lVar44 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0') {
          uVar9 = TTA::MemNewLabel();
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                   lVar24 * 4) = uVar9;
          goto LAB_002b8673;
        }
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
        goto LAB_002b8cf4;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0x10 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
      cVar26 = *(char *)(lVar24 + 4 + lVar34);
      piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      cVar8 = *(char *)(lVar24 + 2 + lVar34);
      if (cVar26 == '\0') {
        if (cVar8 != '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
          piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
          goto LAB_002b47b5;
        }
        goto LAB_002c0ec1;
      }
      if (cVar8 != '\0') {
LAB_002bea92:
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 2) + img.accesses_._16_8_ + 0xc +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + 3 + *(long *)img.img_._72_8_ * (uVar16 - 2) + img.img_._16_8_);
        goto LAB_002beac9;
      }
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 0x10 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 0x10 + lVar24 * 4);
LAB_002c089c:
      piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
      goto LAB_002b3d3b;
    }
    if (cVar8 != '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar44 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = uVar16 - 2;
      if (*(char *)(lVar42 + lVar24) == '\0') {
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar44 * lVar34 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar34 * lVar42 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
      }
      else {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar24 + 1 + lVar42 * lVar34 + img.img_._16_8_) == '\0') {
          lVar44 = *(long *)img_labels.accesses_._72_8_ * lVar34 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar44 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar34 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + lVar24 * 4);
          piVar1 = (int *)(lVar44 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar24 + 2 + img.img_._16_8_ + lVar42 * lVar44) != '\0') {
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar44 * lVar34 + img_labels.accesses_._16_8_ + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar34 * lVar42 + img_labels.img_._16_8_ + lVar24 * 4);
            piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar42 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
            goto LAB_002bbafc;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar24 + 2 + *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_);
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          lVar40 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar40 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)img_labels.img_._72_8_;
          lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + lVar24 * 4);
          if (cVar26 != '\0') {
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
            goto LAB_002bbafc;
          }
          piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
        }
        uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
      }
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                       8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4)
           = uVar9;
      goto LAB_002bbafc;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar16 + 0xc +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
      if (*(char *)(lVar24 + 2 + lVar34) == '\0') {
        lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar34 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
        uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
        piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
        goto LAB_002b8673;
      }
      piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = uVar16 - 2;
      if (*(char *)(lVar34 + lVar24) == '\0') {
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar34 * lVar44 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar44 * lVar42 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
      }
      else {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + 1 + *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_);
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        lVar40 = lVar34 * lVar44 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar40 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img_labels.img_._72_8_;
        lVar44 = lVar44 * lVar42 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar44 + lVar24 * 4);
        if (cVar26 != '\0') {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
          goto LAB_002b8cf4;
        }
        piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar44 + 8 + lVar24 * 4);
      }
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                       8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4)
           = uVar9;
      goto LAB_002b8cf4;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0x10 +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    lVar42 = lVar34 * lVar44 + img.img_._16_8_;
    if (*(char *)(lVar24 + 4 + lVar42) == '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                      lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 2 + lVar24) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + lVar24 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img.img_._72_8_;
        lVar34 = uVar16 - 2;
        if (*(char *)(lVar24 + lVar44 * lVar42 + img.img_._16_8_) == '\0') {
          lVar42 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar42 * lVar34 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar34 * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
LAB_002c113e:
          piVar1 = (int *)(lVar42 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
        }
        else {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar24 + 1 + img.img_._16_8_ + lVar42 * lVar34);
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          lVar40 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar40 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)img_labels.img_._72_8_;
          lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + lVar24 * 4);
          if (cVar26 != '\0') {
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
LAB_002c09f2:
            *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
            goto LAB_002b47b5;
          }
          piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
        }
LAB_002c114c:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                         + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4
                 ) = uVar9;
LAB_002b47b5:
        lVar24 = (long)(int)local_3e0;
        local_3e0 = (long *)(lVar24 + 2);
        if ((int)local_3e0 < iVar27) {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar24 + 2 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
            uVar13 = uVar16 | 1;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar13 + img.accesses_._16_8_ + 8 +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * uVar13);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            cVar8 = *(char *)(lVar24 + 3 + lVar34 * uVar16 + img.img_._16_8_);
            if (cVar26 == '\0') {
              if (cVar8 == '\0') {
                piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 0xc
                                + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * uVar13) != '\0') {
                  uVar9 = TTA::MemNewLabel();
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                   img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                           lVar24 * 4) = uVar9;
                  goto LAB_002b2171;
                }
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_002b6c19;
              }
              lVar44 = uVar16 - 1;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar44) != '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 +
                                lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          ((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
LAB_002b5619:
                uVar15 = uVar16 | 1;
                lVar24 = uVar16 - 1;
                lVar34 = uVar16 - 2;
                uVar13 = (long)(int)local_3e0;
LAB_002b5633:
                local_3e0 = (long *)(uVar13 + 2);
                if ((long)local_3e0 < lVar36) {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                                  (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar44 = *(long *)img.img_._72_8_;
                  iVar11 = (int)uVar13;
                  if (*(char *)((long)local_3e0 + lVar44 * uVar16 + img.img_._16_8_) == '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar44 * uVar15);
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                                     0xc + uVar13 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img.img_._72_8_;
                    cVar8 = *(char *)(uVar13 + 3 + lVar44 * uVar16 + img.img_._16_8_);
                    if (cVar26 != '\0') {
                      if (cVar8 == '\0') {
                        lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_;
                        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                        uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
LAB_002b62fb:
                        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
LAB_002b6307:
                        uVar15 = uVar16 | 1;
                        uVar13 = (long)(int)local_3e0;
LAB_002b6319:
                        local_3e0 = (long *)(uVar13 + 2);
                        iVar11 = (int)uVar13;
                        if ((long)local_3e0 < lVar36) {
                          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 +
                                           img.accesses_._16_8_ + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar24 = *(long *)img.img_._72_8_;
                          if (*(char *)((long)local_3e0 + lVar24 * uVar16 + img.img_._16_8_) != '\0'
                             ) goto LAB_002b65a6;
                          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 +
                                           img.accesses_._16_8_ + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar34 = *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_;
                          if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar24 * uVar15) != '\0'
                             ) {
                            piVar1 = (int *)(lVar34 + 0xc + uVar13 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar24 = *(long *)img.img_._72_8_;
                            lVar34 = *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_;
                            if (*(char *)(uVar13 + 3 + lVar24 * uVar16 + img.img_._16_8_) == '\0')
                            goto code_r0x002b6400;
                            lVar44 = uVar13 << 0x20;
                            piVar1 = (int *)(lVar34 + (lVar44 + 0x100000000 >> 0x1e));
                            *piVar1 = *piVar1 + 1;
                            lVar34 = uVar16 - 1;
                            cVar26 = *(char *)((lVar44 + 0x100000000 >> 0x20) +
                                              img.img_._16_8_ + lVar24 * uVar15);
                            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                             img.accesses_._16_8_ + 0xc + uVar13 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar42 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
                            cVar8 = *(char *)(uVar13 + 3 + lVar42);
                            if (cVar26 == '\0') {
                              if (cVar8 != '\0') goto LAB_002b6c3e;
                              lVar24 = lVar44 + 0x400000000 >> 0x20;
                              piVar1 = (int *)((lVar44 + 0x400000000 >> 0x1e) +
                                              *(long *)img.accesses_._72_8_ * lVar34 +
                                              img.accesses_._16_8_);
                              *piVar1 = *piVar1 + 1;
                              cVar26 = *(char *)(lVar42 + lVar24);
                              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                               img.accesses_._16_8_ + (long)local_3e0 * 4);
                              *piVar1 = *piVar1 + 1;
                              lVar44 = *(long *)img.img_._72_8_;
                              cVar8 = *(char *)(uVar13 + 2 + lVar34 * lVar44 + img.img_._16_8_);
                              if (cVar26 == '\0') goto joined_r0x002b7609;
                              lVar34 = uVar16 - 2;
                              if (cVar8 == '\0') goto LAB_002bd811;
                              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                               img.accesses_._16_8_ + 0xc + uVar13 * 4);
                              *piVar1 = *piVar1 + 1;
                              cVar26 = *(char *)(uVar13 + 3 + img.img_._16_8_ + lVar44 * lVar34);
                              lVar44 = *(long *)img_labels.accesses_._72_8_;
                              lVar42 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
                              piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                              *piVar1 = *piVar1 + 1;
                              lVar40 = *(long *)img_labels.img_._72_8_;
                              lVar34 = lVar34 * lVar40 + img_labels.img_._16_8_;
                              uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
                              if (cVar26 != '\0') goto LAB_002b9976;
                              piVar1 = (int *)(lVar42 + lVar24 * 4);
                              *piVar1 = *piVar1 + 1;
                              uVar30 = *(uint *)(lVar34 + lVar24 * 4);
                              goto LAB_002ba63d;
                            }
                            if (cVar8 != '\0') goto LAB_002b6928;
                            piVar1 = (int *)((lVar44 + 0x400000000 >> 0x1e) +
                                            *(long *)img.accesses_._72_8_ * lVar34 +
                                            img.accesses_._16_8_);
                            *piVar1 = *piVar1 + 1;
                            lVar24 = lVar44 + 0x400000000 >> 0x20;
                            if (*(char *)(lVar42 + lVar24) != '\0') {
                              lVar44 = uVar16 - 2;
                              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 +
                                               img.accesses_._16_8_ + 0xc + uVar13 * 4);
                              *piVar1 = *piVar1 + 1;
                              lVar42 = *(long *)img.img_._72_8_;
                              if (*(char *)(uVar13 + 3 + lVar42 * lVar44 + img.img_._16_8_) == '\0')
                              {
                                piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ +
                                                 img.accesses_._16_8_ + (long)local_3e0 * 4);
                                *piVar1 = *piVar1 + 1;
                                lVar40 = *(long *)img_labels.accesses_._72_8_;
                                lVar25 = lVar40 * lVar44 + img_labels.accesses_._16_8_;
                                if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar42 * lVar34)
                                    == '\0') {
                                  piVar1 = (int *)(lVar25 + lVar24 * 4);
                                  *piVar1 = *piVar1 + 1;
                                  lVar34 = *(long *)img_labels.img_._72_8_;
                                  uVar9 = *(uint *)(lVar44 * lVar34 + img_labels.img_._16_8_ +
                                                   lVar24 * 4);
                                  lVar24 = (long)iVar11;
                                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar40 * uVar16 +
                                                  lVar24 * 4);
                                  *piVar1 = *piVar1 + 1;
                                  lVar34 = lVar34 * uVar16 + img_labels.img_._16_8_;
LAB_002b82c9:
                                  uVar30 = *(uint *)(lVar34 + lVar24 * 4);
                                }
                                else {
                                  piVar1 = (int *)(lVar25 + (long)local_3e0 * 4);
                                  *piVar1 = *piVar1 + 1;
                                  lVar34 = lVar44 * *(long *)img_labels.img_._72_8_ +
                                           img_labels.img_._16_8_;
                                  uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
                                  piVar1 = (int *)(lVar25 + lVar24 * 4);
                                  *piVar1 = *piVar1 + 1;
                                  uVar30 = *(uint *)(lVar34 + lVar24 * 4);
LAB_002b79f8:
                                  uVar9 = TTA::MemMerge(uVar9,uVar30);
                                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                                   img_labels.accesses_._16_8_ +
                                                  (long)(int)uVar13 * 4);
                                  *piVar1 = *piVar1 + 1;
                                  uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 +
                                                     img_labels.img_._16_8_ + (long)(int)uVar13 * 4)
                                  ;
                                }
                                goto LAB_002c0458;
                              }
                              lVar24 = *(long *)img_labels.accesses_._72_8_;
                              piVar1 = (int *)(lVar24 * lVar44 + img_labels.accesses_._16_8_ +
                                              (long)local_3e0 * 4);
                              *piVar1 = *piVar1 + 1;
                              lVar34 = *(long *)img_labels.img_._72_8_;
                              uVar9 = *(uint *)(lVar44 * lVar34 + img_labels.img_._16_8_ +
                                               (long)local_3e0 * 4);
                              lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
LAB_002b8c4b:
                              lVar44 = (long)iVar11;
                              piVar1 = (int *)(lVar24 + lVar44 * 4);
                              *piVar1 = *piVar1 + 1;
                              goto LAB_002b8c4e;
                            }
                            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                             img.accesses_._16_8_ + (long)local_3e0 * 4);
                            *piVar1 = *piVar1 + 1;
                            cVar26 = *(char *)((long)local_3e0 +
                                              lVar34 * *(long *)img.img_._72_8_ + img.img_._16_8_);
joined_r0x002b7648:
                            if (cVar26 == '\0') goto LAB_002b8200;
                            lVar24 = *(long *)img_labels.accesses_._72_8_;
                            piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                            (long)local_3e0 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar34 = *(long *)img_labels.img_._72_8_;
                            uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ +
                                             (long)local_3e0 * 4);
                            piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                            (long)(int)uVar13 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 +
                                                                  img_labels.img_._16_8_ +
                                                                 (long)(int)uVar13 * 4));
                            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                             img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                            *piVar1 = *piVar1 + 1;
                            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 +
                                      img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar9;
                            goto LAB_002b47b5;
                          }
                          lVar24 = (uVar13 << 0x20) + 0x300000000;
                          lVar44 = lVar24 >> 0x20;
                          piVar1 = (int *)(lVar34 + (lVar24 >> 0x1e));
                          *piVar1 = *piVar1 + 1;
                          lVar24 = *(long *)img.img_._72_8_;
                          if (*(char *)(lVar44 + lVar24 * uVar16 + img.img_._16_8_) == '\0') {
                            piVar1 = (int *)(uVar15 * *(long *)img.accesses_._72_8_ +
                                             img.accesses_._16_8_ + lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar24 * uVar15);
                            goto joined_r0x002b6bf8;
                          }
                          lVar34 = uVar16 - 1;
                          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                           img.accesses_._16_8_ + lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (*(char *)(lVar44 + img.img_._16_8_ + lVar24 * lVar34) != '\0')
                          goto LAB_002b6c3e;
                          lVar24 = (uVar13 << 0x20) + 0x400000000;
                          piVar1 = (int *)((lVar24 >> 0x1e) +
                                          *(long *)img.accesses_._72_8_ * lVar34 +
                                          img.accesses_._16_8_);
                          *piVar1 = *piVar1 + 1;
                          lVar24 = lVar24 >> 0x20;
                          lVar42 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
                          cVar26 = *(char *)(lVar24 + lVar42);
                          piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ +
                                           img.accesses_._16_8_ + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          cVar8 = *(char *)(uVar13 + 2 + lVar42);
                          if (cVar26 == '\0') goto joined_r0x002b7609;
                          lVar34 = uVar16 - 2;
                          if (cVar8 != '\0') {
                            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                             img.accesses_._16_8_ + lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            cVar26 = *(char *)(lVar44 + *(long *)img.img_._72_8_ * lVar34 +
                                                        img.img_._16_8_);
                            lVar42 = *(long *)img_labels.accesses_._72_8_;
                            lVar34 = lVar42 * lVar34 + img_labels.accesses_._16_8_;
                            piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
                            *piVar1 = *piVar1 + 1;
LAB_002b688e:
                            lVar40 = *(long *)img_labels.img_._72_8_;
                            lVar44 = (uVar16 - 2) * lVar40 + img_labels.img_._16_8_;
                            uVar9 = *(uint *)(lVar44 + (long)local_3e0 * 4);
                            if (cVar26 != '\0') {
LAB_002b2156:
                              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * uVar16 +
                                              (long)local_3e0 * 4);
                              *piVar1 = *piVar1 + 1;
                              goto LAB_002b9985;
                            }
                            piVar1 = (int *)(lVar34 + lVar24 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar30 = *(uint *)(lVar44 + lVar24 * 4);
LAB_002ba63d:
                            uVar9 = TTA::MemMerge(uVar9,uVar30);
                            lVar24 = *(long *)img_labels.accesses_._72_8_;
                            goto LAB_002c046d;
                          }
                          lVar42 = *(long *)img_labels.accesses_._72_8_;
                          piVar1 = (int *)(lVar42 * lVar34 + img_labels.accesses_._16_8_ +
                                          lVar24 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar44 = *(long *)img_labels.img_._72_8_;
                          uVar10 = *(undefined4 *)
                                    (lVar34 * lVar44 + img_labels.img_._16_8_ + lVar24 * 4);
LAB_002bb765:
                          lVar24 = lVar42 * uVar16 + img_labels.accesses_._16_8_;
LAB_002bb76c:
                          piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)
                           (lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10
                          ;
                          goto LAB_002b3d3b;
                        }
                        lVar44 = (long)(int)local_3e0;
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 +
                                         img.accesses_._16_8_ + lVar44 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar24 = *(long *)img.img_._72_8_;
                        lVar34 = *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_;
                        cVar26 = *(char *)(lVar44 + lVar24 * uVar16 + img.img_._16_8_);
                        if (iVar27 < (int)local_3e0) {
                          if (cVar26 == '\0') {
                            piVar1 = (int *)(lVar34 + lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            if (*(char *)(lVar44 + img.img_._16_8_ + lVar24 * uVar15) == '\0') {
LAB_002ba1eb:
                              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                               img_labels.accesses_._16_8_ + lVar44 * 4);
                              *piVar1 = *piVar1 + 1;
                              *(undefined4 *)
                               (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                               lVar44 * 4) = 0;
                            }
                            else {
                              lVar24 = (uVar13 << 0x20) + 0x100000000;
                              piVar1 = (int *)((lVar24 >> 0x1e) +
                                              *(long *)img.accesses_._72_8_ * uVar15 +
                                              img.accesses_._16_8_);
                              *piVar1 = *piVar1 + 1;
                              cVar26 = *(char *)((lVar24 >> 0x20) +
                                                uVar15 * *(long *)img.img_._72_8_ + img.img_._16_8_)
                              ;
joined_r0x002b6f16:
                              if (cVar26 == '\0') {
LAB_002bb17e:
                                uVar9 = TTA::MemNewLabel();
                                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                                 img_labels.accesses_._16_8_ + lVar44 * 4);
                                *piVar1 = *piVar1 + 1;
                                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 +
                                          img_labels.img_._16_8_ + lVar44 * 4) = uVar9;
                              }
                              else {
                                lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                                         img_labels.accesses_._16_8_;
LAB_002b9fd8:
                                piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                                *piVar1 = *piVar1 + 1;
                                lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 +
                                         img_labels.img_._16_8_;
                                uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
                                piVar1 = (int *)(lVar24 + lVar44 * 4);
                                *piVar1 = *piVar1 + 1;
                                *(undefined4 *)(lVar34 + lVar44 * 4) = uVar10;
                              }
                            }
                            goto LAB_002c0aee;
                          }
                          lVar42 = (uVar13 << 0x20) + 0x100000000;
                          piVar1 = (int *)(lVar34 + (lVar42 >> 0x1e));
                          *piVar1 = *piVar1 + 1;
                          lVar42 = lVar42 >> 0x20;
                          lVar34 = uVar16 - 1;
                          lVar40 = *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_;
                          if (*(char *)(lVar42 + img.img_._16_8_ + lVar24 * uVar15) != '\0') {
                            piVar1 = (int *)(lVar40 + lVar42 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
                            if (*(char *)(lVar42 + lVar24) == '\0') {
                              piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ +
                                               img.accesses_._16_8_ + lVar44 * 4);
                              *piVar1 = *piVar1 + 1;
                              goto LAB_002b6596;
                            }
                            goto LAB_002b76f3;
                          }
                          piVar1 = (int *)(lVar40 + lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
                          if (*(char *)(lVar44 + lVar24) != '\0') goto LAB_002bbab0;
                          piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ +
                                           img.accesses_._16_8_ + lVar42 * 4);
                          *piVar1 = *piVar1 + 1;
                          cVar26 = *(char *)(lVar24 + lVar42);
joined_r0x002b7b00:
                          if (cVar26 == '\0') goto LAB_002bbaf2;
                          lVar24 = *(long *)img_labels.accesses_._72_8_;
                          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                          (long)iVar11 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar34 = *(long *)img_labels.img_._72_8_;
                          uVar10 = *(undefined4 *)
                                    ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ +
                                    (long)iVar11 * 4);
                          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                          lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4) =
                               uVar10;
                          goto LAB_002c0aee;
                        }
                        if (cVar26 != '\0') {
                          lVar42 = (uVar13 << 0x20) + 0x100000000;
                          lVar40 = lVar42 >> 0x20;
                          piVar1 = (int *)(lVar34 + (lVar42 >> 0x1e));
                          *piVar1 = *piVar1 + 1;
                          lVar34 = uVar16 - 1;
                          cVar26 = *(char *)(lVar40 + img.img_._16_8_ + lVar24 * uVar15);
                          lVar25 = (uVar13 << 0x20) + 0x300000000;
                          piVar1 = (int *)((lVar25 >> 0x1e) +
                                          *(long *)img.accesses_._72_8_ * lVar34 +
                                          img.accesses_._16_8_);
                          *piVar1 = *piVar1 + 1;
                          lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
                          lVar42 = *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_;
                          cVar8 = *(char *)((lVar25 >> 0x20) + lVar24);
                          if (cVar26 != '\0') {
                            if (cVar8 == '\0') {
                              piVar1 = (int *)(lVar42 + lVar40 * 4);
                              *piVar1 = *piVar1 + 1;
                              if (*(char *)(lVar24 + lVar40) != '\0') goto LAB_002b76f3;
                              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                               img.accesses_._16_8_ + lVar44 * 4);
                              *piVar1 = *piVar1 + 1;
                              cVar26 = *(char *)(lVar44 + lVar34 * *(long *)img.img_._72_8_ +
                                                          img.img_._16_8_);
                              goto joined_r0x002b659b;
                            }
                            piVar1 = (int *)(lVar42 + lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            if (*(char *)(lVar24 + lVar44) != '\0') goto LAB_002b7f3b;
                            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                             img.accesses_._16_8_ + lVar40 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar42 = *(long *)img.img_._72_8_;
                            lVar24 = uVar16 - 2;
                            if (*(char *)(lVar40 + lVar34 * lVar42 + img.img_._16_8_) != '\0') {
                              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 +
                                               img.accesses_._16_8_ + lVar44 * 4);
                              *piVar1 = *piVar1 + 1;
                              cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar42 * lVar24);
                              lVar42 = *(long *)img_labels.accesses_._72_8_;
                              lVar25 = lVar42 * lVar24 + img_labels.accesses_._16_8_;
                              lVar40 = (long)iVar11;
                              piVar1 = (int *)(lVar25 + lVar40 * 4);
                              *piVar1 = *piVar1 + 1;
                              lVar34 = *(long *)img_labels.img_._72_8_;
                              lVar24 = lVar24 * lVar34 + img_labels.img_._16_8_;
                              uVar9 = *(uint *)(lVar24 + lVar40 * 4);
                              if (cVar26 == '\0') {
                                piVar1 = (int *)(lVar25 + lVar44 * 4);
                                *piVar1 = *piVar1 + 1;
                                uVar30 = *(uint *)(lVar24 + lVar44 * 4);
LAB_002b83be:
                                uVar9 = TTA::MemMerge(uVar9,uVar30);
                                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                                 img_labels.accesses_._16_8_ + lVar40 * 4);
                                *piVar1 = *piVar1 + 1;
                                uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 +
                                                   img_labels.img_._16_8_ + lVar40 * 4);
                              }
                              else {
                                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * uVar16 +
                                                lVar40 * 4);
                                *piVar1 = *piVar1 + 1;
LAB_002b6b3b:
                                uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 +
                                                  lVar40 * 4);
                              }
                              goto LAB_002ba170;
                            }
                            lVar34 = *(long *)img_labels.accesses_._72_8_;
                            piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ +
                                            lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar42 = *(long *)img_labels.img_._72_8_;
                            uVar9 = *(uint *)(lVar24 * lVar42 + img_labels.img_._16_8_ + lVar44 * 4)
                            ;
                            lVar24 = lVar34 * uVar16 + img_labels.accesses_._16_8_;
                            goto LAB_002b866b;
                          }
                          piVar1 = (int *)(lVar42 + lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          if (cVar8 == '\0') {
                            if (*(char *)(lVar24 + lVar44) == '\0') {
                              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                               img.accesses_._16_8_ + lVar40 * 4);
                              *piVar1 = *piVar1 + 1;
                              cVar26 = *(char *)(lVar40 + lVar34 * *(long *)img.img_._72_8_ +
                                                          img.img_._16_8_);
                              goto joined_r0x002b7b00;
                            }
                            goto LAB_002bbab0;
                          }
                          if (*(char *)(lVar24 + lVar44) != '\0') goto LAB_002bbab0;
                          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                           img.accesses_._16_8_ + lVar40 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar42 = *(long *)img.img_._72_8_;
                          lVar24 = uVar16 - 2;
                          if (*(char *)(lVar40 + lVar34 * lVar42 + img.img_._16_8_) == '\0') {
                            lVar34 = *(long *)img_labels.accesses_._72_8_;
                            piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ +
                                            lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            lVar42 = *(long *)img_labels.img_._72_8_;
                            uVar10 = *(undefined4 *)
                                      (lVar24 * lVar42 + img_labels.img_._16_8_ + lVar44 * 4);
                            piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ +
                                            lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            *(undefined4 *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4) =
                                 uVar10;
                            goto LAB_002c0aee;
                          }
                          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 +
                                           img.accesses_._16_8_ + lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar42 * lVar24);
                          lVar34 = *(long *)img_labels.accesses_._72_8_;
                          lVar40 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
                          piVar1 = (int *)(lVar40 + (long)iVar11 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar42 = *(long *)img_labels.img_._72_8_;
                          lVar24 = lVar24 * lVar42 + img_labels.img_._16_8_;
                          uVar9 = *(uint *)(lVar24 + (long)iVar11 * 4);
                          if (cVar26 == '\0') {
                            piVar1 = (int *)(lVar40 + lVar44 * 4);
                            *piVar1 = *piVar1 + 1;
                            uVar30 = *(uint *)(lVar24 + lVar44 * 4);
                            goto LAB_002ba170;
                          }
                          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 +
                                          lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar24 = img_labels.img_._16_8_ + lVar42 * uVar16;
                          goto LAB_002be819;
                        }
                        piVar1 = (int *)(lVar34 + lVar44 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar24 * uVar15);
                        lVar24 = (uVar13 << 0x20) + 0x300000000;
                        lVar34 = lVar24 >> 0x20;
                        piVar1 = (int *)((lVar24 >> 0x1e) +
                                        *(long *)img.accesses_._72_8_ * uVar16 +
                                        img.accesses_._16_8_);
                        *piVar1 = *piVar1 + 1;
                        lVar42 = *(long *)img.img_._72_8_;
                        cVar8 = *(char *)(lVar34 + lVar42 * uVar16 + img.img_._16_8_);
                        if (cVar26 == '\0') goto joined_r0x002b7751;
                        lVar24 = (uVar13 << 0x20) + 0x100000000;
                        piVar1 = (int *)((lVar24 >> 0x1e) +
                                        uVar15 * *(long *)img.accesses_._72_8_ +
                                        img.accesses_._16_8_);
                        *piVar1 = *piVar1 + 1;
                        cVar26 = *(char *)((lVar24 >> 0x20) + img.img_._16_8_ + lVar42 * uVar15);
                        if (cVar8 == '\0') goto joined_r0x002b6f16;
                        lVar42 = uVar16 - 1;
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 +
                                         img.accesses_._16_8_ + lVar34 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar24 = *(long *)img.img_._72_8_ * lVar42 + img.img_._16_8_;
                        if (cVar26 == '\0') {
                          if (*(char *)(lVar34 + lVar24) != '\0') goto LAB_002bbab0;
                          piVar1 = (int *)(lVar42 * *(long *)img.accesses_._72_8_ +
                                           img.accesses_._16_8_ + lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          cVar26 = *(char *)(lVar24 + lVar44);
                          goto joined_r0x002bac8d;
                        }
                        if (*(char *)(lVar34 + lVar24) != '\0') goto LAB_002b7f3b;
                        piVar1 = (int *)(lVar42 * *(long *)img.accesses_._72_8_ +
                                         img.accesses_._16_8_ + lVar44 * 4);
                        *piVar1 = *piVar1 + 1;
LAB_002b6596:
                        cVar26 = *(char *)(lVar24 + lVar44);
joined_r0x002b659b:
                        if (cVar26 != '\0') {
LAB_002b7f3b:
                          lVar24 = *(long *)img_labels.accesses_._72_8_;
                          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                          lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar42 = *(long *)img_labels.img_._72_8_;
                          uVar9 = *(uint *)((uVar16 - 2) * lVar42 + img_labels.img_._16_8_ +
                                           lVar44 * 4);
                          lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
                          iVar11 = (int)uVar13;
LAB_002ba162:
                          lVar34 = (long)iVar11;
                          piVar1 = (int *)(lVar24 + lVar34 * 4);
                          *piVar1 = *piVar1 + 1;
                          goto LAB_002ba165;
                        }
LAB_002b7f83:
                        lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_;
                        iVar11 = (int)uVar13;
LAB_002b96fe:
                        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                        uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
                        piVar1 = (int *)(lVar24 + lVar44 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(lVar34 + lVar44 * 4) = uVar10;
                        goto LAB_002c0aee;
                      }
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_
                                       + 0xc + uVar13 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar44 * lVar24) != '\0') {
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 +
                                         img.accesses_._16_8_ + (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar44 = *(long *)img.img_._72_8_;
                        if (*(char *)((long)local_3e0 + lVar44 * lVar24 + img.img_._16_8_) != '\0')
                        goto LAB_002b581e;
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                         img.accesses_._16_8_ + (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar42 = *(long *)img_labels.accesses_._72_8_ * lVar34 +
                                 img_labels.accesses_._16_8_;
                        lVar40 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_;
                        if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar44 * lVar34) == '\0')
                        {
                          piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar44 = *(long *)img_labels.img_._72_8_;
                          uVar9 = *(uint *)(lVar44 * lVar34 + img_labels.img_._16_8_ +
                                           (long)local_3e0 * 4);
                          piVar1 = (int *)(lVar40 + uVar13 * 4);
                          *piVar1 = *piVar1 + 1;
                          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 +
                                                                img_labels.img_._16_8_ + uVar13 * 4)
                                               );
                          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar44 = *(long *)img_labels.img_._72_8_;
                        }
                        else {
                          piVar1 = (int *)(lVar42 + uVar13 * 4);
                          *piVar1 = *piVar1 + 1;
                          lVar44 = *(long *)img_labels.img_._72_8_;
                          uVar9 = *(uint *)(lVar44 * lVar34 + img_labels.img_._16_8_ + uVar13 * 4);
                          piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                        }
                        goto LAB_002b5865;
                      }
                      lVar44 = (uVar13 << 0x20) + 0x400000000;
                      lVar42 = lVar44 >> 0x20;
                      piVar1 = (int *)((lVar44 >> 0x1e) +
                                      *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_)
                      ;
                      *piVar1 = *piVar1 + 1;
                      lVar44 = *(long *)img.img_._72_8_;
                      if (*(char *)(lVar42 + lVar44 * lVar24 + img.img_._16_8_) == '\0')
                      goto LAB_002bcf13;
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_
                                       + 0xc + uVar13 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar44 * lVar34) == '\0')
                      goto LAB_002bc94e;
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_
                                      + (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar34 = *(long *)img.img_._72_8_;
                      cVar26 = *(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_);
joined_r0x002b5c1d:
                      if (cVar26 == '\0') {
                        lVar42 = uVar16 - 2;
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 +
                                         img.accesses_._16_8_ + (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar24 = *(long *)img_labels.accesses_._72_8_;
                        lVar44 = lVar24 * lVar42 + img_labels.accesses_._16_8_;
                        if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar34 * lVar42) != '\0')
                        {
                          lVar42 = (long)(int)uVar13;
                          piVar1 = (int *)(lVar44 + lVar42 * 4);
                          *piVar1 = *piVar1 + 1;
                          goto LAB_002bcee0;
                        }
                        piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar34 = *(long *)img_labels.img_._72_8_;
                        uVar9 = *(uint *)(lVar42 * lVar34 + img_labels.img_._16_8_ +
                                         (long)local_3e0 * 4);
                        lVar44 = (long)(int)uVar13;
                        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar44 * 4)
                        ;
                        *piVar1 = *piVar1 + 1;
LAB_002b8c4e:
                        uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4);
                        goto LAB_002bc9a0;
                      }
LAB_002bc369:
                      lVar24 = *(long *)img_labels.accesses_._72_8_;
                      piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar34 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(undefined4 *)
                                ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ +
                                (long)local_3e0 * 4);
                      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)
                       (lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
                      goto LAB_002b3d3b;
                    }
                    if (cVar8 == '\0') {
                      piVar1 = (int *)(uVar15 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_
                                       + 0xc + uVar13 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar26 = *(char *)(uVar13 + 3 + img.img_._16_8_ + lVar44 * uVar15);
joined_r0x002b6bf8:
                      if (cVar26 == '\0') goto LAB_002b6bfe;
                      uVar9 = TTA::MemNewLabel();
                      lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_;
                      goto LAB_002befde;
                    }
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                     0xc + uVar13 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar44 * lVar24) != '\0') {
LAB_002b581e:
                      lVar42 = *(long *)img_labels.accesses_._72_8_;
                      piVar1 = (int *)(lVar42 * lVar34 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar44 = *(long *)img_labels.img_._72_8_;
                      uVar9 = *(uint *)(lVar44 * lVar34 + img_labels.img_._16_8_ +
                                       (long)local_3e0 * 4);
                      piVar1 = (int *)(lVar42 * uVar16 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
LAB_002b5865:
                      *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                           uVar9;
                      uVar13 = (ulong)local_3e0;
                      goto LAB_002b5633;
                    }
                    lVar44 = (uVar13 << 0x20) + 0x400000000;
                    piVar1 = (int *)((lVar44 >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = lVar44 >> 0x20;
                    lVar42 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
                    cVar26 = *(char *)(lVar44 + lVar42);
                    piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar8 = *(char *)(uVar13 + 2 + lVar42);
                    if (cVar26 != '\0') {
                      if (cVar8 == '\0') {
                        lVar24 = *(long *)img_labels.accesses_._72_8_;
                        piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ + lVar44 * 4)
                        ;
                        *piVar1 = *piVar1 + 1;
                        lVar42 = *(long *)img_labels.img_._72_8_;
                        uVar10 = *(undefined4 *)
                                  (lVar34 * lVar42 + img_labels.img_._16_8_ + lVar44 * 4);
LAB_002bab05:
                        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                        (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)
                         (lVar42 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
                      }
                      else {
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 +
                                         img.accesses_._16_8_ + 0xc + uVar13 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar26 = *(char *)(uVar13 + 3 +
                                          *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_);
                        lVar24 = *(long *)img_labels.accesses_._72_8_;
                        lVar40 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
                        piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar42 = *(long *)img_labels.img_._72_8_;
                        lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
                        uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
                        if (cVar26 == '\0') {
                          piVar1 = (int *)(lVar40 + lVar44 * 4);
                          *piVar1 = *piVar1 + 1;
LAB_002bcc5f:
                          uVar30 = *(uint *)(lVar34 + lVar44 * 4);
LAB_002c0458:
                          uVar9 = TTA::MemMerge(uVar9,uVar30);
                          lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002c046d:
                          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                          (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 +
                                    img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar9;
                        }
                        else {
                          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 +
                                          (long)local_3e0 * 4);
                          *piVar1 = *piVar1 + 1;
                          *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + (long)local_3e0 * 4)
                               = uVar9;
                        }
                      }
                      goto LAB_002b3d3b;
                    }
                    if (cVar8 == '\0') goto LAB_002b3185;
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(undefined4 *)
                              (lVar34 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
LAB_002ba59f:
                    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
                         = uVar10;
                    goto LAB_002b47b5;
                  }
                  lVar40 = uVar13 << 0x20;
                  lVar42 = lVar40 + 0x300000000 >> 0x20;
                  piVar1 = (int *)((lVar40 + 0x300000000 >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar42 + img.img_._16_8_ + lVar44 * lVar24) != '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img.img_._72_8_;
                    if (*(char *)((long)local_3e0 + lVar24 * lVar44 + img.img_._16_8_) != '\0') {
                      lVar24 = *(long *)img_labels.accesses_._72_8_;
                      piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar44 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(undefined4 *)
                                (lVar34 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)
                       (lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
                      goto LAB_002bbafc;
                    }
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    lVar42 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
                    if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar44 * lVar34) == '\0') {
                      piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar44 = *(long *)img_labels.img_._72_8_;
                      uVar9 = *(uint *)(lVar34 * lVar44 + img_labels.img_._16_8_ +
                                       (long)local_3e0 * 4);
                      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 +
                                      (long)iVar11 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_
                                                           + (long)iVar11 * 4));
                      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                       img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                               (long)local_3e0 * 4) = uVar9;
                      goto LAB_002bbafc;
                    }
                    piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(undefined4 *)
                              (lVar34 * lVar44 + img_labels.img_._16_8_ + (long)iVar11 * 4);
                    piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
LAB_002b9353:
                    *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
                         = uVar10;
                    goto LAB_002bbafc;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar16 +
                                  lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar44 = *(long *)img.img_._72_8_;
                  if (*(char *)(lVar42 + lVar44 * uVar16 + img.img_._16_8_) == '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_;
                    piVar1 = (int *)((lVar40 >> 0x1e) + lVar24);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                    uVar10 = *(undefined4 *)((lVar40 >> 0x1e) + lVar34);
                    piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
                    goto LAB_002bdc67;
                  }
                  lVar25 = lVar40 + 0x400000000 >> 0x20;
                  piVar1 = (int *)((lVar40 + 0x400000000 >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar25 + img.img_._16_8_ + lVar44 * lVar24) == '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_;
                    piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                    uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
                    piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
                    goto LAB_002bcf4e;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                                  lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar44 = *(long *)img.img_._72_8_;
                  if (*(char *)(lVar42 + lVar44 * lVar34 + img.img_._16_8_) == '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ + lVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar9 = *(uint *)(lVar34 * lVar44 + img_labels.img_._16_8_ + lVar25 * 4);
                    lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
LAB_002bb0bd:
                    lVar34 = (long)iVar11;
                    piVar1 = (int *)(lVar24 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
LAB_002bb112:
                    lVar24 = lVar44 * uVar16 + img_labels.img_._16_8_;
LAB_002bb119:
                    uVar30 = *(uint *)(lVar24 + lVar34 * 4);
                  }
                  else {
                    piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar44 * lVar24) != '\0')
                    goto LAB_002bc369;
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    lVar44 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
                    if (*(char *)((long)local_3e0 +
                                 *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_) != '\0')
                    goto LAB_002bcedb;
                    piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar9 = *(uint *)(lVar34 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4
                                     );
                    lVar34 = (long)iVar11;
                    piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
LAB_002ba71f:
                    uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar34 * 4);
                  }
LAB_002bb11d:
                  uVar9 = TTA::MemMerge(uVar9,uVar30);
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                   img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                           (long)local_3e0 * 4) = uVar9;
                  goto LAB_002b3d3b;
                }
                if (iVar27 < (int)local_3e0) goto LAB_002bd13c;
                lVar44 = (long)(int)local_3e0;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                                lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar44 + lVar42 * uVar16 + img.img_._16_8_) == '\0') {
                  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar15 +
                                  lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar42 * uVar15);
                  lVar42 = (uVar13 << 0x20) + 0x300000000;
                  lVar40 = lVar42 >> 0x20;
                  piVar1 = (int *)((lVar42 >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)img.img_._72_8_;
                  cVar8 = *(char *)(lVar40 + lVar42 * uVar16 + img.img_._16_8_);
                  if (cVar26 != '\0') {
                    if (cVar8 != '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_
                                      + lVar40 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar26 = *(char *)(lVar40 + img.img_._16_8_ + lVar42 * lVar24);
                      goto joined_r0x002b604f;
                    }
                    goto LAB_002beece;
                  }
                  if (cVar8 != '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                                    lVar40 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar40 + img.img_._16_8_ + lVar42 * lVar24) == '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_
                                      + lVar44 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ +
                                                  img.img_._16_8_);
joined_r0x002c011b:
                      if (cVar26 == '\0') goto LAB_002bbaf2;
                    }
                    goto LAB_002b62bd;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar15 +
                                  lVar40 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar40 + img.img_._16_8_ + lVar42 * uVar15);
                  goto joined_r0x002c0aae;
                }
                lVar40 = (uVar13 << 0x20) + 0x300000000;
                piVar1 = (int *)((lVar40 >> 0x1e) +
                                img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)((lVar40 >> 0x20) + img.img_._16_8_ + lVar42 * lVar24);
joined_r0x002b604f:
                if (cVar26 == '\0') goto LAB_002beece;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img.img_._72_8_;
                if (*(char *)(lVar44 + lVar24 * lVar42 + img.img_._16_8_) != '\0') {
LAB_002b62bd:
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4)
                  ;
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
                  goto LAB_002be807;
                }
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                                lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar40 = *(long *)img_labels.accesses_._72_8_;
                lVar21 = lVar40 * lVar34 + img_labels.accesses_._16_8_;
                if (*(char *)(lVar44 + img.img_._16_8_ + lVar42 * lVar34) == '\0') {
                  piVar1 = (int *)(lVar21 + lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
LAB_002bfbf5:
                  lVar42 = *(long *)img_labels.img_._72_8_;
                  uVar9 = *(uint *)((uVar16 - 2) * lVar42 + img_labels.img_._16_8_ + lVar44 * 4);
                  lVar24 = img_labels.accesses_._16_8_ + lVar40 * uVar16;
                  iVar11 = (int)uVar13;
LAB_002b866b:
                  lVar34 = (long)iVar11;
                  piVar1 = (int *)(lVar24 + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
LAB_002ba165:
                  uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar34 * 4);
                  goto LAB_002ba170;
                }
LAB_002be8c7:
                lVar42 = (long)(int)uVar13;
                piVar1 = (int *)(lVar21 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
LAB_002be8cc:
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar42 * 4);
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar40 * uVar16 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_002bcd79;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0x10
                              + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar24 + 4 + lVar44 * *(long *)img.img_._72_8_ + img.img_._16_8_) ==
                  '\0') {
                uVar9 = TTA::MemNewLabel();
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                         lVar24 * 4) = uVar9;
                goto LAB_002b31c3;
              }
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 0x10 +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        ((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 0x10 + lVar24 * 4);
              piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
              goto LAB_002b3d3b;
            }
            if (cVar8 == '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar34 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
              piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
              goto LAB_002b6307;
            }
            lVar44 = uVar16 - 1;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar44) != '\0') {
              lVar34 = uVar16 - 2;
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar34 + 8 +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
              if (*(char *)(lVar24 + 2 + lVar44) == '\0') {
                lVar44 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar44 * lVar34 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar34 * lVar42 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
                piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
              }
              else {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                                lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar44 + 1 + lVar24);
                lVar44 = *(long *)img_labels.accesses_._72_8_;
                lVar40 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar40 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
                uVar9 = *(uint *)(lVar34 + lVar24 * 4);
                if (cVar26 != '\0') {
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
                  goto LAB_002b5619;
                }
                piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
              }
              uVar9 = TTA::MemMerge(uVar9,uVar30);
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                       lVar24 * 4) = uVar9;
              goto LAB_002b5619;
            }
            piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar44 + 0x10 +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar24 + 4 + lVar34 * lVar44 + img.img_._16_8_) == '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar34 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
              piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
              goto LAB_002bcf4e;
            }
            lVar44 = uVar16 - 2;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar44) != '\0') {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
              if (*(char *)(lVar24 + 2 + lVar34) == '\0') goto LAB_002b5410;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 4 +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar34 + 1 + lVar24);
LAB_002b5160:
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              lVar42 = (uVar16 - 2) * lVar44 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar42 + lVar24 * 4);
              if (cVar26 == '\0') {
                piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar42 + 8 + lVar24 * 4);
                goto LAB_002b5559;
              }
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4) = uVar9;
              goto LAB_002b3d3b;
            }
          }
          else {
            lVar44 = uVar16 - 1;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar44) != '\0') {
              lVar34 = uVar16 - 2;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 8 +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
              if (*(char *)(lVar24 + 2 + lVar44) == '\0') {
                lVar44 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar44 * lVar34 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar34 * lVar42 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
                piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
              }
              else {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                                lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar44 + 1 + lVar24);
                lVar44 = *(long *)img_labels.accesses_._72_8_;
                lVar40 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar40 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
                uVar9 = *(uint *)(lVar34 + lVar24 * 4);
                if (cVar26 != '\0') {
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
                  goto LAB_002bbafc;
                }
                piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
              }
              uVar9 = TTA::MemMerge(uVar9,uVar30);
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                       lVar24 * 4) = uVar9;
              goto LAB_002bbafc;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar24 + 3 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar34 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
              piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
              goto LAB_002bdc67;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 0x10 +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar24 + 4 + img.img_._16_8_ + lVar34 * lVar44) == '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar34 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
              piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
              goto LAB_002bcf4e;
            }
            lVar34 = uVar16 - 2;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
            if (*(char *)(lVar24 + 3 + lVar44) != '\0') {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 8 +
                              lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar44 + 2 + lVar24) != '\0') {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                                lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar24 + 1 + *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_)
                ;
                goto LAB_002b5160;
              }
LAB_002b5410:
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4)
              ;
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
              piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
LAB_002b5559:
              uVar9 = TTA::MemMerge(uVar9,uVar30);
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                       lVar24 * 4) = uVar9;
              goto LAB_002b3d3b;
            }
          }
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 0x10 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 0x10 + lVar24 * 4);
          piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ +
                                               lVar24 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 +
                   lVar24 * 4) = uVar9;
          goto LAB_002b3d3b;
        }
        if (iVar27 < (int)local_3e0) goto LAB_002bd13c;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 8 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar24 + 2 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
          uVar13 = uVar16 | 1;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar13 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * uVar13);
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          cVar8 = *(char *)(lVar24 + 3 + lVar34 * uVar16 + img.img_._16_8_);
          if (cVar26 != '\0') {
            if (cVar8 != '\0') goto LAB_002b4953;
            goto LAB_002b4d6a;
          }
          if (cVar8 == '\0') {
            piVar1 = (int *)(uVar13 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 0xc +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * uVar13) == '\0') {
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4)
                   = 0;
              goto LAB_002c0aee;
            }
          }
          else {
            piVar1 = (int *)((uVar16 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                             0xc + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * (uVar16 - 1)) != '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_ + 8 + lVar24 * 4)
              ;
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        ((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
              piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
              goto LAB_002c0aee;
            }
          }
          uVar9 = TTA::MemNewLabel();
        }
        else {
LAB_002b4953:
          piVar1 = (int *)((uVar16 - 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + 0xc
                          + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * (uVar16 - 1)) == '\0') {
LAB_002b4d6a:
            lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar34 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
            uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
            piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
            goto LAB_002c0aee;
          }
          lVar34 = uVar16 - 2;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
          if (*(char *)(lVar24 + 2 + lVar44) == '\0') {
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar44 * lVar34 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar34 * lVar42 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
            piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
          }
          else {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 4 +
                            lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar44 + 1 + lVar24);
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            lVar40 = lVar44 * lVar34 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar40 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img_labels.img_._72_8_;
            lVar34 = lVar34 * lVar42 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar34 + lVar24 * 4);
            if (cVar26 != '\0') {
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + 8 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + 8 + lVar24 * 4) = uVar9;
              goto LAB_002c0aee;
            }
            piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar34 + 8 + lVar24 * 4);
          }
          uVar9 = TTA::MemMerge(uVar9,uVar30);
        }
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                         + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4
                 ) = uVar9;
        goto LAB_002c0aee;
      }
LAB_002c0a02:
      lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar34 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
      uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
      piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 + 8 + lVar24 * 4) = uVar10;
      goto LAB_002b31c3;
    }
    lVar42 = uVar16 - 2;
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 0xc +
                    lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar40 = *(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_;
    if (*(char *)(lVar24 + 3 + img.img_._16_8_ + lVar34 * lVar42) != '\0') {
      piVar1 = (int *)(lVar40 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar24 + lVar34 * lVar44 + img.img_._16_8_) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 1 + img.img_._16_8_ + lVar34 * lVar42) == '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar34 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar42 + lVar24 * 4);
          piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar24 + 2 + lVar44 * lVar34 + img.img_._16_8_) != '\0') {
            lVar34 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar42 * lVar44 + img_labels.img_._16_8_ + lVar24 * 4);
            piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) = uVar10;
            goto LAB_002b3d3b;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 8 +
                          lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar24 + 2 + img.img_._16_8_ + lVar34 * lVar42);
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          lVar40 = lVar34 * lVar42 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar40 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          lVar42 = lVar42 * lVar44 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar42 + lVar24 * 4);
          if (cVar26 != '\0') {
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + 8 + lVar24 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_002beb17;
          }
          piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
        }
        uVar30 = *(uint *)(lVar42 + 8 + lVar24 * 4);
        goto LAB_002c10b5;
      }
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + 8 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar42 * lVar44 + img_labels.img_._16_8_ + 8 + lVar24 * 4);
      piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
      goto LAB_002c10b5;
    }
    piVar1 = (int *)(lVar40 + 8 + lVar24 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
    if (*(char *)(lVar24 + 2 + lVar34) == '\0') {
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * lVar42 + img_labels.accesses_._16_8_ + 0x10 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar42 * lVar44 + img_labels.img_._16_8_ + 0x10 + lVar24 * 4);
      piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar24 * 4);
    }
    else {
      piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + lVar24) == '\0') {
        lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar34 + 8 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar44 + 8 + lVar24 * 4);
        piVar1 = (int *)(lVar34 + 0x10 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar44 + 0x10 + lVar24 * 4);
LAB_002c12bb:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                          lVar24 * 4);
      }
      else {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + 4 +
                        lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar24 + 1 + *(long *)img.img_._72_8_ * lVar42 + img.img_._16_8_) == '\0')
        goto LAB_002b3d3b;
        lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar42 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar34 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar44 + lVar24 * 4);
        piVar1 = (int *)(lVar34 + 0x10 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar44 + 0x10 + lVar24 * 4);
      }
    }
  }
LAB_002c12f4:
  uVar9 = TTA::MemMerge(uVar9,uVar30);
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ + 8 +
                  lVar24 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + 8 + lVar24 * 4) =
       uVar9;
  goto LAB_002b3d3b;
code_r0x002b6400:
  piVar1 = (int *)(lVar34 + 4 + uVar13 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(uVar13 + 1 + img.img_._16_8_ + lVar24 * uVar15) == '\0') {
    uVar9 = TTA::MemNewLabel();
    piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar24 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
  }
  else {
    lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
    piVar1 = (int *)(lVar34 + uVar13 * 4);
    *piVar1 = *piVar1 + 1;
    lVar24 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
    uVar9 = *(uint *)(lVar24 + uVar13 * 4);
    piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
  }
  *(uint *)(lVar24 + (long)local_3e0 * 4) = uVar9;
  uVar13 = (ulong)local_3e0;
  goto LAB_002b6319;
LAB_002bd811:
  lVar44 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar44 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar24 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar24 * 4);
LAB_002bd848:
  lVar24 = lVar44 * uVar16 + img_labels.accesses_._16_8_;
LAB_002bd84f:
  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
  goto LAB_002b3d3b;
LAB_002b65a6:
  lVar25 = uVar13 << 0x20;
  piVar1 = (int *)((lVar25 + 0x100000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  lVar42 = lVar25 + 0x100000000 >> 0x20;
  cVar26 = *(char *)(lVar42 + img.img_._16_8_ + lVar24 * uVar15);
  lVar24 = uVar16 - 1;
  piVar1 = (int *)((lVar25 + 0x300000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  lVar40 = lVar25 + 0x300000000 >> 0x20;
  lVar34 = *(long *)img.img_._72_8_;
  lVar21 = lVar34 * lVar24 + img.img_._16_8_;
  lVar44 = *(long *)img.accesses_._72_8_;
  if (cVar26 == '\0') {
    if (*(char *)(lVar40 + lVar21) != '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * lVar24 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar21 + (long)local_3e0) == '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img.img_._72_8_;
        lVar34 = uVar16 - 2;
        if (*(char *)(lVar42 + lVar24 * lVar44 + img.img_._16_8_) == '\0') {
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar34 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
          goto LAB_002bbafc;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar44 * lVar34);
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar42 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        lVar34 = lVar34 * lVar44 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
        if (cVar26 != '\0') {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4) = uVar9;
          goto LAB_002bbafc;
        }
        piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar34 + (long)local_3e0 * 4);
LAB_002b80ef:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002bbafc;
      }
LAB_002b6b76:
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
      ;
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
      goto LAB_002bbafc;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar16 + lVar40 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
    if (*(char *)(lVar40 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
      piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
      if (*(char *)((long)local_3e0 + lVar34) != '\0') goto LAB_002b793b;
      piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + lVar42) == '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002b8673;
      }
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
      goto LAB_002b8291;
    }
    piVar1 = (int *)(lVar44 + (lVar25 + 0x400000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
    lVar34 = lVar25 + 0x400000000 >> 0x20;
    lVar44 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
    cVar26 = *(char *)(lVar34 + lVar44);
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    cVar8 = *(char *)(uVar13 + 2 + lVar44);
    if (cVar26 == '\0') {
      if (cVar8 != '\0') {
LAB_002ba506:
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)
                  ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
        goto LAB_002b47b5;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
      }
      else {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
LAB_002b7d79:
        *(undefined4 *)(lVar24 + (long)local_3e0 * 4) = uVar10;
      }
      goto LAB_002b31c3;
    }
    if (cVar8 != '\0') {
      lVar24 = uVar16 - 2;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar40 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
      lVar42 = *(long *)img_labels.accesses_._72_8_;
      lVar40 = lVar42 * lVar24 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      lVar24 = lVar24 * lVar44 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
      if (cVar26 != '\0') {
        lVar24 = img_labels.accesses_._16_8_ + lVar42 * uVar16;
LAB_002b7241:
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4) = uVar9;
        goto LAB_002b3d3b;
      }
      piVar1 = (int *)(lVar40 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar24 + lVar34 * 4);
      goto LAB_002b8321;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar25 = *(long *)img.img_._72_8_;
    lVar44 = uVar16 - 2;
    if (*(char *)(lVar42 + lVar24 * lVar25 + img.img_._16_8_) == '\0') {
      lVar42 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar42 * lVar44 + img_labels.accesses_._16_8_ + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar44 * lVar24 + img_labels.img_._16_8_ + lVar34 * 4);
      lVar34 = lVar42 * uVar16 + img_labels.accesses_._16_8_;
LAB_002b8500:
      piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar24 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
      goto LAB_002b3d3b;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + lVar40 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar40 + img.img_._16_8_ + lVar25 * lVar44) != '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(uVar13 + 2 + *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_);
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar42 = lVar24 * lVar44 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      lVar44 = lVar44 * lVar34 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
      if (cVar26 == '\0') {
        piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar44 + (long)local_3e0 * 4);
        goto LAB_002c0458;
      }
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = img_labels.img_._16_8_ + lVar34 * uVar16;
LAB_002bdb87:
      *(uint *)(lVar24 + (long)local_3e0 * 4) = uVar9;
      goto LAB_002b3d3b;
    }
    lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar44 + img_labels.accesses_._16_8_;
    piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = lVar44 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
    uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
    piVar1 = (int *)(lVar24 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    uVar30 = *(uint *)(lVar44 + lVar34 * 4);
  }
  else {
    if (*(char *)(lVar40 + lVar21) != '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * lVar24 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar21 + (long)local_3e0) == '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img.img_._72_8_;
        lVar34 = uVar16 - 2;
        if (*(char *)(lVar42 + lVar24 * lVar44 + img.img_._16_8_) != '\0') {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar44 * lVar34);
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          lVar40 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
          lVar42 = (long)iVar11;
          piVar1 = (int *)(lVar40 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          lVar34 = lVar34 * lVar44 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + lVar42 * 4);
          if (cVar26 == '\0') {
            piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + (long)local_3e0 * 4));
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                              lVar42 * 4);
          }
          else {
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + lVar42 * 4);
          }
          uVar9 = TTA::MemMerge(uVar9,uVar30);
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
          goto LAB_002bbafc;
        }
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar44 * lVar34 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar34 * lVar24 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      }
      else {
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar44 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)((uVar16 - 2) * lVar24 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      }
      piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 * uVar16 + img_labels.img_._16_8_ +
                                           (long)iVar11 * 4));
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
               (long)local_3e0 * 4) = uVar9;
      goto LAB_002bbafc;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar16 + lVar40 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
    if (*(char *)(lVar40 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
      piVar1 = (int *)(lVar44 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
      if (*(char *)(lVar42 + lVar34) == '\0') {
        piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar34 + (long)local_3e0) != '\0') {
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                          );
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                               (long)iVar11 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
          goto LAB_002b8cf4;
        }
LAB_002b7e93:
        lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar24 + (long)(int)uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
        uVar10 = *(undefined4 *)(lVar34 + (long)(int)uVar13 * 4);
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
LAB_002b8673:
        uVar15 = uVar16 | 1;
        lVar24 = uVar16 - 1;
        uVar13 = (long)(int)local_3e0;
LAB_002b8685:
        local_3e0 = (long *)(uVar13 + 2);
        iVar11 = (int)uVar13;
        if (lVar36 <= (long)local_3e0) {
          lVar44 = (long)(int)local_3e0;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          lVar42 = *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_;
          cVar26 = *(char *)(lVar44 + lVar34 * uVar16 + img.img_._16_8_);
          if (iVar27 < (int)local_3e0) {
            if (cVar26 == '\0') {
              piVar1 = (int *)(lVar42 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar15) == '\0') goto LAB_002ba1eb;
              lVar24 = (uVar13 << 0x20) + 0x100000000;
              piVar1 = (int *)((lVar24 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar24 >> 0x20) +
                                uVar15 * *(long *)img.img_._72_8_ + img.img_._16_8_);
joined_r0x002b9fb8:
              if (cVar26 == '\0') goto LAB_002bb17e;
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              goto LAB_002b9fd8;
            }
            lVar40 = (uVar13 << 0x20) + 0x100000000;
            piVar1 = (int *)(lVar42 + (lVar40 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            cVar8 = *(char *)((lVar40 >> 0x20) + img.img_._16_8_ + lVar34 * uVar15);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
            if (cVar8 == '\0') goto joined_r0x002bac8d;
joined_r0x002ba115:
            if (cVar26 == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              goto LAB_002b96fe;
            }
          }
          else if (cVar26 == '\0') {
            piVar1 = (int *)(lVar42 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar15);
            lVar34 = (uVar13 << 0x20) + 0x300000000;
            piVar1 = (int *)((lVar34 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar34 = lVar34 >> 0x20;
            lVar42 = *(long *)img.img_._72_8_;
            cVar8 = *(char *)(lVar34 + lVar42 * uVar16 + img.img_._16_8_);
            lVar40 = *(long *)img.accesses_._72_8_;
            if (cVar26 == '\0') {
              if (cVar8 == '\0') {
                piVar1 = (int *)(img.accesses_._16_8_ + lVar40 * uVar15 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = lVar42 * uVar15;
                goto LAB_002bb5c5;
              }
              piVar1 = (int *)(img.accesses_._16_8_ + lVar40 * lVar24 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24) != '\0') goto LAB_002bbab0;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
              goto joined_r0x002bac8d;
            }
            lVar25 = (uVar13 << 0x20) + 0x100000000;
            piVar1 = (int *)((lVar25 >> 0x1e) + img.accesses_._16_8_ + lVar40 * uVar15);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)((lVar25 >> 0x20) + img.img_._16_8_ + lVar42 * uVar15);
            if (cVar8 == '\0') goto joined_r0x002b9fb8;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
            if (cVar26 == '\0') {
              if (*(char *)(lVar34 + lVar42) != '\0') goto LAB_002bbab0;
              piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar42 + lVar44);
              goto joined_r0x002bac8d;
            }
            if (*(char *)(lVar34 + lVar42) == '\0') {
              piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar42 + lVar44);
              goto joined_r0x002ba115;
            }
          }
          else {
            lVar40 = (uVar13 << 0x20) + 0x100000000;
            piVar1 = (int *)(lVar42 + (lVar40 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)((lVar40 >> 0x20) + img.img_._16_8_ + lVar34 * uVar15);
            lVar42 = (uVar13 << 0x20) + 0x300000000;
            piVar1 = (int *)((lVar42 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
            cVar8 = *(char *)((lVar42 >> 0x20) + lVar34);
            if (cVar26 == '\0') {
              if (cVar8 != '\0') goto LAB_002bbab0;
              piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar34 + lVar44);
              goto joined_r0x002bac8d;
            }
            if (cVar8 == '\0') {
              piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar34 + lVar44);
              goto joined_r0x002ba115;
            }
          }
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)((uVar16 - 2) * lVar42 + img_labels.img_._16_8_ + lVar44 * 4);
          lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
          goto LAB_002ba162;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_ * uVar15 + img.img_._16_8_;
        lVar44 = *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_;
        if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * uVar16 + img.img_._16_8_) != '\0'
           ) {
          piVar1 = (int *)(lVar44 + 4 + uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar34 + 1 + uVar13);
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + 0xc +
                          uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          cVar8 = *(char *)(uVar13 + 3 + lVar34 * lVar24 + img.img_._16_8_);
          if (cVar26 != '\0') {
            if (cVar8 != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4
                               );
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
LAB_002b9bb2:
              uVar9 = TTA::MemMerge(uVar9,uVar30);
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                       (long)local_3e0 * 4) = uVar9;
              goto LAB_002bbafc;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                            uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * uVar16) != '\0') {
              lVar34 = (uVar13 << 0x20) + 0x400000000;
              lVar42 = lVar34 >> 0x20;
              piVar1 = (int *)((lVar34 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              lVar44 = lVar34 * lVar24 + img.img_._16_8_;
              if (*(char *)(lVar42 + lVar44) == '\0') {
                piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar44 + (long)local_3e0) == '\0') goto LAB_002bb34f;
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ +
                                 (long)local_3e0 * 4);
                piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                                     (long)iVar11 * 4));
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         (long)local_3e0 * 4) = uVar9;
                goto LAB_002b47b5;
              }
              lVar40 = uVar16 - 2;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + 0xc +
                              uVar13 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * lVar40) != '\0') {
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar40 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
                goto LAB_002b8c4b;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar44 = lVar34 * lVar40 + img_labels.accesses_._16_8_;
              if (*(char *)((long)local_3e0 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_)
                  != '\0') {
                piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
                uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar44 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + lVar42 * 4));
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_
                                  + (long)iVar11 * 4);
                goto LAB_002bb11d;
              }
              piVar1 = (int *)(lVar44 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar40 * lVar44 + img_labels.img_._16_8_ + lVar42 * 4);
              lVar24 = img_labels.accesses_._16_8_ + lVar34 * uVar16;
              goto LAB_002bb0bd;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_) !=
                '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4
                               );
              lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
              goto LAB_002b8ca8;
            }
            lVar44 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar44 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar34 + uVar13 * 4);
            piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
LAB_002b889b:
            *(uint *)(lVar34 + (long)local_3e0 * 4) = uVar9;
            uVar13 = (ulong)local_3e0;
            goto LAB_002b8685;
          }
          if (cVar8 != '\0') goto LAB_002b6b76;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                          uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_) !=
                '\0') {
LAB_002b793b:
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                   uVar10;
LAB_002b8cf4:
              uVar15 = uVar16 | 1;
              lVar24 = uVar16 - 1;
              lVar40 = uVar16 - 2;
              uVar13 = (long)(int)local_3e0;
              while( true ) {
                local_3e0 = (long *)(uVar13 + 2);
                iVar11 = (int)uVar13;
                if (lVar36 <= (long)local_3e0) break;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                                (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img.img_._72_8_ * uVar15 + img.img_._16_8_;
                lVar44 = *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_;
                if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * uVar16 + img.img_._16_8_)
                    == '\0') goto LAB_002b90d2;
                piVar1 = (int *)(lVar44 + 4 + uVar13 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar34 + 1 + uVar13);
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + 0xc
                                + uVar13 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img.img_._72_8_;
                cVar8 = *(char *)(uVar13 + 3 + lVar34 * lVar24 + img.img_._16_8_);
                if (cVar26 == '\0') {
                  if (cVar8 != '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(undefined4 *)
                              (lVar40 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
                         = uVar10;
                    goto LAB_002bbafc;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                                   0xc + uVar13 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((long)local_3e0 +
                                 *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_) != '\0') {
                      lVar34 = *(long *)img_labels.accesses_._72_8_;
                      piVar1 = (int *)(lVar34 * lVar40 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar44 = *(long *)img_labels.img_._72_8_;
                      uVar9 = *(uint *)(lVar44 * lVar40 + img_labels.img_._16_8_ +
                                       (long)local_3e0 * 4);
                      piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      goto LAB_002b8fb9;
                    }
                    uVar9 = TTA::MemNewLabel();
                    piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                     img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                             (long)local_3e0 * 4) = uVar9;
                    goto LAB_002b8673;
                  }
                  lVar34 = (uVar13 << 0x20) + 0x400000000;
                  piVar1 = (int *)((lVar34 >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = lVar34 >> 0x20;
                  lVar44 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
                  cVar26 = *(char *)(lVar34 + lVar44);
                  piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar8 = *(char *)(uVar13 + 2 + lVar44);
                  if (cVar26 == '\0') {
                    if (cVar8 == '\0') goto LAB_002b3185;
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(undefined4 *)
                              (lVar40 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                    goto LAB_002ba59f;
                  }
                  if (cVar8 == '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar42 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(undefined4 *)(lVar40 * lVar42 + img_labels.img_._16_8_ + lVar34 * 4);
                    goto LAB_002bab05;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                                   0xc + uVar13 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(uVar13 + 3 +
                                    *(long *)img.img_._72_8_ * lVar40 + img.img_._16_8_);
                  lVar44 = *(long *)img_labels.accesses_._72_8_;
                  lVar25 = lVar44 * lVar40 + img_labels.accesses_._16_8_;
                  piVar1 = (int *)(lVar25 + (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar24 = *(long *)img_labels.img_._72_8_;
                  lVar42 = lVar40 * lVar24 + img_labels.img_._16_8_;
                  uVar9 = *(uint *)(lVar42 + (long)local_3e0 * 4);
                  if (cVar26 != '\0') goto LAB_002baf1f;
                  piVar1 = (int *)(lVar25 + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(lVar42 + lVar34 * 4);
                  goto LAB_002bb9a6;
                }
                if (cVar8 != '\0') {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + 4
                                  + uVar13 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar13 + 1 + img.img_._16_8_ + lVar34 * lVar40) != '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img.img_._72_8_;
                    if (*(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_) == '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_
                                      + (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar34 * lVar40);
                      lVar24 = *(long *)img_labels.accesses_._72_8_;
                      lVar42 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
                      piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar34 = *(long *)img_labels.img_._72_8_;
                      lVar44 = lVar40 * lVar34 + img_labels.img_._16_8_;
                      uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
                      if (cVar26 != '\0') {
                        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 +
                                        (long)local_3e0 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4) =
                             uVar9;
                        goto LAB_002bbafc;
                      }
                      piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar30 = *(uint *)(lVar44 + (long)local_3e0 * 4);
                      goto LAB_002bb019;
                    }
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ +
                                    (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar10 = *(undefined4 *)
                              (lVar40 * lVar44 + img_labels.img_._16_8_ + (long)iVar11 * 4);
LAB_002b9348:
                    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_002b9353;
                  }
                  lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 +
                           img_labels.accesses_._16_8_;
                  piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
                  uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
                  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(lVar34 + (long)local_3e0 * 4);
                  goto LAB_002b9bb2;
                }
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc
                                + uVar13 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * uVar16) != '\0') {
                  lVar34 = (uVar13 << 0x20) + 0x400000000;
                  lVar42 = lVar34 >> 0x20;
                  piVar1 = (int *)((lVar34 >> 0x1e) +
                                  *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img.img_._72_8_;
                  lVar44 = lVar34 * lVar24 + img.img_._16_8_;
                  if (*(char *)(lVar42 + lVar44) == '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar44 + (long)local_3e0) == '\0') goto LAB_002bb448;
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                                     4 + uVar13 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(uVar13 + 1 +
                                      *(long *)img.img_._72_8_ * lVar40 + img.img_._16_8_);
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    lVar42 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
                    piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_;
                    lVar44 = lVar40 * lVar34 + img_labels.img_._16_8_;
                    uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
                    if (cVar26 != '\0') {
                      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 +
                                      (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4) =
                           uVar9;
                      goto LAB_002b47b5;
                    }
                    piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar30 = *(uint *)(lVar44 + (long)local_3e0 * 4);
                    goto LAB_002bb308;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 +
                                   0xc + uVar13 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * lVar40) != '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 +
                                     4 + uVar13 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img.img_._72_8_;
                    if (*(char *)(uVar13 + 1 + lVar34 * lVar40 + img.img_._16_8_) == '\0') {
                      lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 +
                               img_labels.accesses_._16_8_;
                      piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar34 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
                      uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
                      piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar30 = *(uint *)(lVar34 + (long)local_3e0 * 4);
                      goto LAB_002bb11d;
                    }
                    piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar34 * lVar24) != '\0')
                    goto LAB_002b946a;
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                                    (long)local_3e0 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img.img_._72_8_;
                    goto LAB_002baf65;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                                  (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img.img_._72_8_;
                  if (*(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_) == '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + lVar42 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar44 = *(long *)img_labels.img_._72_8_;
                    uVar9 = *(uint *)(lVar40 * lVar44 + img_labels.img_._16_8_ + lVar42 * 4);
                    lVar34 = (long)iVar11;
                    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_002bb112;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + 4
                                  + uVar13 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(uVar13 + 1 + img.img_._16_8_ + lVar34 * lVar40) == '\0')
                  goto LAB_002b3d3b;
                  lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 +
                           img_labels.accesses_._16_8_;
                  piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
                  uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
                  piVar1 = (int *)(lVar24 + lVar42 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(lVar34 + lVar42 * 4);
                  goto LAB_002bb11d;
                }
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img.img_._72_8_;
                if (*(char *)((long)local_3e0 + lVar34 * lVar24 + img.img_._16_8_) == '\0') {
                  lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_;
                  piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                  uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
                  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
                  goto LAB_002b8673;
                }
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + 4 +
                                uVar13 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(uVar13 + 1 + img.img_._16_8_ + lVar34 * lVar40);
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                lVar42 = lVar34 * lVar40 + img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar42 + uVar13 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                lVar25 = lVar44 * lVar40 + img_labels.img_._16_8_;
                uVar9 = *(uint *)(lVar25 + uVar13 * 4);
                if (cVar26 == '\0') {
                  piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar25 + (long)local_3e0 * 4));
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                   img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar44 = *(long *)img_labels.img_._72_8_;
                }
                else {
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 +
                                  (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                }
LAB_002b8fb9:
                *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar9;
                uVar13 = (ulong)local_3e0;
              }
              lVar44 = (long)(int)local_3e0;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              lVar42 = *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_;
              cVar26 = *(char *)(lVar44 + lVar34 * uVar16 + img.img_._16_8_);
              if (iVar27 < (int)local_3e0) {
                if (cVar26 == '\0') {
                  piVar1 = (int *)(lVar42 + lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar15) != '\0') {
                    lVar24 = (uVar13 << 0x20) + 0x100000000;
                    piVar1 = (int *)((lVar24 >> 0x1e) +
                                    *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)((lVar24 >> 0x20) +
                                      uVar15 * *(long *)img.img_._72_8_ + img.img_._16_8_);
LAB_002b9dcb:
                    if (cVar26 == '\0') goto LAB_002bb17e;
LAB_002bc7d4:
                    lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_;
                    piVar1 = (int *)(lVar24 + (long)(int)uVar13 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
                    uVar10 = *(undefined4 *)(lVar34 + (long)(int)uVar13 * 4);
                    piVar1 = (int *)(lVar24 + lVar44 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar34 + lVar44 * 4) = uVar10;
                    goto LAB_002c0aee;
                  }
                  goto LAB_002c0ab4;
                }
                lVar25 = (uVar13 << 0x20) + 0x100000000;
                piVar1 = (int *)(lVar42 + (lVar25 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar25 = lVar25 >> 0x20;
                cVar8 = *(char *)(lVar25 + img.img_._16_8_ + lVar34 * uVar15);
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img.img_._72_8_;
                cVar26 = *(char *)(lVar44 + lVar24 * lVar34 + img.img_._16_8_);
                if (cVar8 == '\0') goto joined_r0x002bb54b;
                if (cVar26 == '\0') goto LAB_002beece;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                                lVar25 * 4);
                *piVar1 = *piVar1 + 1;
LAB_002bab67:
                cVar26 = *(char *)(lVar25 + img.img_._16_8_ + lVar34 * lVar40);
LAB_002bab6b:
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                lVar25 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar25 + (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                lVar34 = lVar40 * lVar42 + img_labels.img_._16_8_;
                uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
                if (cVar26 != '\0') goto LAB_002babaa;
                piVar1 = (int *)(lVar25 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
LAB_002babc9:
                uVar30 = *(uint *)(lVar34 + lVar44 * 4);
                goto LAB_002ba170;
              }
              if (cVar26 == '\0') {
                piVar1 = (int *)(lVar42 + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar15);
                lVar34 = (uVar13 << 0x20) + 0x300000000;
                piVar1 = (int *)((lVar34 >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
                *piVar1 = *piVar1 + 1;
                lVar34 = lVar34 >> 0x20;
                lVar42 = *(long *)img.img_._72_8_;
                cVar8 = *(char *)(lVar34 + lVar42 * uVar16 + img.img_._16_8_);
                lVar21 = *(long *)img.accesses_._72_8_;
                if (cVar26 == '\0') {
                  if (cVar8 == '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + lVar21 * uVar15 + lVar34 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * uVar15) == '\0')
                    goto LAB_002bb5a2;
LAB_002bf6ff:
                    uVar9 = TTA::MemNewLabel();
                    goto LAB_002c0721;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ + lVar21 * lVar24 + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24) != '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + lVar44 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = *(long *)img_labels.img_._72_8_;
                    uVar9 = *(uint *)(lVar40 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
                    goto LAB_002be807;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                  lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
                }
                else {
                  lVar18 = (uVar13 << 0x20) + 0x100000000;
                  lVar25 = lVar18 >> 0x20;
                  piVar1 = (int *)((lVar18 >> 0x1e) + img.accesses_._16_8_ + lVar21 * uVar15);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar25 + img.img_._16_8_ + lVar42 * uVar15);
                  if (cVar8 == '\0') goto joined_r0x002bee99;
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                  lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar42 = *(long *)img.img_._72_8_;
                  lVar21 = lVar42 * lVar24 + img.img_._16_8_;
                  if (cVar26 != '\0') {
                    if (*(char *)(lVar34 + lVar21) == '\0') {
                      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24
                                      + lVar44 * 4);
                      *piVar1 = *piVar1 + 1;
                      cVar26 = *(char *)(lVar21 + lVar44);
                      goto joined_r0x002bb7f4;
                    }
                    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 +
                                    lVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(lVar25 + img.img_._16_8_ + lVar42 * lVar40);
                    goto joined_r0x002b9f14;
                  }
                  if (*(char *)(lVar34 + lVar21) != '\0') goto LAB_002bb83e;
                  piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar21 + lVar44);
                }
joined_r0x002bb54b:
                if (cVar26 == '\0') goto LAB_002bbaf2;
              }
              else {
                lVar25 = (uVar13 << 0x20) + 0x100000000;
                piVar1 = (int *)(lVar42 + (lVar25 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar25 = lVar25 >> 0x20;
                cVar26 = *(char *)(lVar25 + img.img_._16_8_ + lVar34 * uVar15);
                lVar21 = (uVar13 << 0x20) + 0x300000000;
                piVar1 = (int *)((lVar21 >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img.img_._72_8_;
                lVar42 = lVar34 * lVar24 + img.img_._16_8_;
                cVar8 = *(char *)((lVar21 >> 0x20) + lVar42);
                if (cVar26 != '\0') {
                  if (cVar8 == '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                                    lVar44 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(lVar42 + lVar44);
joined_r0x002bb7f4:
                    if (cVar26 != '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_
                                      + lVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar34 = *(long *)img.img_._72_8_;
                      goto LAB_002bab67;
                    }
                    goto LAB_002beece;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 +
                                  lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar25 + img.img_._16_8_ + lVar34 * lVar40);
joined_r0x002b9f14:
                  if (cVar26 == '\0') {
                    lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 +
                             img_labels.accesses_._16_8_;
                    piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar34 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
                    uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
                    piVar1 = (int *)(lVar24 + lVar44 * 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_002babc9;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                                  lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img.img_._72_8_;
                  if (*(char *)(lVar44 + lVar24 * lVar34 + img.img_._16_8_) == '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                                    lVar44 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * lVar40);
                    goto LAB_002bab6b;
                  }
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + (long)iVar11 * 4)
                  ;
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(undefined4 *)
                            (lVar40 * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
                  goto LAB_002bcd6e;
                }
                if (cVar8 == '\0') {
                  piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                  lVar44 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar42 + lVar44);
                  goto joined_r0x002bb54b;
                }
              }
LAB_002bb83e:
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar40 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
              goto LAB_002be807;
            }
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
            goto LAB_002b889b;
          }
          lVar42 = (uVar13 << 0x20) + 0x400000000;
          piVar1 = (int *)((lVar42 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar42 >> 0x20;
          lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
          cVar26 = *(char *)(lVar42 + lVar34);
          piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          cVar8 = *(char *)(uVar13 + 2 + lVar34);
          if (cVar26 == '\0') {
            if (cVar8 != '\0') goto LAB_002ba506;
            goto LAB_002b3185;
          }
          if (cVar8 != '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 2) + img.accesses_._16_8_ +
                             0xc + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(uVar13 + 3 +
                              *(long *)img.img_._72_8_ * (uVar16 - 2) + img.img_._16_8_);
LAB_002b9932:
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            lVar34 = lVar44 * (uVar16 - 2) + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = *(long *)img_labels.img_._72_8_;
            lVar24 = (uVar16 - 2) * lVar40 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
            if (cVar26 != '\0') goto LAB_002b9976;
            piVar1 = (int *)(lVar34 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar24 + lVar42 * 4);
            goto LAB_002ba63d;
          }
LAB_002ba1af:
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar42 * 4);
          goto LAB_002bd848;
        }
        piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar34 + 2 + uVar13);
        lVar40 = uVar13 << 0x20;
        piVar1 = (int *)((lVar40 + 0x300000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar42 = lVar40 + 0x300000000 >> 0x20;
        lVar34 = *(long *)img.img_._72_8_;
        cVar8 = *(char *)(lVar42 + lVar34 * uVar16 + img.img_._16_8_);
        lVar44 = *(long *)img.accesses_._72_8_;
        if (cVar26 != '\0') {
          piVar1 = (int *)((lVar40 + 0x100000000 >> 0x1e) + img.accesses_._16_8_ + lVar44 * uVar15);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)((lVar40 + 0x100000000 >> 0x20) + img.img_._16_8_ + lVar34 * uVar15);
          if (cVar8 == '\0') {
            if (cVar26 == '\0') {
              uVar9 = TTA::MemNewLabel();
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                       (long)local_3e0 * 4) = uVar9;
            }
            else {
              lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
              uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
              piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
            }
            goto LAB_002b6307;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
          if (cVar26 == '\0') {
            if (*(char *)(lVar42 + lVar34) == '\0') {
              lVar44 = lVar40 + 0x400000000 >> 0x20;
              piVar1 = (int *)((lVar40 + 0x400000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar34 + lVar44);
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              cVar8 = *(char *)(uVar13 + 2 + lVar24 * lVar34 + img.img_._16_8_);
              if (cVar26 == '\0') {
                if (cVar8 != '\0') {
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                  (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(undefined4 *)
                            ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ +
                                  (long)local_3e0 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                       uVar10;
                  goto LAB_002b47b5;
                }
                uVar9 = TTA::MemNewLabel();
                lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                ;
                goto LAB_002bb507;
              }
              lVar24 = uVar16 - 2;
              if (cVar8 == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)(lVar24 * lVar42 + img_labels.img_._16_8_ + lVar44 * 4);
                piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar42 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                     uVar10;
                goto LAB_002b3d3b;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar42 + img.img_._16_8_ + lVar34 * lVar24);
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img_labels.img_._72_8_;
              lVar24 = lVar24 * lVar42 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
              if (cVar26 != '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + (long)local_3e0 * 4) = uVar9;
                goto LAB_002b3d3b;
              }
              piVar1 = (int *)(lVar40 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + lVar44 * 4));
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              goto LAB_002bb9bb;
            }
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            lVar34 = lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_;
LAB_002b1313:
            piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)
                      ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
            piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10
            ;
            goto LAB_002b5619;
          }
          if (*(char *)(lVar42 + lVar34) != '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
            piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                                 (long)iVar11 * 4));
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                     (long)local_3e0 * 4) = uVar9;
            goto LAB_002b5619;
          }
          piVar1 = (int *)((lVar40 + 0x400000000 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar44 = lVar40 + 0x400000000 >> 0x20;
          if (*(char *)(lVar34 + lVar44) != '\0') {
            lVar34 = uVar16 - 2;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                            lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar42 + lVar40 * lVar34 + img.img_._16_8_) != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar34 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
              lVar34 = (long)iVar11;
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_002ba71f;
            }
            piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img_labels.accesses_._72_8_;
            lVar25 = lVar42 * lVar34 + img_labels.accesses_._16_8_;
            if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar40 * lVar24) == '\0') {
              piVar1 = (int *)(lVar25 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar34 * lVar24 + img_labels.img_._16_8_ + lVar44 * 4);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * uVar16 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar24 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
            }
            else {
              piVar1 = (int *)(lVar25 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = lVar34 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
              piVar1 = (int *)(lVar25 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + lVar44 * 4));
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                                (long)iVar11 * 4);
            }
            goto LAB_002bb9a6;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)((long)local_3e0 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_) ==
              '\0') {
LAB_002bb34f:
            lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            goto LAB_002bb369;
          }
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                          );
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
LAB_002bb308:
          uVar9 = TTA::MemMerge(uVar9,uVar30);
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
          goto LAB_002b47b5;
        }
        if (cVar8 == '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar15 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * uVar15) == '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            goto LAB_002bb078;
          }
          uVar9 = TTA::MemNewLabel();
          lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002ba3a0:
          lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
          goto LAB_002b1375;
        }
        piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * lVar24 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * lVar24) != '\0') {
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                          );
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)
                    ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
          goto LAB_002b5619;
        }
        piVar1 = (int *)((lVar40 + 0x400000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar25 = lVar40 + 0x400000000 >> 0x20;
        lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
        cVar26 = *(char *)(lVar25 + lVar34);
        piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar8 = *(char *)(uVar13 + 2 + lVar34);
        if (cVar26 != '\0') {
          lVar24 = uVar16 - 2;
          if (cVar8 == '\0') {
            lVar42 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar42 * lVar24 + img_labels.accesses_._16_8_ + lVar25 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar24 * lVar44 + img_labels.img_._16_8_ + lVar25 * 4);
            goto LAB_002bb765;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar42 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
          lVar42 = *(long *)img_labels.accesses_._72_8_;
          lVar34 = lVar42 * lVar24 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)img_labels.img_._72_8_;
          lVar24 = lVar24 * lVar40 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
          if (cVar26 != '\0') goto LAB_002b2156;
          piVar1 = (int *)(lVar34 + lVar25 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar24 + lVar25 * 4);
          goto LAB_002ba63d;
        }
        if (cVar8 != '\0') goto LAB_002ba506;
LAB_002bb4e3:
        uVar9 = TTA::MemNewLabel();
        lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
LAB_002bb507:
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002b31c3;
      }
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar44 = (long)iVar11;
      piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4));
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
               (long)local_3e0 * 4) = uVar9;
      goto LAB_002bdc67;
    }
    lVar34 = lVar25 + 0x400000000 >> 0x20;
    piVar1 = (int *)(lVar44 + (lVar25 + 0x400000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
    lVar25 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
    if (*(char *)(lVar34 + lVar44) == '\0') {
      piVar1 = (int *)(lVar25 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + lVar42) != '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar34 = (long)iVar11;
        piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002b7830:
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + lVar34 * 4);
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar34 * 4)
                             );
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002bcf4e;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)local_3e0 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_) != '\0')
      {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                             (long)iVar11 * 4));
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002b47b5;
      }
LAB_002b8200:
      lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
      iVar11 = (int)uVar13;
LAB_002bb369:
      piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
      uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
      piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
      goto LAB_002b31c3;
    }
    piVar1 = (int *)(lVar25 + (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar44 + (long)local_3e0) != '\0') {
      lVar24 = uVar16 - 2;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar40 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
      lVar42 = *(long *)img_labels.accesses_._72_8_;
      lVar40 = lVar42 * lVar24 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      lVar24 = lVar24 * lVar44 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
      if (cVar26 == '\0') {
        piVar1 = (int *)(lVar40 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar24 + lVar34 * 4);
LAB_002b7fa9:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)(int)uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                          (long)(int)uVar13 * 4);
      }
      else {
        lVar34 = (long)iVar11;
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * uVar16 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002b6dc6:
        uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + lVar34 * 4);
      }
LAB_002b8321:
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
               (long)local_3e0 * 4) = uVar9;
      goto LAB_002b3d3b;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar25 = *(long *)img.img_._72_8_;
    lVar44 = uVar16 - 2;
    if (*(char *)(lVar42 + lVar24 * lVar25 + img.img_._16_8_) == '\0') {
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * lVar44 + img_labels.accesses_._16_8_ + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar44 * lVar42 + img_labels.img_._16_8_ + lVar34 * 4);
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar42 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
    }
    else {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar40 + img.img_._16_8_ + lVar25 * lVar44) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(uVar13 + 2 + *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_);
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar40 = lVar24 * lVar44 + img_labels.accesses_._16_8_;
        lVar42 = (long)iVar11;
        piVar1 = (int *)(lVar40 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        lVar44 = lVar44 * lVar34 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar44 + lVar42 * 4);
        if (cVar26 == '\0') {
          piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar44 + (long)local_3e0 * 4);
LAB_002b856b:
          uVar9 = TTA::MemMerge(uVar9,uVar30);
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                            lVar42 * 4);
        }
        else {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + lVar42 * 4);
        }
LAB_002bb9a6:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002bb9bb:
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002b3d3b;
      }
      lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar44 + img_labels.accesses_._16_8_;
      lVar42 = (long)iVar11;
      piVar1 = (int *)(lVar24 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = lVar44 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar44 + lVar42 * 4);
      piVar1 = (int *)(lVar24 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 + lVar34 * 4));
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                        lVar42 * 4);
    }
  }
  uVar9 = TTA::MemMerge(uVar9,uVar30);
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                  (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
       = uVar9;
  goto LAB_002b3d3b;
LAB_002b90d2:
  piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  cVar26 = *(char *)(lVar34 + 2 + uVar13);
  lVar25 = uVar13 << 0x20;
  piVar1 = (int *)((lVar25 + 0x300000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  lVar42 = lVar25 + 0x300000000 >> 0x20;
  lVar34 = *(long *)img.img_._72_8_;
  cVar8 = *(char *)(lVar42 + lVar34 * uVar16 + img.img_._16_8_);
  lVar44 = *(long *)img.accesses_._72_8_;
  if (cVar26 == '\0') {
    if (cVar8 == '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar15 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * uVar15) == '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002bb078:
        lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
LAB_002c01d5:
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        puVar14 = (undefined4 *)
                  (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                  (long)local_3e0 * 4);
LAB_002b0ed3:
        *puVar14 = 0;
        uVar15 = uVar16 | 1;
        uVar13 = (long)(int)local_3e0;
        do {
          local_3e0 = (long *)(uVar13 + 2);
          iVar11 = (int)uVar13;
          if (lVar36 <= (long)local_3e0) {
            lVar34 = (long)(int)local_3e0;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = *(long *)img.img_._72_8_;
            cVar26 = *(char *)(lVar34 + lVar24 * uVar16 + img.img_._16_8_);
            if (iVar27 < (int)local_3e0) {
              if (cVar26 == '\0') {
                piVar1 = (int *)(uVar15 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar24 * uVar15);
joined_r0x002b202c:
                if (cVar26 == '\0') {
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                   img_labels.accesses_._16_8_ + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)
                   (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar34 * 4)
                       = 0;
                  goto LAB_002c0aee;
                }
              }
              else {
                lVar44 = uVar16 - 1;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                                lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar34 + img.img_._16_8_ + lVar24 * lVar44) != '\0')
                goto LAB_002b1db7;
                lVar24 = (uVar13 << 0x20) + 0x100000000;
                piVar1 = (int *)((lVar24 >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)((lVar24 >> 0x20) +
                                  lVar44 * *(long *)img.img_._72_8_ + img.img_._16_8_);
joined_r0x002b1b95:
                if (cVar26 != '\0') {
                  lVar24 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                  (long)iVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar44 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(undefined4 *)
                            ((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + (long)iVar11 * 4);
                  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar34 * 4) = uVar10;
                  goto LAB_002c0aee;
                }
              }
LAB_002b2032:
              uVar9 = TTA::MemNewLabel();
            }
            else {
              if (cVar26 == '\0') {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                                lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar24 * uVar15);
                lVar24 = (uVar13 << 0x20) + 0x300000000;
                lVar44 = lVar24 >> 0x20;
                piVar1 = (int *)((lVar24 >> 0x1e) +
                                *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
                *piVar1 = *piVar1 + 1;
                lVar24 = *(long *)img.img_._72_8_;
                cVar8 = *(char *)(lVar44 + lVar24 * uVar16 + img.img_._16_8_);
                if (cVar26 == '\0') {
                  if (cVar8 == '\0') {
                    piVar1 = (int *)(uVar15 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                                    lVar44 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar24 * uVar15);
                    goto joined_r0x002b202c;
                  }
                }
                else if (cVar8 == '\0') goto LAB_002b2032;
                lVar42 = uVar16 - 1;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ +
                                lVar44 * 4);
                *piVar1 = *piVar1 + 1;
                if ((*(char *)(lVar44 + img.img_._16_8_ + lVar24 * lVar42) != '\0') ||
                   (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ +
                                    lVar34 * 4), *piVar1 = *piVar1 + 1,
                   *(char *)(lVar34 + lVar42 * *(long *)img.img_._72_8_ + img.img_._16_8_) != '\0'))
                goto LAB_002b1db7;
                goto LAB_002b2032;
              }
              lVar44 = uVar16 - 1;
              lVar42 = uVar13 << 0x20;
              piVar1 = (int *)((lVar42 + 0x300000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((lVar42 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar24 * lVar44)
              ;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                              lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
              if (cVar26 == '\0') {
                if (*(char *)(lVar34 + lVar24) == '\0') {
                  piVar1 = (int *)((lVar42 + 0x100000000 >> 0x1e) +
                                  lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar24 + (lVar42 + 0x100000000 >> 0x20));
                  goto joined_r0x002b1b95;
                }
LAB_002b1db7:
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          ((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + lVar34 * 4);
                piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + lVar34 * 4) = uVar10;
                goto LAB_002c0aee;
              }
              if (*(char *)(lVar34 + lVar24) != '\0') goto LAB_002b1db7;
              piVar1 = (int *)((lVar42 + 0x100000000 >> 0x1e) +
                              lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar44 = uVar16 - 2;
              if (*(char *)(lVar24 + (lVar42 + 0x100000000 >> 0x20)) == '\0') {
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * lVar44 + img_labels.accesses_._16_8_ + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                lVar42 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)(lVar44 * lVar42 + img_labels.img_._16_8_ + lVar34 * 4);
                piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar42 * uVar16 + img_labels.img_._16_8_ + lVar34 * 4) = uVar10;
                goto LAB_002c0aee;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                              lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar34 + *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_);
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar24 * lVar44 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img_labels.img_._72_8_;
              lVar44 = lVar44 * lVar42 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
              if (cVar26 != '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + lVar34 * 4) = uVar9;
                goto LAB_002c0aee;
              }
              piVar1 = (int *)(lVar40 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 + lVar34 * 4));
            }
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar34 * 4
                     ) = uVar9;
            goto LAB_002c0aee;
          }
          lVar24 = *(long *)img.accesses_._72_8_;
          lVar42 = lVar24 * uVar16 + img.accesses_._16_8_;
          piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          lVar44 = lVar34 * uVar16 + img.img_._16_8_;
          if (*(char *)((long)local_3e0 + lVar44) != '\0') {
            lVar24 = uVar16 - 1;
            lVar44 = uVar13 << 0x20;
            lVar42 = lVar44 + 0x300000000 >> 0x20;
            piVar1 = (int *)((lVar44 + 0x300000000 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            lVar40 = lVar34 * lVar24 + img.img_._16_8_;
            if (*(char *)(lVar42 + lVar40) != '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar40 + (long)local_3e0) != '\0') {
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          ((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                goto LAB_002b9348;
              }
              piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar42 = *(long *)img.img_._72_8_;
              lVar34 = uVar16 - 2;
              if (*(char *)((lVar44 + 0x100000000 >> 0x20) + lVar24 * lVar42 + img.img_._16_8_) ==
                  '\0') {
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * lVar34 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          (lVar34 * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                     uVar10;
                goto LAB_002bbafc;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar42 * lVar34);
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              lVar42 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              lVar34 = lVar34 * lVar44 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
              if (cVar26 != '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4) = uVar9;
                goto LAB_002bbafc;
              }
              piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar34 + (long)local_3e0 * 4);
              goto LAB_002b80ef;
            }
            piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar16 +
                            lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
            if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
              piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
              if (*(char *)((long)local_3e0 + lVar34) != '\0') goto LAB_002b793b;
              piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                              lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar34 + (lVar44 + 0x100000000 >> 0x20)) == '\0') {
                uVar9 = TTA::MemNewLabel();
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                                 img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                         (long)local_3e0 * 4) = uVar9;
              }
              else {
                lVar24 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                                (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
                piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
LAB_002b8291:
                *(undefined4 *)(lVar24 + (long)local_3e0 * 4) = uVar10;
              }
              goto LAB_002b8673;
            }
            piVar1 = (int *)(lVar40 + (lVar44 + 0x400000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar34 = lVar44 + 0x400000000 >> 0x20;
            lVar40 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
            cVar26 = *(char *)(lVar34 + lVar40);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            cVar8 = *(char *)(uVar13 + 2 + lVar40);
            if (cVar26 == '\0') {
              if (cVar8 != '\0') goto LAB_002b7a42;
              piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((lVar44 + 0x100000000 >> 0x20) +
                           lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0')
              goto LAB_002bfe82;
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ +
                              (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        ((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
              goto LAB_002b7d79;
            }
            if (cVar8 != '\0') {
              lVar24 = uVar16 - 2;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar42 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_);
              lVar42 = *(long *)img_labels.accesses_._72_8_;
              lVar40 = lVar42 * lVar24 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              lVar24 = lVar24 * lVar44 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar24 + (long)local_3e0 * 4);
              if (cVar26 != '\0') {
                lVar24 = img_labels.accesses_._16_8_ + lVar42 * uVar16;
                goto LAB_002b7241;
              }
              piVar1 = (int *)(lVar40 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar24 + lVar34 * 4);
              goto LAB_002b8321;
            }
            piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar25 = *(long *)img.img_._72_8_;
            lVar40 = uVar16 - 2;
            if (*(char *)((lVar44 + 0x100000000 >> 0x20) + lVar24 * lVar25 + img.img_._16_8_) ==
                '\0') {
              lVar44 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar44 * lVar40 + img_labels.accesses_._16_8_ + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(lVar40 * lVar24 + img_labels.img_._16_8_ + lVar34 * 4);
              lVar34 = lVar44 * uVar16 + img_labels.accesses_._16_8_;
              goto LAB_002b8500;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                            lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + img.img_._16_8_ + lVar25 * lVar40) == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
              piVar1 = (int *)(lVar24 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar44 + lVar34 * 4);
              goto LAB_002bda4d;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(uVar13 + 2 + *(long *)img.img_._72_8_ * lVar40 + img.img_._16_8_);
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            lVar42 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            lVar44 = lVar40 * lVar34 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
            if (cVar26 == '\0') {
              piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar44 + (long)local_3e0 * 4);
              goto LAB_002c0458;
            }
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar24 = img_labels.img_._16_8_ + lVar34 * uVar16;
            goto LAB_002bff5d;
          }
          lVar40 = lVar24 * uVar15 + img.accesses_._16_8_;
          piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar24 = lVar34 * uVar15 + img.img_._16_8_;
          if (*(char *)((long)local_3e0 + lVar24) != '\0') {
            lVar24 = (uVar13 << 0x20) + 0x300000000;
            lVar34 = lVar24 >> 0x20;
            piVar1 = (int *)((lVar24 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar24 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar34 + lVar24 * uVar16 + img.img_._16_8_) == '\0') {
              uVar9 = TTA::MemNewLabel();
              piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                               img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                       (long)local_3e0 * 4) = uVar9;
              goto LAB_002b6307;
            }
            lVar44 = uVar16 - 1;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar34 + img.img_._16_8_ + lVar24 * lVar44) != '\0') goto LAB_002b126d;
            lVar24 = (uVar13 << 0x20) + 0x400000000;
            piVar1 = (int *)((lVar24 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar24 = lVar24 >> 0x20;
            lVar42 = *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_;
            cVar26 = *(char *)(lVar24 + lVar42);
            piVar1 = (int *)(lVar44 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            cVar8 = *(char *)(uVar13 + 2 + lVar42);
            if (cVar26 == '\0') {
              if (cVar8 != '\0') goto LAB_002b7a42;
              goto LAB_002bfe82;
            }
            lVar44 = uVar16 - 2;
            if (cVar8 == '\0') {
              lVar42 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar42 * lVar44 + img_labels.accesses_._16_8_ + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(lVar44 * lVar34 + img_labels.img_._16_8_ + lVar24 * 4);
              lVar24 = lVar42 * uVar16 + img_labels.accesses_._16_8_;
              goto LAB_002bd84f;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar44 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar34 + *(long *)img.img_._72_8_ * lVar44 + img.img_._16_8_);
            lVar34 = *(long *)img_labels.accesses_._72_8_;
            lVar42 = lVar34 * lVar44 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar40 = *(long *)img_labels.img_._72_8_;
            lVar44 = lVar44 * lVar40 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar44 + (long)local_3e0 * 4);
            if (cVar26 == '\0') {
              piVar1 = (int *)(lVar42 + lVar24 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar44 + lVar24 * 4);
              goto LAB_002ba63d;
            }
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_002b9985;
          }
          piVar1 = (int *)(lVar42 + 0xc + uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar44 + 3 + uVar13) != '\0') {
            lVar34 = uVar16 - 1;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0xc +
                            uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
            if (*(char *)(uVar13 + 3 + lVar44) != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              lVar34 = lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_;
              goto LAB_002b1313;
            }
            lVar42 = (uVar13 << 0x20) + 0x400000000;
            lVar24 = lVar42 >> 0x20;
            piVar1 = (int *)((lVar42 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar44 + lVar24);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img.img_._72_8_;
            cVar8 = *(char *)(uVar13 + 2 + lVar34 * lVar44 + img.img_._16_8_);
            if (cVar26 != '\0') {
              lVar34 = uVar16 - 2;
              if (cVar8 == '\0') {
                lVar42 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar42 * lVar34 + img_labels.accesses_._16_8_ + lVar24 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)(lVar34 * lVar44 + img_labels.img_._16_8_ + lVar24 * 4);
                lVar24 = lVar42 * uVar16 + img_labels.accesses_._16_8_;
                goto LAB_002bb76c;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0xc +
                              uVar13 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(uVar13 + 3 + img.img_._16_8_ + lVar44 * lVar34);
              lVar42 = *(long *)img_labels.accesses_._72_8_;
              lVar34 = lVar42 * lVar34 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_002b688e;
            }
            if (cVar8 != '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              lVar24 = lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_;
              goto LAB_002b7a63;
            }
            uVar9 = TTA::MemNewLabel();
            lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            goto LAB_002bfea8;
          }
          piVar1 = (int *)(lVar40 + 0xc + uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar24 + 3 + uVar13) != '\0') goto LAB_002b134f;
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)
           (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
               = 0;
          uVar13 = (ulong)local_3e0;
        } while( true );
      }
      uVar9 = TTA::MemNewLabel();
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      goto LAB_002ba3a0;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * lVar24 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * lVar24) != '\0') {
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar40 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
      goto LAB_002b5619;
    }
    piVar1 = (int *)((lVar25 + 0x400000000 >> 0x1e) +
                    *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
    *piVar1 = *piVar1 + 1;
    lVar21 = lVar25 + 0x400000000 >> 0x20;
    lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
    cVar26 = *(char *)(lVar21 + lVar34);
    piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    cVar8 = *(char *)(uVar13 + 2 + lVar34);
    if (cVar26 == '\0') {
LAB_002bafcb:
      if (cVar8 == '\0') goto LAB_002bb4e3;
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar40 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
LAB_002bfe67:
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
LAB_002bfe79:
      *(undefined4 *)(lVar24 + (long)local_3e0 * 4) = uVar10;
      goto LAB_002b47b5;
    }
    if (cVar8 == '\0') {
LAB_002bb488:
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar40 * lVar34 + img_labels.img_._16_8_ + lVar21 * 4);
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
      goto LAB_002b3d3b;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar42 + *(long *)img.img_._72_8_ * lVar40 + img.img_._16_8_);
  }
  else {
    lVar21 = lVar25 + 0x100000000 >> 0x20;
    piVar1 = (int *)((lVar25 + 0x100000000 >> 0x1e) + img.accesses_._16_8_ + lVar44 * uVar15);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar21 + img.img_._16_8_ + lVar34 * uVar15);
    if (cVar8 == '\0') {
      if (cVar26 == '\0') {
        uVar9 = TTA::MemNewLabel();
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
      }
      else {
        lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
        uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
      }
      goto LAB_002b6307;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    lVar44 = lVar34 * lVar24 + img.img_._16_8_;
    if (cVar26 != '\0') {
      if (*(char *)(lVar42 + lVar44) != '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 + lVar21 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar21 + img.img_._16_8_ + lVar34 * lVar40) == '\0') {
          lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
          piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + (long)local_3e0 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
          goto LAB_002b5619;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_) != '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * lVar40 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar24 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar40 * lVar24 + img_labels.img_._16_8_ + (long)iVar11 * 4);
          goto LAB_002b6c7b;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar34 * lVar40);
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar42 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        lVar44 = lVar40 * lVar34 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
        if (cVar26 == '\0') {
          piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 + (long)local_3e0 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
        }
        else {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4) = uVar9;
        }
        goto LAB_002b5619;
      }
      piVar1 = (int *)((lVar25 + 0x400000000 >> 0x1e) +
                      img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
      *piVar1 = *piVar1 + 1;
      lVar34 = lVar25 + 0x400000000 >> 0x20;
      if (*(char *)(lVar44 + lVar34) == '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_) != '\0') {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar21 + img.img_._16_8_ + lVar34 * lVar40);
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          lVar42 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
          piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          lVar44 = lVar40 * lVar34 + img_labels.img_._16_8_;
          uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
          if (cVar26 == '\0') {
            piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar44 + (long)local_3e0 * 4));
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                     (long)local_3e0 * 4) = uVar9;
          }
          else {
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4) = uVar9;
          }
          goto LAB_002b47b5;
        }
LAB_002bb448:
        lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
        lVar24 = (long)iVar11;
LAB_002bb464:
        piVar1 = (int *)(lVar34 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
        uVar10 = *(undefined4 *)(lVar44 + lVar24 * 4);
        piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 + (long)local_3e0 * 4) = uVar10;
        goto LAB_002b31c3;
      }
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img.img_._72_8_;
      lVar25 = lVar44 * lVar40 + img.img_._16_8_;
      if (*(char *)(lVar42 + lVar25) == '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar44 * lVar24) == '\0') {
          lVar24 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar40 * lVar44 + img_labels.img_._16_8_ + lVar34 * 4);
          lVar34 = (long)iVar11;
          piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar24 = lVar44 * uVar16 + img_labels.img_._16_8_;
          goto LAB_002bb119;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + lVar21 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar21 + *(long *)img.img_._72_8_ * lVar40 + img.img_._16_8_) == '\0')
        goto LAB_002b3d3b;
        lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
        piVar1 = (int *)(lVar24 + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar44 + lVar34 * 4);
        goto LAB_002bb11d;
      }
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar40 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar25 + lVar21) == '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar40 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = lVar40 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar34 + (long)local_3e0 * 4);
        goto LAB_002bb11d;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      if (*(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_) != '\0') {
LAB_002b946a:
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar40 * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
LAB_002bc6f7:
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002bcf03;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
LAB_002baf65:
      cVar26 = *(char *)(uVar13 + 2 + lVar34 * lVar40 + img.img_._16_8_);
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar42 = lVar24 * lVar40 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      lVar44 = lVar40 * lVar34 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar44 + (long)iVar11 * 4);
      if (cVar26 != '\0') {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4) = uVar9;
        goto LAB_002b3d3b;
      }
      piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar44 + (long)local_3e0 * 4);
      goto LAB_002bb9a6;
    }
    if (*(char *)(lVar42 + lVar44) != '\0') {
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * lVar40 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar40 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
      goto LAB_002b5619;
    }
    lVar21 = lVar25 + 0x400000000 >> 0x20;
    piVar1 = (int *)((lVar25 + 0x400000000 >> 0x1e) +
                    *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar44 + lVar21);
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    cVar8 = *(char *)(uVar13 + 2 + lVar24 * lVar34 + img.img_._16_8_);
    if (cVar26 == '\0') goto LAB_002bafcb;
    if (cVar8 == '\0') goto LAB_002bb488;
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar40 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar42 + img.img_._16_8_ + lVar34 * lVar40);
  }
  lVar44 = *(long *)img_labels.accesses_._72_8_;
  lVar42 = lVar44 * lVar40 + img_labels.accesses_._16_8_;
  piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  lVar24 = *(long *)img_labels.img_._72_8_;
  lVar34 = lVar40 * lVar24 + img_labels.img_._16_8_;
  uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
  if (cVar26 == '\0') {
    piVar1 = (int *)(lVar42 + lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    uVar30 = *(uint *)(lVar34 + lVar21 * 4);
    goto LAB_002bb9a6;
  }
LAB_002baf1f:
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(img_labels.img_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4) = uVar9;
  goto LAB_002b3d3b;
LAB_002b126d:
  lVar34 = *(long *)img_labels.accesses_._72_8_;
  lVar24 = lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_;
LAB_002b6c5f:
  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  lVar24 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(undefined4 *)((uVar16 - 2) * lVar24 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
LAB_002b6c7b:
  piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002b6c86:
  *(undefined4 *)(lVar24 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
  goto LAB_002b5619;
LAB_002b134f:
  uVar9 = TTA::MemNewLabel();
  lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
LAB_002b1375:
  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
       = uVar9;
LAB_002b2171:
  uVar15 = uVar16 | 1;
  uVar13 = (long)(int)local_3e0;
  while( true ) {
    local_3e0 = (long *)(uVar13 + 2);
    iVar11 = (int)uVar13;
    if (lVar36 <= (long)local_3e0) {
      lVar44 = (long)(int)local_3e0;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img.img_._72_8_;
      cVar26 = *(char *)(lVar44 + lVar24 * uVar16 + img.img_._16_8_);
      if (iVar27 < (int)local_3e0) {
        if (cVar26 == '\0') {
          piVar1 = (int *)(uVar15 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
          if (*(char *)(lVar44 + img.img_._16_8_ + lVar24 * uVar15) != '\0') {
            lVar42 = (long)iVar11;
            goto LAB_002beee7;
          }
          piVar1 = (int *)(lVar34 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002c0acf;
        }
        lVar34 = uVar16 - 1;
        lVar42 = (uVar13 << 0x20) + 0x100000000;
        piVar1 = (int *)((lVar42 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((lVar42 >> 0x20) + img.img_._16_8_ + lVar24 * lVar34) != '\0')
        goto LAB_002b76f3;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar44 + lVar34 * *(long *)img.img_._72_8_ + img.img_._16_8_);
        goto joined_r0x002b659b;
      }
      if (cVar26 == '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar24 * uVar15);
        lVar24 = (uVar13 << 0x20) + 0x300000000;
        lVar34 = lVar24 >> 0x20;
        piVar1 = (int *)((lVar24 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar42 = *(long *)img.img_._72_8_;
        cVar8 = *(char *)(lVar34 + lVar42 * uVar16 + img.img_._16_8_);
        if (cVar26 == '\0') goto joined_r0x002b7751;
        if (cVar8 == '\0') goto LAB_002b7f83;
        lVar24 = uVar16 - 1;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar34 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24) != '\0') goto LAB_002b7f3b;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
        goto joined_r0x002b659b;
      }
      lVar34 = uVar16 - 1;
      lVar40 = uVar13 << 0x20;
      piVar1 = (int *)((lVar40 + 0x300000000 >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar42 = *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_;
      if (*(char *)((lVar40 + 0x300000000 >> 0x20) + img.img_._16_8_ + lVar24 * lVar34) == '\0') {
        piVar1 = (int *)(lVar42 + (lVar40 + 0x100000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
        if (*(char *)((lVar40 + 0x100000000 >> 0x20) + lVar24) != '\0') goto LAB_002b76f3;
        piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + lVar44);
        goto joined_r0x002b659b;
      }
      piVar1 = (int *)(lVar42 + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
      if (*(char *)(lVar44 + lVar24) != '\0') goto LAB_002b7f3b;
      piVar1 = (int *)((lVar40 + 0x100000000 >> 0x1e) +
                      lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar42 = uVar16 - 2;
      if (*(char *)(lVar24 + (lVar40 + 0x100000000 >> 0x20)) == '\0') goto LAB_002b7f3b;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar44 + *(long *)img.img_._72_8_ * lVar42 + img.img_._16_8_);
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar25 = lVar24 * lVar42 + img_labels.accesses_._16_8_;
      lVar40 = (long)iVar11;
      piVar1 = (int *)(lVar25 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      lVar42 = lVar42 * lVar34 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar42 + lVar40 * 4);
      if (cVar26 != '\0') {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002b6b3b;
      }
      piVar1 = (int *)(lVar25 + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar42 + lVar44 * 4);
      goto LAB_002b83be;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar24 = *(long *)img.img_._72_8_;
    if (*(char *)((long)local_3e0 + lVar24 * uVar16 + img.img_._16_8_) != '\0') break;
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_;
    if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar24 * uVar15) != '\0') {
      lVar24 = (uVar13 << 0x20) + 0x300000000;
      lVar44 = lVar24 >> 0x20;
      piVar1 = (int *)(lVar34 + (lVar24 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar44 + lVar24 * uVar16 + img.img_._16_8_) == '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
        uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
        goto LAB_002b6307;
      }
      lVar34 = uVar16 - 1;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + img.img_._16_8_ + lVar24 * lVar34) != '\0') goto LAB_002b6928;
      lVar24 = (uVar13 << 0x20) + 0x400000000;
      lVar40 = lVar24 >> 0x20;
      piVar1 = (int *)((lVar24 >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img.img_._72_8_;
      lVar42 = lVar24 * lVar34 + img.img_._16_8_;
      if (*(char *)(lVar40 + lVar42) == '\0') {
        piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar42 + (long)local_3e0);
        goto joined_r0x002b7648;
      }
      lVar42 = uVar16 - 2;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar42 + img.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + img.img_._16_8_ + lVar24 * lVar42) != '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * lVar42 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar42 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
        goto LAB_002bc9a0;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      lVar24 = lVar44 * lVar42 + img_labels.accesses_._16_8_;
      if (*(char *)((long)local_3e0 + lVar34 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0')
      {
        piVar1 = (int *)(lVar24 + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar42 * lVar34 + img_labels.img_._16_8_ + lVar40 * 4);
        lVar24 = (long)iVar11;
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = lVar34 * uVar16 + img_labels.img_._16_8_;
        goto LAB_002b82c9;
      }
      piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = lVar42 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
      piVar1 = (int *)(lVar24 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar34 + lVar40 * 4);
      goto LAB_002b79f8;
    }
    piVar1 = (int *)(lVar34 + 0xc + uVar13 * 4);
    *piVar1 = *piVar1 + 1;
    lVar24 = *(long *)img.img_._72_8_;
    if (*(char *)(uVar13 + 3 + lVar24 * uVar16 + img.img_._16_8_) != '\0') {
      lVar34 = uVar16 - 1;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + 0xc +
                      uVar13 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar24 * lVar34) != '\0') goto LAB_002b6c3e;
      lVar42 = (uVar13 << 0x20) + 0x400000000;
      piVar1 = (int *)((lVar42 >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar42 = lVar42 >> 0x20;
      lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
      cVar26 = *(char *)(lVar42 + lVar24);
      piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      cVar8 = *(char *)(uVar13 + 2 + lVar24);
      if (cVar26 == '\0') goto joined_r0x002b7609;
      if (cVar8 == '\0') goto LAB_002ba1af;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (uVar16 - 2) + img.accesses_._16_8_ + 0xc +
                      uVar13 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(uVar13 + 3 + *(long *)img.img_._72_8_ * (uVar16 - 2) + img.img_._16_8_);
      goto LAB_002b9932;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ + 0xc +
                    uVar13 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar24 * uVar15) == '\0') goto LAB_002b6bfe;
    uVar9 = TTA::MemNewLabel();
    piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
             (long)local_3e0 * 4) = uVar9;
    uVar13 = (ulong)local_3e0;
  }
  lVar34 = uVar16 - 1;
  lVar44 = uVar13 << 0x20;
  lVar42 = lVar44 + 0x300000000 >> 0x20;
  piVar1 = (int *)((lVar44 + 0x300000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar42 + img.img_._16_8_ + lVar24 * lVar34) != '\0') {
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar34 +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
    if (*(char *)((long)local_3e0 + lVar24) == '\0') {
      piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                      lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar34 = uVar16 - 2;
      if (*(char *)(lVar24 + (lVar44 + 0x100000000 >> 0x20)) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(uVar13 + 2 + *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_);
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar40 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
        lVar42 = (long)iVar11;
        piVar1 = (int *)(lVar40 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        lVar34 = lVar34 * lVar44 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar34 + lVar42 * 4);
        if (cVar26 == '\0') {
          piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + (long)local_3e0 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                            lVar42 * 4);
        }
        else {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + lVar42 * 4);
        }
LAB_002bb019:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_
                        + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002bbafc;
      }
    }
    lVar24 = *(long *)img_labels.accesses_._72_8_;
    piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img_labels.img_._72_8_;
    uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
    *piVar1 = *piVar1 + 1;
    uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                         (long)iVar11 * 4));
    lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002b24a5:
    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
             (long)local_3e0 * 4) = uVar9;
LAB_002bbafc:
    lVar24 = uVar16 - 1;
    lVar25 = uVar16 - 2;
    uVar15 = uVar16 | 1;
    uVar13 = (long)(int)local_3e0;
    do {
      local_3e0 = (long *)(uVar13 + 2);
      iVar11 = (int)uVar13;
      if (lVar36 <= (long)local_3e0) {
        lVar44 = (long)(int)local_3e0;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        lVar40 = lVar34 * uVar16 + img.img_._16_8_;
        lVar42 = *(long *)img.accesses_._72_8_;
        if (iVar27 < (int)local_3e0) {
          if (*(char *)(lVar44 + lVar40) == '\0') {
            piVar1 = (int *)(img.accesses_._16_8_ + lVar42 * uVar15 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar15) == '\0') goto LAB_002c0ab4;
            lVar34 = (uVar13 << 0x20) + 0x100000000;
            piVar1 = (int *)((lVar34 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar34 = lVar34 >> 0x20;
            lVar24 = *(long *)img.img_._72_8_;
            if (*(char *)(lVar34 + uVar15 * lVar24 + img.img_._16_8_) != '\0') goto LAB_002bc7d4;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar24 * uVar16);
            goto joined_r0x002bee99;
          }
          lVar34 = (uVar13 << 0x20) + 0x100000000;
          piVar1 = (int *)((lVar34 >> 0x1e) + img.accesses_._16_8_ + lVar42 * uVar16);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar34 >> 0x20;
          if (*(char *)(lVar40 + lVar34) != '\0') goto LAB_002beece;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                          lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar34 + uVar15 * lVar42 + img.img_._16_8_) != '\0') goto LAB_002bcd34;
          piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)img_labels.accesses_._72_8_;
          lVar21 = lVar40 * lVar25 + img_labels.accesses_._16_8_;
          if (*(char *)(lVar44 + img.img_._16_8_ + lVar42 * lVar24) == '\0') goto LAB_002be8c7;
          piVar1 = (int *)(lVar21 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
LAB_002c018a:
          lVar24 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar25 * lVar24 + img_labels.img_._16_8_ + lVar44 * 4);
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar40 * uVar16 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar24 = lVar24 * uVar16 + img_labels.img_._16_8_;
          goto LAB_002be819;
        }
        if (*(char *)(lVar44 + lVar40) == '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + lVar42 * uVar15 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * uVar15);
          lVar34 = (uVar13 << 0x20) + 0x300000000;
          piVar1 = (int *)((lVar34 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar34 = lVar34 >> 0x20;
          lVar42 = *(long *)img.img_._72_8_;
          lVar21 = lVar42 * uVar16 + img.img_._16_8_;
          cVar8 = *(char *)(lVar34 + lVar21);
          lVar40 = *(long *)img.accesses_._72_8_;
          if (cVar26 == '\0') {
            if (cVar8 == '\0') {
              piVar1 = (int *)(img.accesses_._16_8_ + lVar40 * uVar15 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * uVar15) != '\0') goto LAB_002bf6ff;
              goto LAB_002bb5a2;
            }
            piVar1 = (int *)(img.accesses_._16_8_ + lVar40 * lVar24 + lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24) != '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar25 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
              goto LAB_002be807;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
            goto joined_r0x002c011b;
          }
          lVar18 = (long)((uVar13 << 0x20) + 0x100000000) >> 0x20;
          if (cVar8 == '\0') {
            piVar1 = (int *)(img.accesses_._16_8_ + lVar40 * uVar15 + lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar18 + img.img_._16_8_ + lVar42 * uVar15) != '\0') goto LAB_002beece;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                            lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar18 + *(long *)img.img_._72_8_ * uVar16 + img.img_._16_8_);
            goto LAB_002b9dcb;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + lVar40 * uVar16 + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar21 + lVar18) == '\0') {
            piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar15 +
                            lVar18 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img.img_._72_8_;
            cVar26 = *(char *)(lVar18 + uVar15 * lVar42 + img.img_._16_8_);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar34 * 4);
            *piVar1 = *piVar1 + 1;
            cVar8 = *(char *)(lVar34 + lVar42 * lVar24 + img.img_._16_8_);
            if (cVar26 == '\0') {
              if (cVar8 != '\0') goto LAB_002b62bd;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
              goto joined_r0x002c011b;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            cVar26 = *(char *)(lVar44 + lVar24 * lVar34 + img.img_._16_8_);
            if (cVar8 != '\0') goto joined_r0x002bcd2e;
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            lVar42 = (long)iVar11;
            if (cVar26 == '\0') {
              lVar34 = img_labels.accesses_._16_8_ + lVar24 * uVar16;
              goto LAB_002beee7;
            }
LAB_002bcd53:
            piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
            goto LAB_002bcd6e;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                          lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          lVar42 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
          if (*(char *)(lVar34 + lVar42) == '\0') goto LAB_002beece;
          piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + lVar44) != '\0') goto LAB_002b62bd;
LAB_002bc47c:
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)img_labels.accesses_._72_8_;
          lVar24 = lVar40 * lVar25 + img_labels.accesses_._16_8_;
          if (*(char *)(lVar44 + *(long *)img.img_._72_8_ * lVar25 + img.img_._16_8_) == '\0') {
            piVar1 = (int *)(lVar24 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_002bfbf5;
          }
        }
        else {
          lVar34 = uVar13 << 0x20;
          piVar1 = (int *)((lVar34 + 0x100000000 >> 0x1e) + img.accesses_._16_8_ + lVar42 * uVar16);
          *piVar1 = *piVar1 + 1;
          lVar42 = lVar34 + 0x100000000 >> 0x20;
          if (*(char *)(lVar40 + lVar42) != '\0') {
            piVar1 = (int *)((lVar34 + 0x300000000 >> 0x1e) +
                            img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
            if (*(char *)((lVar34 + 0x300000000 >> 0x20) + lVar42) == '\0') goto LAB_002beece;
            piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar42 + lVar44) == '\0') goto LAB_002bc47c;
            goto LAB_002b62bd;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar15 +
                          lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)img.img_._72_8_;
          cVar26 = *(char *)(lVar42 + uVar15 * lVar40 + img.img_._16_8_);
          piVar1 = (int *)((lVar34 + 0x300000000 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          cVar8 = *(char *)((lVar34 + 0x300000000 >> 0x20) + lVar40 * lVar24 + img.img_._16_8_);
          if (cVar26 != '\0') {
            if (cVar8 != '\0') {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                              lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img.img_._72_8_;
              cVar26 = *(char *)(lVar44 + lVar24 * lVar34 + img.img_._16_8_);
joined_r0x002bcd2e:
              if (cVar26 == '\0') goto LAB_002bf65f;
            }
LAB_002bcd34:
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            goto LAB_002bcd53;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          cVar26 = *(char *)(lVar44 + lVar24 * lVar34 + img.img_._16_8_);
          if (cVar8 != '\0') {
            if (cVar26 != '\0') goto LAB_002b62bd;
LAB_002bf65f:
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                            lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * lVar25);
            lVar24 = *(long *)img_labels.accesses_._72_8_;
            lVar34 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar34 + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar42 = *(long *)img_labels.img_._72_8_;
            lVar40 = lVar25 * lVar42 + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar40 + (long)iVar11 * 4);
            if (cVar26 != '\0') goto LAB_002babaa;
            piVar1 = (int *)(lVar34 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar40 + lVar44 * 4);
            goto LAB_002ba170;
          }
          lVar40 = *(long *)img_labels.accesses_._72_8_;
          lVar24 = lVar40 * lVar25 + img_labels.accesses_._16_8_;
          if (cVar26 != '\0') {
            piVar1 = (int *)(lVar24 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_002c018a;
          }
        }
        lVar42 = (long)iVar11;
        piVar1 = (int *)(lVar24 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002be8cc;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      lVar44 = lVar34 * uVar16 + img.img_._16_8_;
      if (*(char *)((long)local_3e0 + lVar44) == '\0') goto LAB_002bc09c;
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar16 + 4 +
                      uVar13 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + 1 + uVar13) == '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ + 4 +
                        uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        cVar26 = *(char *)(uVar13 + 1 + lVar34 * uVar15 + img.img_._16_8_);
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + 0xc +
                        uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        cVar8 = *(char *)(uVar13 + 3 + lVar34 * lVar24 + img.img_._16_8_);
        if (cVar26 == '\0') {
          if (cVar8 == '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                            uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            lVar42 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
            if (*(char *)(uVar13 + 3 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
              piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.accesses_._72_8_;
              lVar42 = lVar44 * lVar25 + img_labels.accesses_._16_8_;
              if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar34 * lVar24) != '\0') {
                piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
                *piVar1 = *piVar1 + 1;
                lVar24 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          (lVar25 * lVar24 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar24 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                     uVar10;
                goto LAB_002b8cf4;
              }
              piVar1 = (int *)(lVar42 + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(lVar25 * lVar24 + img_labels.img_._16_8_ + (long)iVar11 * 4);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar24 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                   uVar10;
              goto LAB_002b8673;
            }
            lVar44 = (uVar13 << 0x20) + 0x400000000;
            piVar1 = (int *)(lVar42 + (lVar44 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar44 = lVar44 >> 0x20;
            cVar26 = *(char *)(lVar44 + img.img_._16_8_ + lVar34 * lVar24);
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            cVar8 = *(char *)(uVar13 + 2 + lVar24 * lVar34 + img.img_._16_8_);
            if (cVar26 == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              lVar34 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
              if (cVar8 == '\0') {
                piVar1 = (int *)(lVar34 + (long)iVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(undefined4 *)
                          (lVar25 * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4
                                );
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                     uVar10;
                goto LAB_002b31c3;
              }
              piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)
                        (lVar25 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar24 = lVar34 * uVar16 + img_labels.img_._16_8_;
              goto LAB_002bfe79;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ + 0xc +
                            uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * lVar25);
            if (cVar8 != '\0') {
              lVar42 = *(long *)img_labels.accesses_._72_8_;
              lVar24 = lVar42 * lVar25 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              lVar40 = *(long *)img_labels.img_._72_8_;
              lVar34 = lVar25 * lVar40 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
              if (cVar26 != '\0') goto LAB_002b2156;
              piVar1 = (int *)(lVar24 + lVar44 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_002bcc5f;
            }
            if (cVar26 == '\0') goto LAB_002bff65;
LAB_002bfece:
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                            (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            goto LAB_002bff00;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          if (*(char *)((long)local_3e0 + lVar34 * lVar24 + img.img_._16_8_) != '\0')
          goto LAB_002bbc03;
        }
        else {
          if (cVar8 == '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                            uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(uVar13 + 3 + lVar34 * uVar16 + img.img_._16_8_) == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              lVar44 = (long)(uVar13 << 0x20) >> 0x1e;
              piVar1 = (int *)(lVar44 + lVar24 * lVar25 + img_labels.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(lVar44 + lVar25 * lVar34 + img_labels.img_._16_8_);
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                   uVar10;
              goto LAB_002bdc67;
            }
            lVar42 = (uVar13 << 0x20) + 0x400000000;
            lVar44 = lVar42 >> 0x20;
            piVar1 = (int *)((lVar42 >> 0x1e) +
                            *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar44 + img.img_._16_8_ + lVar34 * lVar24) == '\0') {
              lVar24 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
              piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) =
                   uVar10;
              goto LAB_002bcf4e;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ + 0xc +
                            uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img.img_._72_8_;
            if (*(char *)(uVar13 + 3 + lVar34 * lVar25 + img.img_._16_8_) != '\0') {
              piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                              (long)local_3e0 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar34 * lVar24) == '\0')
              goto LAB_002bfece;
              goto LAB_002bc6bd;
            }
LAB_002bff65:
            lVar24 = *(long *)img_labels.accesses_._72_8_ * lVar25 + img_labels.accesses_._16_8_;
            piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = lVar25 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
            uVar9 = *(uint *)(lVar34 + (long)iVar11 * 4);
            piVar1 = (int *)(lVar24 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar34 + lVar44 * 4);
            goto LAB_002bc9a0;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          if (*(char *)((long)local_3e0 + lVar34 * lVar24 + img.img_._16_8_) != '\0') {
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar44 * lVar25 + img_labels.accesses_._16_8_ + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar34 * lVar25 + img_labels.img_._16_8_ + uVar13 * 4);
            goto LAB_002bbd3e;
          }
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar34 * lVar25);
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        lVar42 = lVar44 * lVar25 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar42 + uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        lVar40 = lVar34 * lVar25 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar40 + uVar13 * 4);
        if (cVar26 == '\0') {
          piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar40 + (long)local_3e0 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
        }
        else {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      else {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + 0xc +
                        uVar13 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        lVar44 = lVar34 * lVar24 + img.img_._16_8_;
        if (*(char *)(uVar13 + 3 + lVar44) == '\0') {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + 0xc +
                          uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * uVar16) == '\0') {
            lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
            lVar44 = (long)(uVar13 << 0x20) >> 0x1e;
            piVar1 = (int *)(lVar44 + lVar24);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
            uVar10 = *(undefined4 *)(lVar44 + lVar34);
            piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
            goto LAB_002bdc67;
          }
          lVar34 = (uVar13 << 0x20) + 0x400000000;
          lVar42 = lVar34 >> 0x20;
          piVar1 = (int *)((lVar34 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar42 + lVar34 * lVar24 + img.img_._16_8_) == '\0') goto LAB_002bcf13;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ + 0xc +
                          uVar13 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(uVar13 + 3 + img.img_._16_8_ + lVar34 * lVar25) == '\0') goto LAB_002bc94e;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          cVar26 = *(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_);
          goto joined_r0x002b5c1d;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar44 + (long)local_3e0) == '\0') {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                          (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar25 + img_labels.accesses_._16_8_;
          lVar44 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
          if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * lVar25 + img.img_._16_8_) ==
              '\0') {
            piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar34 * lVar25 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
            piVar1 = (int *)(lVar44 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                                 uVar13 * 4));
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                             img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
          }
          else {
            piVar1 = (int *)(lVar34 + uVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar34 * lVar25 + img_labels.img_._16_8_ + uVar13 * 4);
            piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        else {
LAB_002bbc03:
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar25 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar34 * lVar25 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
LAB_002bbd3e:
          piVar1 = (int *)(lVar44 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
      *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar9;
      uVar13 = (ulong)local_3e0;
    } while( true );
  }
  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar16 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
  lVar40 = *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_;
  if (*(char *)(lVar42 + *(long *)img.img_._72_8_ * uVar16 + img.img_._16_8_) != '\0') {
    piVar1 = (int *)(lVar40 + (lVar44 + 0x400000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
    lVar40 = lVar44 + 0x400000000 >> 0x20;
    lVar25 = *(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_;
    if (*(char *)(lVar24 + lVar40) == '\0') {
      piVar1 = (int *)(lVar25 + (lVar44 + 0x100000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img.img_._72_8_ * lVar34 + img.img_._16_8_;
      if (*(char *)((lVar44 + 0x100000000 >> 0x20) + lVar24) == '\0') {
        piVar1 = (int *)(lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar24 + (long)local_3e0);
        goto joined_r0x002b7648;
      }
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar34 = (long)iVar11;
      piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      goto LAB_002b7830;
    }
    piVar1 = (int *)(lVar25 + (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    lVar24 = *(long *)img.img_._72_8_;
    lVar25 = lVar24 * lVar34 + img.img_._16_8_;
    if (*(char *)((long)local_3e0 + lVar25) != '\0') {
      lVar34 = uVar16 - 2;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar42 + img.img_._16_8_ + lVar24 * lVar34);
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar42 = lVar24 * lVar34 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      lVar34 = lVar34 * lVar44 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar34 + (long)local_3e0 * 4);
      if (cVar26 == '\0') {
        piVar1 = (int *)(lVar42 + lVar40 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar34 + lVar40 * 4);
        goto LAB_002b7fa9;
      }
      lVar34 = (long)iVar11;
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      goto LAB_002b6dc6;
    }
    piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                    lVar34 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
    *piVar1 = *piVar1 + 1;
    lVar24 = uVar16 - 2;
    if (*(char *)(lVar25 + (lVar44 + 0x100000000 >> 0x20)) == '\0') {
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * lVar24 + img_labels.accesses_._16_8_ + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar24 * lVar44 + img_labels.img_._16_8_ + lVar40 * 4);
      lVar24 = lVar34 * uVar16 + img_labels.accesses_._16_8_;
      goto LAB_002bc992;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
    if (*(char *)(lVar42 + lVar34) == '\0') {
      lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_;
      lVar44 = (long)iVar11;
      piVar1 = (int *)(lVar34 + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar24 + lVar44 * 4);
      piVar1 = (int *)(lVar34 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar24 + lVar40 * 4));
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                        lVar44 * 4);
      goto LAB_002bb11d;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(lVar34 + 2 + uVar13);
    lVar34 = *(long *)img_labels.accesses_._72_8_;
    lVar40 = lVar34 * lVar24 + img_labels.accesses_._16_8_;
    lVar42 = (long)iVar11;
    piVar1 = (int *)(lVar40 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img_labels.img_._72_8_;
    lVar24 = lVar24 * lVar44 + img_labels.img_._16_8_;
    uVar9 = *(uint *)(lVar24 + lVar42 * 4);
    if (cVar26 == '\0') {
      piVar1 = (int *)(lVar40 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar24 + (long)local_3e0 * 4);
      goto LAB_002b856b;
    }
    piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar44 * uVar16 + lVar42 * 4);
    goto LAB_002bb9a6;
  }
  piVar1 = (int *)(lVar40 + (lVar44 + 0x100000000 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar24 + (lVar44 + 0x100000000 >> 0x20)) != '\0') {
    lVar24 = *(long *)img_labels.accesses_._72_8_;
    lVar44 = (long)iVar11;
    piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img_labels.img_._72_8_;
    uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
    *piVar1 = *piVar1 + 1;
    uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4));
    piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
             (long)local_3e0 * 4) = uVar9;
    goto LAB_002bdc67;
  }
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar34 + img.accesses_._16_8_ +
                  (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)((long)local_3e0 + lVar34 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0')
  goto LAB_002b7e93;
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
  lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
LAB_002b8ca8:
  piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
  *piVar1 = *piVar1 + 1;
  uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4)
                       );
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                  (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
       = uVar9;
  goto LAB_002b8cf4;
LAB_002b76f3:
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  lVar42 = (long)(int)uVar13;
  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar42 * 4);
  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar42 * 4);
  goto LAB_002ba170;
joined_r0x002b7751:
  if (cVar8 == '\0') goto LAB_002b77c1;
  lVar24 = uVar16 - 1;
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar34 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar34 + img.img_._16_8_ + lVar42 * lVar24) != '\0') goto LAB_002bbab0;
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar44 * 4);
  *piVar1 = *piVar1 + 1;
  cVar26 = *(char *)(lVar44 + lVar24 * *(long *)img.img_._72_8_ + img.img_._16_8_);
  goto joined_r0x002bac8d;
LAB_002b77c1:
  local_300 = uVar16 | 1;
  lVar42 = lVar42 * local_300;
  piVar1 = (int *)(local_300 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar34 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002bb5c5:
  cVar26 = *(char *)(lVar34 + img.img_._16_8_ + lVar42);
joined_r0x002c0aae:
  if (cVar26 == '\0') {
LAB_002c0ab4:
    lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002c0abf:
    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
    *piVar1 = *piVar1 + 1;
LAB_002c0acf:
    *(undefined4 *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar44 * 4)
         = 0;
  }
  else {
LAB_002bbaf2:
    uVar9 = TTA::MemNewLabel();
LAB_002ba175:
    lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002ba185:
    piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
    *piVar1 = *piVar1 + 1;
    *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar44 * 4) =
         uVar9;
  }
  goto LAB_002c0aee;
LAB_002b6928:
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar9 = *(uint *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)(int)uVar13 * 4);
  *piVar1 = *piVar1 + 1;
  uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ +
                                       (long)(int)uVar13 * 4));
  lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002b6998:
  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
       = uVar9;
  goto LAB_002b5619;
LAB_002b6c3e:
  lVar34 = *(long *)img_labels.accesses_._72_8_;
  lVar24 = lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_;
  goto LAB_002b6c5f;
joined_r0x002b7609:
  if (cVar8 == '\0') goto LAB_002b3185;
LAB_002b7a42:
  lVar34 = *(long *)img_labels.accesses_._72_8_;
  lVar24 = lVar34 * (uVar16 - 2) + img_labels.accesses_._16_8_;
LAB_002b7a63:
  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  lVar44 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(undefined4 *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
LAB_002b7a7f:
  piVar1 = (int *)(lVar34 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
  goto LAB_002b47b5;
LAB_002b3185:
  uVar9 = TTA::MemNewLabel();
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                  (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4)
       = uVar9;
  goto LAB_002b31c3;
LAB_002b9976:
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * uVar16 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002b9985:
  *(uint *)(img_labels.img_._16_8_ + lVar40 * uVar16 + (long)local_3e0 * 4) = uVar9;
  goto LAB_002b3d3b;
LAB_002b6bfe:
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                  (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002b6c19:
  puVar14 = (undefined4 *)
            (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4
            );
  goto LAB_002b0ed3;
joined_r0x002bee99:
  if (cVar26 == '\0') goto LAB_002bbaf2;
  goto LAB_002beece;
LAB_002bb5a2:
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  goto LAB_002c0abf;
LAB_002babaa:
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar44 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(img_labels.img_._16_8_ + lVar42 * uVar16 + lVar44 * 4) = uVar9;
  goto LAB_002c0aee;
LAB_002bc09c:
  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar15 +
                  (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar34 * uVar15);
  lVar40 = uVar13 << 0x20;
  piVar1 = (int *)((lVar40 + 0x300000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  lVar42 = lVar40 + 0x300000000 >> 0x20;
  lVar34 = *(long *)img.img_._72_8_;
  lVar21 = lVar34 * uVar16 + img.img_._16_8_;
  cVar8 = *(char *)(lVar42 + lVar21);
  lVar44 = *(long *)img.accesses_._72_8_;
  if (cVar26 == '\0') {
    if (cVar8 == '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar15 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * uVar15) != '\0') {
        uVar9 = TTA::MemNewLabel();
        lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002befcd:
        lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
LAB_002befde:
        piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                 (long)local_3e0 * 4) = uVar9;
        goto LAB_002b2171;
      }
      lVar24 = *(long *)img_labels.accesses_._72_8_;
LAB_002c01c4:
      lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
      goto LAB_002c01d5;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * lVar24 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + img.img_._16_8_ + lVar34 * lVar24) != '\0') {
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      goto LAB_002beb73;
    }
    piVar1 = (int *)((lVar40 + 0x400000000 >> 0x1e) +
                    *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
    *piVar1 = *piVar1 + 1;
    lVar34 = lVar40 + 0x400000000 >> 0x20;
    lVar44 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
    cVar8 = *(char *)(lVar34 + lVar44);
    piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                    (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    cVar26 = *(char *)(uVar13 + 2 + lVar44);
    goto joined_r0x002bdaee;
  }
  lVar18 = lVar40 + 0x100000000 >> 0x20;
  if (cVar8 == '\0') {
    piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar15 + lVar18 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar18 + img.img_._16_8_ + lVar34 * uVar15) != '\0') {
      lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
      uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
      goto LAB_002b62fb;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar18 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar18 + *(long *)img.img_._72_8_ * uVar16 + img.img_._16_8_) == '\0') {
      uVar9 = TTA::MemNewLabel();
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
               (long)local_3e0 * 4) = uVar9;
    }
    else {
      lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
      uVar10 = *(undefined4 *)(lVar34 + (long)iVar11 * 4);
      piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
    }
    goto LAB_002b6307;
  }
  piVar1 = (int *)(img.accesses_._16_8_ + lVar44 * uVar16 + lVar18 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar21 + lVar18) == '\0') {
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * uVar15 + lVar18 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_;
    cVar26 = *(char *)(lVar18 + uVar15 * lVar34 + img.img_._16_8_);
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    cVar8 = *(char *)(lVar42 + lVar34 * lVar24 + img.img_._16_8_);
    if (cVar26 != '\0') {
      lVar34 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
      if (cVar8 != '\0') {
        piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_;
        if (*(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_) != '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * lVar25 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
          *piVar1 = *piVar1 + 1;
          lVar24 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar25 * lVar24 + img_labels.img_._16_8_ + (long)iVar11 * 4);
          goto LAB_002b6c7b;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(uVar13 + 2 + img.img_._16_8_ + lVar34 * lVar25);
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar44 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar44 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        lVar42 = lVar25 * lVar34 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar42 + (long)iVar11 * 4);
        if (cVar26 == '\0') {
          piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar42 + (long)local_3e0 * 4));
          piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 +
                           img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
                   (long)local_3e0 * 4) = uVar9;
        }
        else {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4) = uVar9;
        }
        goto LAB_002b5619;
      }
      lVar44 = lVar40 + 0x400000000 >> 0x20;
      piVar1 = (int *)(lVar34 + (lVar40 + 0x400000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      lVar40 = lVar34 * lVar24 + img.img_._16_8_;
      if (*(char *)(lVar44 + lVar40) == '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                        (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.accesses_._72_8_;
        lVar24 = (long)iVar11;
        if (*(char *)(lVar40 + 2 + uVar13) != '\0') {
          piVar1 = (int *)(lVar34 * lVar25 + img_labels.accesses_._16_8_ + lVar24 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar25 * lVar44 + img_labels.img_._16_8_ + lVar24 * 4);
          goto LAB_002b7a7f;
        }
        lVar34 = img_labels.accesses_._16_8_ + lVar34 * uVar16;
        goto LAB_002bb464;
      }
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar25 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar42 + img.img_._16_8_ + lVar34 * lVar25);
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      cVar8 = *(char *)((long)local_3e0 + lVar24 * lVar34 + img.img_._16_8_);
      if (cVar26 == '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        lVar34 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
        if (cVar8 == '\0') {
          piVar1 = (int *)(lVar34 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar25 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
          lVar44 = (long)iVar11;
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002bda46;
        }
        piVar1 = (int *)(lVar34 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = lVar25 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar24 + (long)iVar11 * 4);
        piVar1 = (int *)(lVar34 + lVar44 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar24 + lVar44 * 4);
        goto LAB_002bda4d;
      }
      if (cVar8 != '\0') {
LAB_002bc6bd:
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)iVar11 * 4);
        goto LAB_002bc6f7;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
LAB_002bff00:
      cVar26 = *(char *)(uVar13 + 2 + lVar34 * lVar25 + img.img_._16_8_);
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar44 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar44 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      lVar42 = lVar25 * lVar34 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar42 + (long)iVar11 * 4);
      if (cVar26 == '\0') {
        piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar42 + (long)local_3e0 * 4);
        goto LAB_002c0458;
      }
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = img_labels.img_._16_8_ + lVar34 * uVar16;
LAB_002bff5d:
      *(uint *)(lVar24 + (long)local_3e0 * 4) = uVar9;
      goto LAB_002b3d3b;
    }
    if (cVar8 == '\0') {
      piVar1 = (int *)((lVar40 + 0x400000000 >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar34 = lVar40 + 0x400000000 >> 0x20;
      lVar44 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
      cVar8 = *(char *)(lVar34 + lVar44);
      piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(uVar13 + 2 + lVar44);
joined_r0x002bdaee:
      if (cVar8 == '\0') {
        if (cVar26 == '\0') goto LAB_002bfe82;
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
        goto LAB_002bfe67;
      }
      if (cVar26 == '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + lVar34 * 4);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar25 * lVar44 + img_labels.img_._16_8_ + lVar34 * 4);
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
        goto LAB_002b3d3b;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar42 + *(long *)img.img_._72_8_ * lVar25 + img.img_._16_8_);
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar42 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar42 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_;
      lVar40 = lVar25 * lVar44 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar40 + (long)local_3e0 * 4);
      if (cVar26 != '\0') {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = img_labels.img_._16_8_ + lVar44 * uVar16;
        goto LAB_002bdb87;
      }
      piVar1 = (int *)(lVar42 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar40 + lVar34 * 4);
      goto LAB_002c0458;
    }
  }
  else {
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_;
    lVar44 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_;
    if (*(char *)(lVar42 + lVar34) == '\0') {
      piVar1 = (int *)(lVar44 + (lVar40 + 0x400000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar44 = lVar40 + 0x400000000 >> 0x20;
      if (*(char *)(lVar34 + lVar44) == '\0') goto LAB_002bcf13;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar42 + lVar34 * lVar25 + img.img_._16_8_) == '\0') {
        lVar24 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + lVar44 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar25 * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
        lVar44 = (long)iVar11;
        piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002bfd61;
      }
      piVar1 = (int *)(lVar24 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((long)local_3e0 + img.img_._16_8_ + lVar34 * lVar24) != '\0') goto LAB_002bc369;
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img_labels.accesses_._72_8_;
      lVar44 = lVar24 * lVar25 + img_labels.accesses_._16_8_;
      if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * lVar25 + img.img_._16_8_) != '\0')
      goto LAB_002bcedb;
      piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
      goto LAB_002bfd68;
    }
    piVar1 = (int *)(lVar44 + (long)local_3e0 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar34 + (long)local_3e0) == '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar25 + img.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      lVar24 = lVar34 * lVar25 + img_labels.accesses_._16_8_;
      if (*(char *)((long)local_3e0 + *(long *)img.img_._72_8_ * lVar25 + img.img_._16_8_) != '\0')
      {
        piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
        *piVar1 = *piVar1 + 1;
        lVar24 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar25 * lVar24 + img_labels.img_._16_8_ + (long)iVar11 * 4);
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)local_3e0 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002b6c86;
      }
      piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      lVar24 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(lVar25 * lVar24 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * uVar16 + (long)iVar11 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar24 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
LAB_002bfc4e:
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      (long)local_3e0 * 4);
      *piVar1 = *piVar1 + 1;
      *(uint *)(*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ +
               (long)local_3e0 * 4) = uVar9;
      goto LAB_002b5619;
    }
  }
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar24 * lVar25 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(undefined4 *)(lVar25 * lVar34 + img_labels.img_._16_8_ + (long)local_3e0 * 4);
LAB_002beb73:
  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
  goto LAB_002b5619;
LAB_002bcedb:
  lVar42 = (long)(int)uVar13;
  piVar1 = (int *)(lVar44 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002bcee0:
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar42 * 4);
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar24 * uVar16 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002bcf03:
  *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + (long)local_3e0 * 4) = uVar10;
  goto LAB_002b3d3b;
LAB_002bcf13:
  lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
  piVar1 = (int *)(lVar24 + (long)(int)uVar13 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
  uVar10 = *(undefined4 *)(lVar34 + (long)(int)uVar13 * 4);
  piVar1 = (int *)(lVar24 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar34 + (long)local_3e0 * 4) = uVar10;
  goto LAB_002bcf4e;
LAB_002bc94e:
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  lVar44 = *(long *)img_labels.img_._72_8_;
  uVar9 = *(uint *)((uVar16 - 2) * lVar44 + img_labels.img_._16_8_ + lVar42 * 4);
  lVar24 = lVar24 * uVar16 + img_labels.accesses_._16_8_;
  iVar11 = (int)uVar13;
LAB_002bc992:
  piVar1 = (int *)(lVar24 + (long)iVar11 * 4);
  *piVar1 = *piVar1 + 1;
  uVar30 = *(uint *)(lVar44 * uVar16 + img_labels.img_._16_8_ + (long)iVar11 * 4);
LAB_002bc9a0:
  uVar9 = TTA::MemMerge(uVar9,uVar30);
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  goto LAB_002bc9b8;
LAB_002beece:
  lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
  lVar42 = (long)(int)uVar13;
LAB_002beee7:
  piVar1 = (int *)(lVar34 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  lVar24 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
  uVar10 = *(undefined4 *)(lVar24 + lVar42 * 4);
  piVar1 = (int *)(lVar34 + lVar44 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar24 + lVar44 * 4) = uVar10;
  goto LAB_002c0aee;
LAB_002bd0df:
  lVar34 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
  piVar1 = (int *)(lVar34 + uVar13 * 4);
  *piVar1 = *piVar1 + 1;
  lVar24 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
  uVar10 = *(undefined4 *)(lVar24 + uVar13 * 4);
  piVar1 = (int *)(lVar34 + (long)local_3e0 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar24 + (long)local_3e0 * 4) = uVar10;
  uVar13 = (ulong)local_3e0;
  goto LAB_002bcfa3;
LAB_002bd13c:
  lVar34 = (long)(int)local_3e0;
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar16 + img.accesses_._16_8_ + lVar34 * 4);
  *piVar1 = *piVar1 + 1;
  lVar24 = *(long *)img.img_._72_8_;
  if (*(char *)(lVar34 + lVar24 * uVar16 + img.img_._16_8_) == '\0') {
    piVar1 = (int *)((uVar16 | 1) * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                    lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar34 + img.img_._16_8_ + lVar24 * (uVar16 | 1)) == '\0') {
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_ +
                      lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)
       (*(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_ + lVar34 * 4) = 0;
    }
    else {
      lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar24 + -8 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
      uVar10 = *(undefined4 *)(lVar44 + -8 + lVar34 * 4);
      piVar1 = (int *)(lVar24 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar44 + lVar34 * 4) = uVar10;
    }
  }
  else {
    lVar24 = *(long *)img_labels.accesses_._72_8_ * uVar16 + img_labels.accesses_._16_8_;
    piVar1 = (int *)(lVar24 + -8 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    lVar44 = *(long *)img_labels.img_._72_8_ * uVar16 + img_labels.img_._16_8_;
    uVar10 = *(undefined4 *)(lVar44 + -8 + lVar34 * 4);
    piVar1 = (int *)(lVar24 + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar44 + lVar34 * 4) = uVar10;
  }
LAB_002c0aee:
  uVar16 = uVar16 + 2;
  lVar43 = lVar43 + 2;
  lVar28 = lVar28 + 2;
  local_148 = local_148 + 2;
  goto LAB_002b0738;
LAB_002bbab0:
  lVar24 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(lVar24 * (uVar16 - 2) + img_labels.accesses_._16_8_ + lVar44 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = *(long *)img_labels.img_._72_8_;
  uVar10 = *(undefined4 *)((uVar16 - 2) * lVar34 + img_labels.img_._16_8_ + lVar44 * 4);
LAB_002bcd6e:
  piVar1 = (int *)(lVar24 * uVar16 + img_labels.accesses_._16_8_ + lVar44 * 4);
  *piVar1 = *piVar1 + 1;
LAB_002bcd79:
  *(undefined4 *)(lVar34 * uVar16 + img_labels.img_._16_8_ + lVar44 * 4) = uVar10;
  goto LAB_002c0aee;
LAB_002c31d8:
  piVar1 = (int *)(local_148 * lVar28 + local_140 + lVar25 * 4 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  uVar16 = lVar42 + lVar25 + 2;
  uVar13 = local_308;
  uVar15 = (ulong)(iVar23 + iVar12 + 2);
  lVar40 = local_140;
LAB_002c4188:
  uVar10 = *(undefined4 *)(local_150 * lVar28 + uVar13 + uVar16 * 4);
  lVar44 = local_148 * lVar24 + lVar40;
  piVar1 = (int *)(lVar44 + uVar16 * 4);
  *piVar1 = *piVar1 + 1;
  lVar34 = local_150 * lVar24 + local_308;
  *(undefined4 *)(lVar34 + uVar16 * 4) = uVar10;
  lVar42 = (long)(int)uVar15;
  uVar16 = lVar42 + 2;
  iVar12 = (int)uVar16;
  if (iVar12 < iVar27) {
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + 8 + lVar42 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    lVar25 = *(long *)img.img_._72_8_;
    lVar21 = lVar25 * lVar24 + img.img_._16_8_;
    local_158 = local_128;
    if (*(char *)(lVar42 + 2 + lVar21) == '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + 0xc +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar21 + 3 + lVar42) == '\0') {
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_
                         + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_2e8 = *(long *)img_labels.img_._72_8_;
        goto LAB_002c1b57;
      }
      lVar34 = *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_;
      piVar1 = (int *)(lVar34 + 0xc + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar44 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
      if (*(char *)(lVar42 + 3 + lVar44) != '\0') {
        piVar1 = (int *)(local_148 * lVar28 + lVar40 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002c43cb;
      }
      piVar1 = (int *)(lVar34 + 0x10 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + 4 + lVar42) == '\0') {
        uVar9 = TTA::MemNewLabel();
        local_2f8 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_2e8 = *(long *)img_labels.img_._72_8_;
        goto LAB_002c48be;
      }
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + 0x10 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_158 = *(long *)img_labels.img_._72_8_;
      uVar9 = *(uint *)(local_158 * lVar28 + img_labels.img_._16_8_ + 0x10 + lVar42 * 4);
      piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
    }
    else {
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 + 0xc +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar25 * lVar43) != '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar28 + 8 +
                        lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar25 = *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_;
        if (*(char *)(lVar42 + 2 + lVar25) == '\0') {
          piVar1 = (int *)(lVar40 + local_148 * lVar28 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = *(uint *)(local_308 + local_150 * lVar28 + 8 + lVar42 * 4);
          piVar1 = (int *)(lVar44 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar34 + lVar42 * 4);
        }
        else {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + 4 +
                          lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          cVar26 = *(char *)(lVar25 + 1 + lVar42);
          lVar25 = lVar40 + local_148 * lVar28;
          piVar1 = (int *)(lVar25 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = local_150 * lVar28 + local_308;
          uVar9 = *(uint *)(lVar34 + lVar42 * 4);
          if (cVar26 != '\0') {
            piVar1 = (int *)(lVar44 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar15 = uVar16 & 0xffffffff;
            local_120 = local_120;
            uVar22 = local_308;
            lVar34 = local_128;
            uVar13 = local_308;
            goto LAB_002c6cd0;
          }
          piVar1 = (int *)(lVar25 + 8 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(lVar34 + 8 + lVar42 * 4);
        }
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        local_2f8 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        local_2e8 = *(long *)img_labels.img_._72_8_;
        goto LAB_002c1526;
      }
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + 0xc +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_;
      if (*(char *)(lVar42 + 3 + lVar34 * lVar24 + img.img_._16_8_) == '\0') {
        lVar40 = lVar40 + local_148 * lVar24;
        piVar1 = (int *)(lVar40 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = local_308 + local_128 * lVar24;
        uVar10 = *(undefined4 *)(lVar34 + lVar42 * 4);
        piVar1 = (int *)(lVar40 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar34 + 8 + lVar42 * 4) = uVar10;
        goto LAB_002c1370;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + 0x10 +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + 4 + img.img_._16_8_ + lVar34 * lVar43) == '\0') {
        lVar40 = lVar40 + local_148 * lVar24;
        piVar1 = (int *)(lVar40 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = local_308 + local_128 * lVar24;
        uVar10 = *(undefined4 *)(lVar34 + lVar42 * 4);
        piVar1 = (int *)(lVar40 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(lVar34 + 8 + lVar42 * 4) = uVar10;
LAB_002c5e54:
        local_3e0 = (long *)img_labels.accesses_._72_8_;
        local_3f8 = (long *)img_labels.img_._72_8_;
        iVar23 = (int)uVar16;
        lVar42 = (long)iVar23;
        local_140 = lVar42 << 0x20;
        lVar44 = img.accesses_._16_8_ + lVar42 * 4;
        lVar18 = img.img_._16_8_ + lVar42;
        lVar40 = img_labels.img_._16_8_ + lVar42 * 4;
        lVar25 = img_labels.accesses_._16_8_ + lVar42 * 4;
        lVar21 = 0;
LAB_002c5ef5:
        uVar16 = lVar42 + lVar21 + 2;
        lVar32 = local_140 >> 0x1e;
        lVar19 = local_140 >> 0x20;
        if ((long)uVar16 < lVar36) {
          lVar4 = *(long *)img.accesses_._72_8_;
          lVar39 = lVar4 * lVar24 + lVar44;
          piVar1 = (int *)(lVar39 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar37 = *(long *)img.img_._72_8_;
          lVar31 = lVar18 + lVar37 * lVar24;
          local_138 = img_labels.img_._16_8_;
          uVar13 = img_labels.img_._16_8_;
          local_120 = img_labels.accesses_._16_8_;
          lVar34 = img_labels.accesses_._16_8_;
          if (*(char *)(lVar21 + 2 + lVar31) == '\0') {
            local_308 = (ulong)(iVar23 + 2) + lVar21;
            iVar23 = (int)local_308;
            piVar1 = (int *)(lVar4 * lVar24 + img.accesses_._16_8_ +
                            (local_140 + 0x300000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar44 = local_140 + 0x300000000 >> 0x20;
            uVar16 = lVar42 + 2 + lVar21;
            if (*(char *)(lVar37 * lVar24 + img.img_._16_8_ + lVar44) == '\0') {
              piVar1 = (int *)(lVar25 + *(long *)img_labels.accesses_._72_8_ * lVar24 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_2e8 = *(long *)img_labels.img_._72_8_;
              goto LAB_002c1b5a;
            }
            lVar19 = img.accesses_._16_8_ + lVar4 * lVar43;
            piVar1 = (int *)(lVar19 + lVar44 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = img.img_._16_8_ + lVar37 * lVar43;
            if (*(char *)(lVar44 + lVar18) != '\0') {
              local_2f8 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar25 + local_2f8 * lVar28 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_158 = *(long *)img_labels.img_._72_8_;
              goto LAB_002c4b9e;
            }
            piVar1 = (int *)(lVar19 + (local_140 + 0x400000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            lVar19 = local_140 + 0x400000000 >> 0x20;
            if (*(char *)(lVar18 + lVar19) == '\0') goto LAB_002c6914;
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            local_158 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(local_158 * lVar28 + img_labels.img_._16_8_ + lVar19 * 4);
            piVar1 = (int *)(lVar25 + lVar44 * lVar24 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar40 + local_158 * lVar24 + 8 + lVar21 * 4) = uVar10;
            local_1d8 = img_labels.img_._16_8_;
            local_1e0 = img_labels.accesses_._16_8_;
            local_2c0 = img_labels.img_._16_8_;
            local_2c8 = img_labels.accesses_._16_8_;
            local_2d8 = img_labels.img_._16_8_;
            local_2f0 = img_labels.accesses_._16_8_;
            local_188 = img_labels.img_._16_8_;
            local_168 = img_labels.accesses_._16_8_;
            local_180 = img_labels.accesses_._16_8_;
            local_170 = img_labels.img_._16_8_;
            local_178 = img_labels.accesses_._16_8_;
            local_1b0 = img_labels.img_._16_8_;
            local_1b8 = img_labels.accesses_._16_8_;
            local_198 = img_labels.img_._16_8_;
            local_1a8 = img_labels.accesses_._16_8_;
            local_1f0 = img_labels.img_._16_8_;
            local_2d0 = img_labels.accesses_._16_8_;
            local_1c8 = img_labels.img_._16_8_;
            local_1d0 = img_labels.accesses_._16_8_;
            uVar16 = local_308 & 0xffffffff;
            local_2f8 = lVar44;
            local_2e8 = local_158;
            local_1e8 = local_158;
            local_1c0 = local_158;
            local_1a0 = lVar44;
            local_190 = local_158;
            goto LAB_002c2a4a;
          }
          lVar41 = img.accesses_._16_8_ + lVar4 * lVar43;
          lVar29 = lVar4 * lVar43 + lVar44;
          piVar1 = (int *)(lVar29 + 0xc + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = img.img_._16_8_ + lVar37 * lVar43;
          lVar33 = lVar37 * lVar43 + lVar18;
          local_168 = img_labels.accesses_._16_8_;
          if (*(char *)(lVar21 + 3 + lVar33) == '\0') {
            piVar1 = (int *)(lVar39 + 0xc + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + 3 + lVar31) == '\0') {
              lVar34 = img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24;
              piVar1 = (int *)(lVar32 + lVar34);
              *piVar1 = *piVar1 + 1;
              lVar44 = img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar24;
              uVar10 = *(undefined4 *)(lVar32 + lVar44);
              piVar1 = (int *)(lVar34 + lVar42 * 4 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              uVar16 = (ulong)(iVar23 + (int)lVar21 + 2);
              *(undefined4 *)(lVar44 + lVar42 * 4 + 8 + lVar21 * 4) = uVar10;
              goto LAB_002c1370;
            }
            piVar1 = (int *)(lVar29 + 0x10 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + 4 + lVar33) == '\0') goto code_r0x002c5f90;
            uVar16 = (ulong)(iVar23 + 2) + lVar21;
            lVar31 = img.accesses_._16_8_ + lVar4 * lVar28;
            piVar1 = (int *)(lVar31 + lVar42 * 4 + 0xc + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar39 = img.img_._16_8_ + lVar37 * lVar28;
            if (*(char *)(lVar21 + 3 + lVar39 + lVar42) == '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar25 + lVar34 * lVar28 + 0x10 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar40 + lVar44 * lVar28 + 0x10 + lVar21 * 4);
              piVar1 = (int *)(lVar32 + img_labels.accesses_._16_8_ + lVar34 * lVar24);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar32 + img_labels.img_._16_8_ +
                                                             lVar44 * lVar24));
              lVar44 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_158 = *(long *)img_labels.img_._72_8_;
              lVar34 = local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4;
            }
            else {
              piVar1 = (int *)(lVar44 + lVar4 * lVar28 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + 2 + lVar18 + lVar37 * lVar28) == '\0') {
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar25 + lVar34 * lVar28 + 8 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar40 + lVar44 * lVar28 + 8 + lVar21 * 4);
                piVar1 = (int *)(lVar32 + img_labels.accesses_._16_8_ + lVar34 * lVar24);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(lVar32 + img_labels.img_._16_8_ + lVar44 * lVar24);
              }
              else {
                piVar1 = (int *)(lVar41 + lVar32);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar20 + lVar19) != '\0') {
                  piVar1 = (int *)(lVar31 + (local_140 + 0x100000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar39 + (local_140 + 0x100000000 >> 0x20));
                  lVar44 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar44 * lVar28 + lVar19 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_158 = *(long *)img_labels.img_._72_8_;
                  uVar9 = *(uint *)(img_labels.img_._16_8_ + local_158 * lVar28 + lVar19 * 4);
                  if (cVar26 == '\0') {
                    piVar1 = (int *)(lVar25 + lVar44 * lVar28 + 8 + lVar21 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar40 + local_158 * lVar28 + 8 +
                                                         lVar21 * 4));
                    lVar44 = *(long *)img_labels.accesses_._72_8_;
                    piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8
                                    + lVar21 * 4);
                    *piVar1 = *piVar1 + 1;
                    local_158 = *(long *)img_labels.img_._72_8_;
                    *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4 + 8 +
                             lVar21 * 4) = uVar9;
                    local_120 = img_labels.accesses_._16_8_;
                    lVar34 = img_labels.accesses_._16_8_;
                    uVar13 = img_labels.img_._16_8_;
                    local_138 = img_labels.img_._16_8_;
                    local_3f8 = (long *)img_labels.img_._72_8_;
                    local_3e0 = (long *)img_labels.accesses_._72_8_;
                    local_2f8 = lVar44;
                    local_2f0 = img_labels.accesses_._16_8_;
                    local_2e8 = local_158;
                    local_2d8 = img_labels.img_._16_8_;
                    local_2d0 = img_labels.accesses_._16_8_;
                    local_2c8 = img_labels.accesses_._16_8_;
                    local_2c0 = img_labels.img_._16_8_;
                    local_1f0 = img_labels.img_._16_8_;
                    local_1e8 = local_158;
                    local_1e0 = img_labels.accesses_._16_8_;
                    local_1d8 = img_labels.img_._16_8_;
                    local_1d0 = img_labels.accesses_._16_8_;
                    local_1c8 = img_labels.img_._16_8_;
                    local_1c0 = local_158;
                    local_1b8 = img_labels.accesses_._16_8_;
                    local_1b0 = img_labels.img_._16_8_;
                    local_1a8 = img_labels.accesses_._16_8_;
                    local_1a0 = lVar44;
                    local_198 = img_labels.img_._16_8_;
                    local_190 = local_158;
                    local_188 = img_labels.img_._16_8_;
                    local_180 = img_labels.accesses_._16_8_;
                    local_178 = img_labels.accesses_._16_8_;
                    local_170 = img_labels.img_._16_8_;
                    local_168 = img_labels.accesses_._16_8_;
                  }
                  else {
                    piVar1 = (int *)(lVar25 + lVar44 * lVar24 + 8 + lVar21 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(lVar40 + local_158 * lVar24 + 8 + lVar21 * 4) = uVar9;
                    local_2f8 = lVar44;
                    local_2f0 = img_labels.accesses_._16_8_;
                    local_2e8 = local_158;
                    local_2d8 = img_labels.img_._16_8_;
                    local_2d0 = img_labels.accesses_._16_8_;
                    local_2c8 = img_labels.accesses_._16_8_;
                    local_2c0 = img_labels.img_._16_8_;
                    local_1f0 = img_labels.img_._16_8_;
                    local_1e8 = local_158;
                    local_1e0 = img_labels.accesses_._16_8_;
                    local_1d8 = img_labels.img_._16_8_;
                    local_1d0 = img_labels.accesses_._16_8_;
                    local_1c8 = img_labels.img_._16_8_;
                    local_1c0 = local_158;
                    local_1b8 = img_labels.accesses_._16_8_;
                    local_1b0 = img_labels.img_._16_8_;
                    local_1a8 = img_labels.accesses_._16_8_;
                    local_1a0 = lVar44;
                    local_198 = img_labels.img_._16_8_;
                    local_190 = local_158;
                    local_188 = img_labels.img_._16_8_;
                    local_180 = img_labels.accesses_._16_8_;
                    local_178 = img_labels.accesses_._16_8_;
                    local_170 = img_labels.img_._16_8_;
                  }
                  goto LAB_002c2a4a;
                }
                lVar34 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar25 + lVar34 * lVar28 + 8 + lVar21 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = *(long *)img_labels.img_._72_8_;
                uVar9 = *(uint *)(lVar40 + lVar44 * lVar28 + 8 + lVar21 * 4);
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * lVar24 + lVar19 * 4);
                *piVar1 = *piVar1 + 1;
                uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar44 * lVar24 + lVar19 * 4);
              }
              uVar9 = TTA::MemMerge(uVar9,uVar30);
              lVar44 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_158 = *(long *)img_labels.img_._72_8_;
              lVar34 = local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4;
            }
            *(uint *)(lVar34 + 8 + lVar21 * 4) = uVar9;
            local_120 = img_labels.accesses_._16_8_;
            lVar34 = img_labels.accesses_._16_8_;
            uVar13 = img_labels.img_._16_8_;
            local_138 = img_labels.img_._16_8_;
            local_3f8 = (long *)img_labels.img_._72_8_;
            local_3e0 = (long *)img_labels.accesses_._72_8_;
            local_2f8 = lVar44;
            local_2f0 = img_labels.accesses_._16_8_;
            local_2e8 = local_158;
            local_2d8 = img_labels.img_._16_8_;
            local_2d0 = img_labels.accesses_._16_8_;
            local_2c8 = img_labels.accesses_._16_8_;
            local_2c0 = img_labels.img_._16_8_;
            local_1f0 = img_labels.img_._16_8_;
            local_1e8 = local_158;
            local_1e0 = img_labels.accesses_._16_8_;
            local_1d8 = img_labels.img_._16_8_;
            local_1d0 = img_labels.accesses_._16_8_;
            local_1c8 = img_labels.img_._16_8_;
            local_1c0 = local_158;
            local_1b8 = img_labels.accesses_._16_8_;
            local_1b0 = img_labels.img_._16_8_;
            local_1a8 = img_labels.accesses_._16_8_;
            local_1a0 = lVar44;
            local_198 = img_labels.img_._16_8_;
            local_190 = local_158;
            local_188 = img_labels.img_._16_8_;
            local_180 = img_labels.accesses_._16_8_;
            local_178 = img_labels.accesses_._16_8_;
            local_170 = img_labels.img_._16_8_;
            local_168 = img_labels.accesses_._16_8_;
            goto LAB_002c2a4a;
          }
          uVar15 = (ulong)(iVar23 + 2) + lVar21;
          lVar44 = img.accesses_._16_8_ + lVar4 * lVar28;
          piVar1 = (int *)(lVar44 + lVar42 * 4 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = img.img_._16_8_ + lVar37 * lVar28;
          if (*(char *)(lVar21 + lVar42 + 2 + lVar34) == '\0') {
            lVar34 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar25 + lVar34 * lVar28 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar40 + lVar44 * lVar28 + 8 + lVar21 * 4);
            piVar1 = (int *)(lVar32 + img_labels.accesses_._16_8_ + lVar34 * lVar24);
            *piVar1 = *piVar1 + 1;
            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar32 + img_labels.img_._16_8_ + lVar44 * lVar24)
                                 );
            local_1a0 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(local_1a0 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                            lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            local_190 = *(long *)img_labels.img_._72_8_;
            local_138 = img_labels.img_._16_8_;
            local_168 = img_labels.accesses_._16_8_;
          }
          else {
            piVar1 = (int *)(lVar41 + lVar32);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar20 + lVar19) == '\0') {
              lVar34 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar25 + lVar34 * lVar28 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar40 + lVar44 * lVar28 + 8 + lVar21 * 4);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * lVar24 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(img_labels.img_._16_8_ + lVar44 * lVar24 +
                                                   lVar19 * 4));
              local_3e0 = (long *)img_labels.accesses_._72_8_;
              local_148 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(local_148 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_3f8 = (long *)img_labels.img_._72_8_;
              local_150 = *(long *)img_labels.img_._72_8_;
              uVar15 = uVar15 & 0xffffffff;
              local_138 = img_labels.img_._16_8_;
              local_1d8 = img_labels.img_._16_8_;
              local_1e0 = img_labels.accesses_._16_8_;
              local_2c0 = img_labels.img_._16_8_;
              local_2c8 = img_labels.accesses_._16_8_;
              local_2d8 = img_labels.img_._16_8_;
              local_2f0 = img_labels.accesses_._16_8_;
              local_188 = img_labels.img_._16_8_;
              local_168 = img_labels.accesses_._16_8_;
              local_180 = img_labels.accesses_._16_8_;
              local_170 = img_labels.img_._16_8_;
              local_178 = img_labels.accesses_._16_8_;
              local_1b0 = img_labels.img_._16_8_;
              local_1b8 = img_labels.accesses_._16_8_;
              local_198 = img_labels.img_._16_8_;
              local_1a8 = img_labels.accesses_._16_8_;
              local_1f0 = img_labels.img_._16_8_;
              local_2d0 = img_labels.accesses_._16_8_;
              local_1c8 = img_labels.img_._16_8_;
              local_1d0 = img_labels.accesses_._16_8_;
              local_120 = img_labels.accesses_._16_8_;
              uVar22 = img_labels.img_._16_8_;
              lVar40 = img_labels.accesses_._16_8_;
              lVar34 = local_150;
              uVar13 = img_labels.img_._16_8_;
              local_2f8 = local_148;
              local_2e8 = local_150;
              local_1e8 = local_150;
              local_1c0 = local_150;
              local_1a0 = local_148;
              local_190 = local_150;
              goto LAB_002c6cd0;
            }
            piVar1 = (int *)(lVar44 + (local_140 + 0x100000000 >> 0x1e));
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar34 + (local_140 + 0x100000000 >> 0x20));
            local_1a0 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(img_labels.accesses_._16_8_ + local_1a0 * lVar28 + lVar19 * 4);
            *piVar1 = *piVar1 + 1;
            local_190 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(img_labels.img_._16_8_ + local_190 * lVar28 + lVar19 * 4);
            if (cVar26 == '\0') {
              piVar1 = (int *)(lVar25 + local_1a0 * lVar28 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar40 + local_190 * lVar28 + 8 + lVar21 * 4));
              local_1a0 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(local_1a0 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_190 = *(long *)img_labels.img_._72_8_;
              local_168 = img_labels.accesses_._16_8_;
              local_138 = img_labels.img_._16_8_;
            }
            else {
              piVar1 = (int *)(lVar25 + local_1a0 * lVar24 + 8 + lVar21 * 4);
              *piVar1 = *piVar1 + 1;
            }
          }
          uVar15 = uVar15 & 0xffffffff;
          local_148 = local_1a0;
          local_150 = local_190;
          local_120 = local_168;
          uVar22 = local_138;
          lVar40 = local_168;
          lVar34 = local_190;
          uVar13 = local_138;
          local_3f8 = (long *)img_labels.img_._72_8_;
          local_3e0 = (long *)img_labels.accesses_._72_8_;
          img_labels.img_._16_8_ = local_138;
          img_labels.accesses_._16_8_ = local_168;
          local_2f8 = local_1a0;
          local_2f0 = local_168;
          local_2e8 = local_190;
          local_2d8 = local_138;
          local_2d0 = local_168;
          local_2c8 = local_168;
          local_2c0 = local_138;
          local_1f0 = local_138;
          local_1e8 = local_190;
          local_1e0 = local_168;
          local_1d8 = local_138;
          local_1d0 = local_168;
          local_1c8 = local_138;
          local_1c0 = local_190;
          local_1b8 = local_168;
          local_1b0 = local_138;
          local_1a8 = local_168;
          local_198 = local_138;
          local_188 = local_138;
          local_180 = local_168;
          local_178 = local_168;
          local_170 = local_138;
LAB_002c6cd0:
          *(uint *)(local_150 * lVar24 + uVar13 + uVar16 * 4) = uVar9;
          lVar42 = local_148;
          uVar15 = (long)(int)uVar15;
          local_308 = uVar22;
          local_140 = lVar40;
          local_128 = lVar34;
          do {
            uVar13 = local_1d8;
            uVar16 = uVar15 + 2;
            iVar12 = (int)uVar15;
            iVar23 = (int)uVar16;
            if (lVar36 <= (long)uVar16) {
              lVar36 = *(long *)img.accesses_._72_8_;
              lVar21 = lVar36 * lVar24 + img.accesses_._16_8_;
              lVar25 = (long)iVar23;
              piVar1 = (int *)(lVar21 + lVar25 * 4);
              *piVar1 = *piVar1 + 1;
              lVar44 = *(long *)img.img_._72_8_;
              lVar18 = lVar44 * lVar24 + img.img_._16_8_;
              if (iVar27 < iVar23) {
                if (*(char *)(lVar25 + lVar18) == '\0') {
LAB_002c8eb8:
                  piVar1 = (int *)(lVar40 + lVar42 * lVar24 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(uVar22 + lVar34 * lVar24 + lVar25 * 4) = 0;
                  goto LAB_002c9b2c;
                }
                lVar19 = (uVar15 << 0x20) + 0x100000000;
                piVar1 = (int *)(lVar21 + (lVar19 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar18 + (lVar19 >> 0x20)) != '\0') {
                  lVar40 = lVar40 + lVar42 * lVar24;
                  piVar1 = (int *)(lVar40 + (long)iVar12 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar36 = uVar22 + lVar34 * lVar24;
                  uVar9 = *(uint *)(lVar36 + (long)iVar12 * 4);
                  piVar1 = (int *)(lVar40 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  goto LAB_002b04a2;
                }
                piVar1 = (int *)(img.accesses_._16_8_ + lVar36 * lVar43 + lVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar36 = lVar42 * lVar28 + lVar40;
                if (*(char *)(lVar25 + img.img_._16_8_ + lVar44 * lVar43) == '\0') {
                  piVar1 = (int *)(lVar36 + (long)iVar12 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(lVar28 * lVar34 + uVar22 + (long)iVar12 * 4);
                }
                else {
                  piVar1 = (int *)(lVar36 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
LAB_002c9850:
                  uVar9 = *(uint *)(lVar28 * lVar34 + uVar22 + lVar25 * 4);
                }
LAB_002c9863:
                piVar1 = (int *)(lVar40 + lVar42 * lVar24 + lVar25 * 4);
                *piVar1 = *piVar1 + 1;
                lVar36 = lVar34 * lVar24 + uVar22;
              }
              else {
                lVar19 = uVar15 << 0x20;
                if (*(char *)(lVar25 + lVar18) == '\0') {
                  piVar1 = (int *)(lVar21 + (lVar19 + 0x300000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  lVar21 = lVar19 + 0x300000000 >> 0x20;
                  if (*(char *)(lVar18 + lVar21) == '\0') goto LAB_002c8eb8;
                  lVar18 = img.accesses_._16_8_ + lVar36 * lVar43;
                  piVar1 = (int *)(lVar18 + lVar21 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar36 = img.img_._16_8_ + lVar44 * lVar43;
                  if (*(char *)(lVar21 + lVar36) != '\0') goto LAB_002c9162;
                  piVar1 = (int *)(lVar18 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar36 + lVar25) == '\0') {
                    uVar9 = TTA::MemNewLabel();
                    goto LAB_002ca0a3;
                  }
                  piVar1 = (int *)(lVar42 * lVar28 + lVar40 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(lVar28 * lVar34 + uVar22 + lVar25 * 4);
                  piVar1 = (int *)(lVar42 * lVar24 + lVar40 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar36 = lVar34 * lVar24 + uVar22;
                }
                else {
                  piVar1 = (int *)(lVar21 + (lVar19 + 0x100000000 >> 0x1e));
                  *piVar1 = *piVar1 + 1;
                  cVar26 = *(char *)(lVar18 + (lVar19 + 0x100000000 >> 0x20));
                  lVar21 = lVar36 * lVar43 + img.accesses_._16_8_;
                  piVar1 = (int *)((lVar19 + 0x300000000 >> 0x1e) + lVar21);
                  *piVar1 = *piVar1 + 1;
                  lVar43 = lVar43 * lVar44 + img.img_._16_8_;
                  cVar8 = *(char *)((lVar19 + 0x300000000 >> 0x20) + lVar43);
                  if (cVar26 != '\0') {
                    if (cVar8 == '\0') {
                      lVar40 = lVar40 + lVar42 * lVar24;
                      piVar1 = (int *)(lVar40 + (long)iVar12 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar36 = uVar22 + lVar34 * lVar24;
                      uVar10 = *(undefined4 *)(lVar36 + (long)iVar12 * 4);
                    }
                    else {
                      piVar1 = (int *)(lVar21 + lVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar43 + lVar25) != '\0') goto LAB_002c9162;
                      piVar1 = (int *)(img.accesses_._16_8_ + lVar36 * lVar28 + lVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar43 = lVar42 * lVar28 + lVar40;
                      lVar36 = lVar34 * lVar24 + uVar22;
                      if (*(char *)(lVar25 + img.img_._16_8_ + lVar44 * lVar28) == '\0') {
                        piVar1 = (int *)(lVar43 + lVar25 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar9 = *(uint *)(uVar22 + lVar34 * lVar28 + lVar25 * 4);
                        piVar1 = (int *)(lVar40 + lVar42 * lVar24 + (long)iVar12 * 4);
                        *piVar1 = *piVar1 + 1;
                        uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar36 + (long)iVar12 * 4));
                        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 +
                                         img_labels.accesses_._16_8_ + lVar25 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_
                                 + lVar25 * 4) = uVar9;
                        goto LAB_002c9b2c;
                      }
                      piVar1 = (int *)(lVar43 + (long)iVar12 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar10 = *(undefined4 *)(uVar22 + lVar34 * lVar28 + (long)iVar12 * 4);
                      lVar40 = lVar40 + lVar42 * lVar24;
                    }
                    piVar1 = (int *)(lVar40 + lVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(undefined4 *)(lVar36 + lVar25 * 4) = uVar10;
                    goto LAB_002c9b2c;
                  }
                  piVar1 = (int *)(lVar21 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (cVar8 == '\0') {
                    lVar36 = lVar42 * lVar28 + lVar40;
                    if (*(char *)(lVar43 + lVar25) != '\0') {
                      piVar1 = (int *)(lVar36 + lVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      goto LAB_002c9850;
                    }
                    piVar1 = (int *)(lVar36 + (long)iVar12 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar9 = *(uint *)(lVar28 * lVar34 + uVar22 + (long)iVar12 * 4);
                    goto LAB_002c9863;
                  }
                  if (*(char *)(lVar43 + lVar25) == '\0') {
                    piVar1 = (int *)(img.accesses_._16_8_ + lVar36 * lVar28 + lVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    cVar26 = *(char *)(lVar25 + img.img_._16_8_ + lVar44 * lVar28);
                    lVar36 = lVar42 * lVar28 + lVar40;
                    piVar1 = (int *)(lVar36 + (long)iVar12 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar28 = lVar28 * lVar34 + uVar22;
                    uVar9 = *(uint *)(lVar28 + (long)iVar12 * 4);
                    if (cVar26 == '\0') {
                      piVar1 = (int *)(lVar36 + lVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar28 + lVar25 * 4));
LAB_002ca0a3:
                      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 +
                                       img_labels.accesses_._16_8_ + lVar25 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar36 = lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_;
                      goto LAB_002c987d;
                    }
                    piVar1 = (int *)(lVar40 + lVar42 * lVar24 + lVar25 * 4);
                    *piVar1 = *piVar1 + 1;
                    *(uint *)(uVar22 + lVar34 * lVar24 + lVar25 * 4) = uVar9;
                    goto LAB_002c9b2c;
                  }
LAB_002c9162:
                  piVar1 = (int *)(lVar42 * lVar28 + lVar40 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(lVar28 * lVar34 + uVar22 + lVar25 * 4);
                  piVar1 = (int *)(lVar42 * lVar24 + lVar40 + lVar25 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar36 = lVar34 * lVar24 + uVar22;
                }
              }
LAB_002c987d:
              *(uint *)(lVar36 + lVar25 * 4) = uVar9;
              goto LAB_002c9b2c;
            }
            lVar25 = *(long *)img.accesses_._72_8_;
            lVar19 = lVar25 * lVar24 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar19 + uVar16 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = *(long *)img.img_._72_8_;
            lVar18 = lVar21 * lVar24 + img.img_._16_8_;
            local_158 = local_2e8;
            lVar44 = local_2f8;
            if (*(char *)(uVar16 + lVar18) == '\0') {
              lVar34 = (uVar15 << 0x20) + 0x300000000;
              piVar1 = (int *)(lVar19 + (lVar34 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              lVar34 = lVar34 >> 0x20;
              if (*(char *)(lVar18 + lVar34) == '\0') {
                piVar1 = (int *)(local_120 + local_2f8 * lVar24 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                goto LAB_002c1b5a;
              }
              lVar40 = lVar25 * lVar43 + img.accesses_._16_8_;
              piVar1 = (int *)(lVar40 + lVar34 * 4);
              *piVar1 = *piVar1 + 1;
              lVar42 = lVar21 * lVar43 + img.img_._16_8_;
              if (*(char *)(lVar34 + lVar42) != '\0') {
                piVar1 = (int *)(local_2f8 * lVar28 + local_2f0 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                local_308 = uVar16 & 0xffffffff;
                uVar13 = local_2d8;
                lVar34 = local_2f0;
                goto LAB_002c4b9e;
              }
              lVar19 = (uVar15 << 0x20) + 0x400000000;
              lVar18 = lVar19 >> 0x20;
              piVar1 = (int *)(lVar40 + (lVar19 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)(lVar42 + lVar18);
              piVar1 = (int *)(lVar40 + uVar16 * 4);
              *piVar1 = *piVar1 + 1;
              cVar8 = *(char *)(lVar42 + 2 + uVar15);
              if (cVar26 == '\0') {
                if (cVar8 == '\0') {
                  uVar9 = TTA::MemNewLabel();
                  local_2f8 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
LAB_002c1ad7:
                  local_2e8 = *(long *)img_labels.img_._72_8_;
LAB_002c48be:
                  local_2d8 = img_labels.img_._16_8_;
                  local_308 = uVar16 & 0xffffffff;
                  local_120 = img_labels.accesses_._16_8_;
                  local_138 = img_labels.img_._16_8_;
                  local_3f8 = (long *)img_labels.img_._72_8_;
                  local_3e0 = (long *)img_labels.accesses_._72_8_;
                  local_2f0 = img_labels.accesses_._16_8_;
                  local_2c8 = img_labels.accesses_._16_8_;
                  local_2c0 = img_labels.img_._16_8_;
                  local_1e0 = img_labels.accesses_._16_8_;
                  local_1d8 = img_labels.img_._16_8_;
                  goto LAB_002c39da;
                }
                piVar1 = (int *)(local_1e0 + local_2f8 * lVar28 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                local_1d8 = local_138;
                local_1e0 = local_120;
                local_2c0 = local_138;
                local_2c8 = local_120;
                local_2d8 = local_138;
                local_2f0 = local_120;
                local_188 = local_138;
                local_168 = local_120;
                goto LAB_002c7a12;
              }
              if (cVar8 == '\0') {
                piVar1 = (int *)(local_2c8 + local_2f8 * lVar28 + lVar18 * 4);
                *piVar1 = *piVar1 + 1;
                uVar10 = *(undefined4 *)(local_2c0 + local_2e8 * lVar28 + lVar18 * 4);
                piVar1 = (int *)(local_2f8 * lVar24 + local_1e0 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2e8 * lVar24 + local_1d8 + uVar16 * 4) = uVar10;
                local_2c0 = local_1d8;
                local_2c8 = local_1e0;
              }
              else {
                piVar1 = (int *)(img.accesses_._16_8_ + lVar25 * lVar28 + lVar34 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar34 + img.img_._16_8_ + lVar21 * lVar28) == '\0') {
                  local_2c8 = local_2c8 + local_2f8 * lVar28;
                  piVar1 = (int *)(local_2c8 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_2c0 = local_2c0 + local_2e8 * lVar28;
                  uVar9 = *(uint *)(local_2c0 + uVar16 * 4);
                  piVar1 = (int *)(local_2c8 + lVar18 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = TTA::MemMerge(uVar9,*(uint *)(local_2c0 + lVar18 * 4));
                  lVar44 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_158 = *(long *)img_labels.img_._72_8_;
                  *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + uVar16 * 4) = uVar9;
                  local_120 = img_labels.accesses_._16_8_;
                  lVar34 = img_labels.accesses_._16_8_;
                  uVar13 = img_labels.img_._16_8_;
                  local_138 = img_labels.img_._16_8_;
                  local_3f8 = (long *)img_labels.img_._72_8_;
                  local_3e0 = (long *)img_labels.accesses_._72_8_;
                  local_2f8 = lVar44;
                  local_2f0 = img_labels.accesses_._16_8_;
                  local_2e8 = local_158;
                  local_2d8 = img_labels.img_._16_8_;
                  local_2d0 = img_labels.accesses_._16_8_;
                  local_2c8 = img_labels.accesses_._16_8_;
                  local_2c0 = img_labels.img_._16_8_;
                  local_1f0 = img_labels.img_._16_8_;
                  local_1e8 = local_158;
                  local_1e0 = img_labels.accesses_._16_8_;
                  local_1d8 = img_labels.img_._16_8_;
                  local_1d0 = img_labels.accesses_._16_8_;
                  local_1c8 = img_labels.img_._16_8_;
                  local_1c0 = local_158;
                  local_1b8 = img_labels.accesses_._16_8_;
                  local_1b0 = img_labels.img_._16_8_;
                  local_1a8 = img_labels.accesses_._16_8_;
                  local_1a0 = lVar44;
                  local_198 = img_labels.img_._16_8_;
                  local_190 = local_158;
                  local_188 = img_labels.img_._16_8_;
                  local_180 = img_labels.accesses_._16_8_;
                  local_178 = img_labels.accesses_._16_8_;
                  local_170 = img_labels.img_._16_8_;
                  local_168 = img_labels.accesses_._16_8_;
                  goto LAB_002c2a4a;
                }
                piVar1 = (int *)(local_2f0 + local_2f8 * lVar28 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                uVar10 = *(undefined4 *)(local_2d8 + local_2e8 * lVar28 + uVar16 * 4);
                piVar1 = (int *)(local_2f8 * lVar24 + local_2c8 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(local_2e8 * lVar24 + local_2c0 + uVar16 * 4) = uVar10;
              }
              local_190 = local_2e8;
              local_1a0 = local_2f8;
              local_1e8 = local_2e8;
              local_1c0 = local_2e8;
              local_120 = local_120;
              lVar34 = local_2c8;
              uVar13 = local_2c0;
              local_138 = local_138;
              local_2f0 = local_2c8;
              local_2d8 = local_2c0;
              local_2d0 = local_2c8;
              local_1f0 = local_2c0;
              local_1d0 = local_2c8;
              local_1c8 = local_2c0;
              local_1b8 = local_2c8;
              local_1b0 = local_2c0;
              local_1a8 = local_2c8;
              local_198 = local_2c0;
              local_188 = local_2c0;
              local_180 = local_2c8;
              local_178 = local_2c8;
              local_170 = local_2c0;
              local_168 = local_2c8;
              goto LAB_002c2a4a;
            }
            piVar1 = (int *)(lVar19 + 4 + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar18 + 1 + uVar15);
            lVar32 = lVar25 * lVar43 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar32 + 0xc + uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar39 = lVar21 * lVar43 + img.img_._16_8_;
            cVar8 = *(char *)(uVar15 + 3 + lVar39);
            if (cVar26 == '\0') {
              if (cVar8 == '\0') goto LAB_002c7425;
              piVar1 = (int *)(lVar32 + uVar16 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar39 + uVar16) == '\0') {
                piVar1 = (int *)(img.accesses_._16_8_ + lVar25 * lVar28 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(uVar16 + img.img_._16_8_ + lVar21 * lVar28) == '\0') {
                  local_1b8 = local_1b8 + local_2f8 * lVar28;
                  piVar1 = (int *)(local_1b8 + uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_1b0 = local_1b0 + local_2e8 * lVar28;
                  uVar9 = *(uint *)(local_1b0 + uVar15 * 4);
                  piVar1 = (int *)(local_1b8 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(local_1b0 + uVar16 * 4);
LAB_002c711c:
                  uVar9 = TTA::MemMerge(uVar9,uVar30);
                  local_2f0 = img_labels.accesses_._16_8_;
                  local_3e0 = (long *)img_labels.accesses_._72_8_;
                  lVar42 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar42 * lVar24 + img_labels.accesses_._16_8_ + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_308 = img_labels.img_._16_8_;
                  local_3f8 = (long *)img_labels.img_._72_8_;
                  lVar34 = *(long *)img_labels.img_._72_8_;
                  uVar22 = img_labels.img_._16_8_;
                  lVar40 = img_labels.accesses_._16_8_;
                  local_2f8 = lVar42;
                  local_2e8 = lVar34;
                  local_2d8 = local_308;
                  local_2d0 = local_2f0;
                  local_2c8 = local_2f0;
                  local_2c0 = local_308;
                  local_1f0 = local_308;
                  local_1e8 = lVar34;
                  local_1e0 = local_2f0;
                  local_1d8 = local_308;
                  local_1d0 = local_2f0;
                  local_1c8 = local_308;
                  local_1c0 = lVar34;
                  local_1b8 = local_2f0;
                  local_1b0 = local_308;
                  local_1a8 = local_2f0;
                  local_1a0 = lVar42;
                  local_198 = local_308;
                  local_190 = lVar34;
                  local_188 = local_308;
                  local_180 = local_2f0;
                  local_178 = local_2f0;
                  local_170 = local_308;
                  local_168 = local_2f0;
                  local_148 = lVar42;
                  local_140 = local_2f0;
                  local_138 = local_308;
                  local_128 = lVar34;
                  local_120 = local_2f0;
                }
                else {
                  piVar1 = (int *)(local_1a8 + local_1a0 * lVar28 + uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(local_198 + local_190 * lVar28 + uVar15 * 4);
                  piVar1 = (int *)(local_2f8 * lVar24 + local_1b8 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_190 = local_2e8;
                  local_198 = local_1b0;
                  local_1a0 = local_2f8;
                  local_1a8 = local_1b8;
                  local_1e8 = local_2e8;
                  local_1f0 = local_1b0;
                  local_148 = local_2f8;
                  local_2d0 = local_1b8;
                  local_1c0 = local_2e8;
                  local_1c8 = local_1b0;
                  local_1d0 = local_1b8;
                  local_128 = local_2e8;
                  local_308 = local_1b0;
                  local_140 = local_1b8;
                  uVar22 = local_1b0;
                  lVar40 = local_1b8;
                  lVar42 = local_2f8;
                  lVar34 = local_2e8;
                }
              }
              else {
                piVar1 = (int *)(local_2d0 + local_148 * lVar28 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = *(uint *)(local_1f0 + local_1e8 * lVar28 + uVar16 * 4);
                piVar1 = (int *)(local_1a0 * lVar24 + local_1a8 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                local_1e8 = local_190;
                local_1f0 = local_198;
                local_148 = local_1a0;
                local_2d0 = local_1a8;
                local_1c0 = local_190;
                local_1c8 = local_198;
                local_1d0 = local_1a8;
                local_128 = local_190;
                local_308 = local_198;
                local_140 = local_1a8;
                uVar22 = local_198;
                lVar40 = local_1a8;
                lVar42 = local_1a0;
                lVar34 = local_190;
              }
            }
            else {
              if (cVar8 == '\0') {
                piVar1 = (int *)(lVar19 + 0xc + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar18 + 3 + uVar15) == '\0') {
                  local_2d0 = local_2d0 + local_148 * lVar24;
                  piVar1 = (int *)(local_2d0 + (long)iVar12 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_1f0 = local_1f0 + local_1e8 * lVar24;
                  uVar10 = *(undefined4 *)(local_1f0 + (long)iVar12 * 4);
                  piVar1 = (int *)(local_2d0 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_1f0 + uVar16 * 4) = uVar10;
                  goto LAB_002c1370;
                }
                lVar34 = (uVar15 << 0x20) + 0x400000000;
                piVar1 = (int *)(lVar32 + (lVar34 >> 0x1e));
                *piVar1 = *piVar1 + 1;
                lVar34 = lVar34 >> 0x20;
                if (*(char *)(lVar39 + lVar34) == '\0') {
                  local_2d0 = local_2d0 + local_148 * lVar24;
                  piVar1 = (int *)(local_2d0 + (long)iVar12 * 4);
                  *piVar1 = *piVar1 + 1;
                  local_1f0 = local_1f0 + local_1e8 * lVar24;
                  uVar10 = *(undefined4 *)(local_1f0 + (long)iVar12 * 4);
                  piVar1 = (int *)(local_2d0 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_1f0 + uVar16 * 4) = uVar10;
                  goto LAB_002c5e54;
                }
                lVar42 = img.accesses_._16_8_ + lVar25 * lVar28;
                piVar1 = (int *)(lVar42 + 0xc + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = img.img_._16_8_ + lVar21 * lVar28;
                if (*(char *)(uVar15 + 3 + lVar44) == '\0') {
                  piVar1 = (int *)(local_148 * lVar28 + local_2d0 + lVar34 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(local_1e8 * lVar28 + local_1f0 + lVar34 * 4);
                  piVar1 = (int *)(local_148 * lVar24 + local_2d0 + (long)iVar12 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(local_1e8 * lVar24 + local_1f0 + (long)iVar12 * 4);
                  goto LAB_002c77db;
                }
                piVar1 = (int *)(lVar32 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar39 + uVar16) != '\0') {
                  piVar1 = (int *)(local_140 + local_148 * lVar28 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar10 = *(undefined4 *)(local_308 + local_128 * lVar28 + uVar16 * 4);
                  piVar1 = (int *)(local_148 * lVar24 + local_1d0 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(local_1c0 * lVar24 + local_1c8 + uVar16 * 4) = uVar10;
                  local_120 = local_120;
                  lVar34 = local_1d0;
                  uVar13 = local_1c8;
                  local_138 = local_138;
                  lVar44 = local_148;
                  local_158 = local_1c0;
                  goto LAB_002c2a4a;
                }
                piVar1 = (int *)(lVar42 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                lVar34 = local_1e8 * lVar24 + local_1f0;
                if (*(char *)(lVar44 + uVar16) == '\0') {
                  piVar1 = (int *)(local_148 * lVar28 + local_2d0 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(local_1f0 + local_1e8 * lVar28 + uVar16 * 4);
                  piVar1 = (int *)(local_148 * lVar24 + local_2d0 + (long)iVar12 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(lVar34 + (long)iVar12 * 4);
                  goto LAB_002c81ce;
                }
                piVar1 = (int *)(local_1d0 + local_148 * lVar28 + (long)iVar12 * 4);
                *piVar1 = *piVar1 + 1;
                uVar10 = *(undefined4 *)(local_1c8 + local_1c0 * lVar28 + (long)iVar12 * 4);
                piVar1 = (int *)(local_148 * lVar24 + local_2d0 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar34 + uVar16 * 4) = uVar10;
                local_1c0 = local_1e8;
                local_1c8 = local_1f0;
                local_1d0 = local_2d0;
                local_120 = local_120;
                lVar34 = local_2d0;
                uVar13 = local_1f0;
                local_138 = local_138;
                lVar44 = local_148;
                local_158 = local_1e8;
                goto LAB_002c2a4a;
              }
              piVar1 = (int *)(lVar32 + uVar16 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar39 + uVar16) == '\0') {
                piVar1 = (int *)(img.accesses_._16_8_ + lVar25 * lVar28 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                lVar44 = local_148 * lVar24 + local_140;
                if (*(char *)(uVar16 + img.img_._16_8_ + lVar21 * lVar28) == '\0') {
                  piVar1 = (int *)(local_140 + local_148 * lVar28 + uVar16 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar9 = *(uint *)(local_128 * lVar28 + local_308 + uVar16 * 4);
                  piVar1 = (int *)(lVar44 + uVar15 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar30 = *(uint *)(local_128 * lVar24 + local_308 + uVar15 * 4);
                  goto LAB_002c711c;
                }
                piVar1 = (int *)(lVar40 + lVar42 * lVar28 + uVar15 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = *(uint *)(uVar22 + lVar34 * lVar28 + uVar15 * 4);
                piVar1 = (int *)(lVar44 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                uVar22 = local_308;
                lVar40 = local_140;
                lVar42 = local_148;
                lVar34 = local_128;
              }
              else {
                piVar1 = (int *)(lVar42 * lVar28 + lVar40 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
                uVar9 = *(uint *)(lVar34 * lVar28 + uVar22 + uVar16 * 4);
                piVar1 = (int *)(lVar42 * lVar24 + lVar40 + uVar16 * 4);
                *piVar1 = *piVar1 + 1;
              }
            }
            *(uint *)(lVar34 * lVar24 + uVar22 + uVar16 * 4) = uVar9;
            uVar15 = uVar16;
          } while( true );
        }
        iVar12 = iVar23 + 2 + (int)lVar21;
        local_308 = img_labels.img_._16_8_;
        lVar40 = img_labels.accesses_._16_8_;
        if (iVar27 < iVar12) goto LAB_002c85f7;
        lVar42 = local_140 + 0x200000000 >> 0x20;
        piVar1 = (int *)((local_140 + 0x200000000 >> 0x1e) +
                        img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
        *piVar1 = *piVar1 + 1;
        lVar36 = *(long *)img.img_._72_8_;
        lVar34 = lVar36 * lVar24 + img.img_._16_8_;
        lVar44 = local_140 + 0x300000000 >> 0x20;
        if (*(char *)(lVar42 + lVar34) != '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar44 + img.img_._16_8_ + lVar36 * lVar43) == '\0') {
            lVar36 = img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24;
            piVar1 = (int *)(lVar32 + lVar36);
            *piVar1 = *piVar1 + 1;
            lVar28 = img_labels.img_._16_8_ + lVar24 * *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar32 + lVar28);
            piVar1 = (int *)(lVar36 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar28 + lVar42 * 4) = uVar10;
            goto LAB_002c9b2c;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ +
                          lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar42 + lVar36 * lVar28 + img.img_._16_8_) == '\0') {
            lVar36 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar43 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar28 * lVar43 + img_labels.img_._16_8_ + lVar42 * 4);
            piVar1 = (int *)(lVar32 + lVar36 * lVar24 + img_labels.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            uVar30 = *(uint *)(lVar32 + lVar43 * lVar24 + img_labels.img_._16_8_);
          }
          else {
            piVar1 = (int *)(lVar32 + lVar43 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_)
            ;
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar19 + img.img_._16_8_ + lVar36 * lVar43) == '\0') {
              lVar36 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              lVar43 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar28 * lVar43 + img_labels.img_._16_8_ + lVar42 * 4);
              piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar43 * lVar24 + img_labels.img_._16_8_ + lVar19 * 4);
            }
            else {
              piVar1 = (int *)((local_140 + 0x100000000 >> 0x1e) +
                              *(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              cVar26 = *(char *)((local_140 + 0x100000000 >> 0x20) +
                                *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_);
              lVar36 = *(long *)img_labels.accesses_._72_8_;
              lVar34 = lVar36 * lVar28 + img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar34 + lVar19 * 4);
              *piVar1 = *piVar1 + 1;
              lVar43 = *(long *)img_labels.img_._72_8_;
              lVar28 = lVar28 * lVar43 + img_labels.img_._16_8_;
              uVar9 = *(uint *)(lVar28 + lVar19 * 4);
              if (cVar26 != '\0') {
                piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar36 * lVar24 + lVar42 * 4);
                *piVar1 = *piVar1 + 1;
LAB_002c8c63:
                *(uint *)(img_labels.img_._16_8_ + lVar43 * lVar24 + lVar42 * 4) = uVar9;
                goto LAB_002c9b2c;
              }
LAB_002c9982:
              piVar1 = (int *)(lVar34 + lVar42 * 4);
              *piVar1 = *piVar1 + 1;
              uVar30 = *(uint *)(lVar28 + lVar42 * 4);
            }
          }
LAB_002c9afb:
          uVar9 = TTA::MemMerge(uVar9,uVar30);
          goto LAB_002c9b00;
        }
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar34 + lVar44) == '\0') goto LAB_002c93e3;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar44 + lVar43 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0')
        goto LAB_002c99f2;
        lVar36 = *(long *)img_labels.accesses_._72_8_;
LAB_002c99c2:
        piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar28 * lVar43 + img_labels.img_._16_8_ + lVar42 * 4);
        piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = lVar43 * lVar24 + img_labels.img_._16_8_;
LAB_002c99ea:
        *(undefined4 *)(lVar36 + lVar42 * 4) = uVar10;
        goto LAB_002c9b2c;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + 0xc +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar34 = *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_;
      if (*(char *)(lVar42 + 3 + lVar34) == '\0') {
        piVar1 = (int *)(local_148 * lVar28 + lVar40 + 0x10 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar9 = *(uint *)(local_128 * lVar28 + local_308 + 0x10 + lVar42 * 4);
        piVar1 = (int *)(local_148 * lVar24 + lVar40 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(local_128 * lVar24 + local_308 + lVar42 * 4);
      }
      else {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + 8 +
                        lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar34 + 2 + lVar42) != '\0') {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + 4 +
                          lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar42 + 1 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_) == '\0') {
            lVar40 = lVar40 + local_148 * lVar28;
            piVar1 = (int *)(lVar40 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = local_308 + local_128 * lVar28;
            uVar9 = *(uint *)(lVar34 + lVar42 * 4);
            piVar1 = (int *)(lVar40 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + 8 + lVar42 * 4));
            local_2f0 = img_labels.accesses_._16_8_;
            local_3e0 = (long *)img_labels.accesses_._72_8_;
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            local_2d8 = img_labels.img_._16_8_;
            local_3f8 = (long *)img_labels.img_._72_8_;
            local_158 = *(long *)img_labels.img_._72_8_;
            *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + 8 + lVar42 * 4) = uVar9;
            local_120 = img_labels.accesses_._16_8_;
            lVar34 = img_labels.accesses_._16_8_;
            uVar13 = img_labels.img_._16_8_;
            local_138 = img_labels.img_._16_8_;
            local_2f8 = lVar44;
            local_2e8 = local_158;
            local_2d0 = local_2f0;
            local_2c8 = local_2f0;
            local_2c0 = local_2d8;
            local_1f0 = local_2d8;
            local_1e8 = local_158;
            local_1e0 = local_2f0;
            local_1d8 = local_2d8;
            local_1d0 = local_2f0;
            local_1c8 = local_2d8;
            local_1c0 = local_158;
            local_1b8 = local_2f0;
            local_1b0 = local_2d8;
            local_1a8 = local_2f0;
            local_1a0 = lVar44;
            local_198 = local_2d8;
            local_190 = local_158;
            local_188 = local_2d8;
            local_180 = local_2f0;
            local_178 = local_2f0;
            local_170 = local_2d8;
            local_168 = local_2f0;
          }
          else {
            piVar1 = (int *)(lVar40 + local_148 * lVar28 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            uVar10 = *(undefined4 *)(local_308 + local_150 * lVar28 + lVar42 * 4);
            piVar1 = (int *)(local_148 * lVar24 + lVar40 + 8 + lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_128 * lVar24 + local_308 + 8 + lVar42 * 4) = uVar10;
            local_120 = local_120;
            lVar34 = lVar40;
            uVar13 = local_308;
            local_138 = local_138;
            lVar44 = local_148;
          }
          goto LAB_002c2a4a;
        }
        piVar1 = (int *)(local_148 * lVar28 + lVar40 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar9 = *(uint *)(local_128 * lVar28 + local_308 + 8 + lVar42 * 4);
        piVar1 = (int *)(local_148 * lVar24 + lVar40 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(local_128 * lVar24 + local_308 + lVar42 * 4);
      }
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      local_158 = *(long *)img_labels.img_._72_8_;
    }
    *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + 8 + lVar42 * 4) = uVar9;
    local_1d8 = img_labels.img_._16_8_;
    local_1e0 = img_labels.accesses_._16_8_;
    local_2c0 = img_labels.img_._16_8_;
    local_2c8 = img_labels.accesses_._16_8_;
    local_2d8 = img_labels.img_._16_8_;
    local_2f0 = img_labels.accesses_._16_8_;
    local_188 = img_labels.img_._16_8_;
    local_168 = img_labels.accesses_._16_8_;
    local_180 = img_labels.accesses_._16_8_;
    local_170 = img_labels.img_._16_8_;
    local_178 = img_labels.accesses_._16_8_;
    local_1b0 = img_labels.img_._16_8_;
    local_1b8 = img_labels.accesses_._16_8_;
    local_198 = img_labels.img_._16_8_;
    local_1a8 = img_labels.accesses_._16_8_;
    local_1f0 = img_labels.img_._16_8_;
    local_2d0 = img_labels.accesses_._16_8_;
    local_1c8 = img_labels.img_._16_8_;
    local_1d0 = img_labels.accesses_._16_8_;
    local_120 = img_labels.accesses_._16_8_;
    lVar34 = img_labels.accesses_._16_8_;
    uVar13 = img_labels.img_._16_8_;
    local_138 = img_labels.img_._16_8_;
    local_3f8 = (long *)img_labels.img_._72_8_;
    local_3e0 = (long *)img_labels.accesses_._72_8_;
    local_2f8 = lVar44;
    local_2e8 = local_158;
    local_1e8 = local_158;
    local_1c0 = local_158;
    local_1a0 = lVar44;
    local_190 = local_158;
    goto LAB_002c2a4a;
  }
  if (iVar27 < iVar12) goto LAB_002c85f7;
  piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  lVar36 = *(long *)img.img_._72_8_;
  lVar25 = lVar36 * lVar24 + img.img_._16_8_;
  if (*(char *)(lVar42 + 2 + lVar25) == '\0') {
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + 0xc +
                    lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar25 + 3 + lVar42) == '\0') {
      piVar1 = (int *)(lVar44 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 + 8 + lVar42 * 4) = 0;
      goto LAB_002c9b2c;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + 0xc +
                    lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + 3 + lVar43 * *(long *)img.img_._72_8_ + img.img_._16_8_) != '\0') {
      piVar1 = (int *)(lVar40 + local_148 * lVar28 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(undefined4 *)(local_308 + local_150 * lVar28 + 8 + lVar42 * 4);
      goto LAB_002ca088;
    }
    uVar9 = TTA::MemNewLabel();
  }
  else {
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 + 0xc +
                    lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar42 + 3 + img.img_._16_8_ + lVar36 * lVar43) == '\0') {
      piVar1 = (int *)(lVar44 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(undefined4 *)(lVar34 + lVar42 * 4);
LAB_002ca088:
      piVar1 = (int *)(lVar44 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar34 + 8 + lVar42 * 4) = uVar10;
      goto LAB_002c9b2c;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + 8 + lVar42 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    lVar36 = *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_;
    if (*(char *)(lVar42 + 2 + lVar36) == '\0') {
      piVar1 = (int *)(lVar40 + local_148 * lVar28 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = *(uint *)(local_308 + local_150 * lVar28 + 8 + lVar42 * 4);
      piVar1 = (int *)(lVar44 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar34 + lVar42 * 4);
    }
    else {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + 4 +
                      lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar36 + 1 + lVar42);
      lVar40 = lVar40 + local_148 * lVar28;
      piVar1 = (int *)(lVar40 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = local_308 + local_150 * lVar28;
      uVar9 = *(uint *)(lVar36 + lVar42 * 4);
      if (cVar26 != '\0') {
        piVar1 = (int *)(lVar44 + 8 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(lVar34 + 8 + lVar42 * 4) = uVar9;
        goto LAB_002c9b2c;
      }
      piVar1 = (int *)(lVar40 + 8 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar36 + 8 + lVar42 * 4);
    }
    uVar9 = TTA::MemMerge(uVar9,uVar30);
  }
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_ + 8 +
                  lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + 8 + lVar42 * 4) =
       uVar9;
  goto LAB_002c9b2c;
code_r0x002c5f90:
  lVar34 = *(long *)img_labels.accesses_._72_8_ * lVar24 + lVar25;
  piVar1 = (int *)(lVar34 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  lVar19 = *(long *)img_labels.img_._72_8_ * lVar24 + lVar40;
  uVar10 = *(undefined4 *)(lVar19 + lVar21 * 4);
  piVar1 = (int *)(lVar34 + 8 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar19 + 8 + lVar21 * 4) = uVar10;
  local_140 = local_140 + 0x200000000;
  lVar21 = lVar21 + 2;
  goto LAB_002c5ef5;
LAB_002c7425:
  piVar1 = (int *)(lVar19 + 0xc + uVar15 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar18 + 3 + uVar15) == '\0') {
    piVar1 = (int *)(lVar32 + uVar16 * 4);
    *piVar1 = *piVar1 + 1;
    lVar34 = local_2f8 * lVar28 + local_2f0;
    if (*(char *)(lVar39 + uVar16) == '\0') {
      piVar1 = (int *)(lVar34 + (long)iVar12 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(undefined4 *)(local_2e8 * lVar28 + local_2d8 + (long)iVar12 * 4);
      piVar1 = (int *)(local_2f0 + local_2f8 * lVar24 + uVar16 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2e8 * lVar24 + local_2d8 + uVar16 * 4) = uVar10;
    }
    else {
      piVar1 = (int *)(lVar34 + uVar16 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(undefined4 *)(local_2e8 * lVar28 + local_2d8 + uVar16 * 4);
      piVar1 = (int *)(local_2f0 + local_2f8 * lVar24 + uVar16 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2e8 * lVar24 + local_2d8 + uVar16 * 4) = uVar10;
    }
    goto LAB_002c1370;
  }
  lVar42 = (uVar15 << 0x20) + 0x400000000;
  lVar34 = lVar42 >> 0x20;
  piVar1 = (int *)(lVar32 + (lVar42 >> 0x1e));
  *piVar1 = *piVar1 + 1;
  cVar26 = *(char *)(lVar39 + lVar34);
  piVar1 = (int *)(lVar32 + uVar16 * 4);
  *piVar1 = *piVar1 + 1;
  cVar8 = *(char *)(lVar39 + 2 + uVar15);
  if (cVar26 != '\0') {
    lVar40 = img.accesses_._16_8_ + lVar25 * lVar28;
    piVar1 = (int *)(lVar40 + 0xc + uVar15 * 4);
    *piVar1 = *piVar1 + 1;
    lVar42 = img.img_._16_8_ + lVar21 * lVar28;
    cVar26 = *(char *)(uVar15 + 3 + lVar42);
    if (cVar8 == '\0') {
      if (cVar26 != '\0') {
        piVar1 = (int *)(lVar40 + uVar16 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = (long)iVar12;
        if (*(char *)(lVar42 + 2 + uVar15) == '\0') {
          local_180 = local_180 + local_2f8 * lVar28;
          piVar1 = (int *)(local_180 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          local_188 = local_188 + local_2e8 * lVar28;
          uVar9 = *(uint *)(local_188 + lVar34 * 4);
          piVar1 = (int *)(local_180 + uVar16 * 4);
          *piVar1 = *piVar1 + 1;
          uVar30 = *(uint *)(local_188 + uVar16 * 4);
LAB_002c81ce:
          uVar9 = TTA::MemMerge(uVar9,uVar30);
          local_3e0 = (long *)img_labels.accesses_._72_8_;
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + uVar16 * 4);
          *piVar1 = *piVar1 + 1;
          local_3f8 = (long *)img_labels.img_._72_8_;
          local_158 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + uVar16 * 4) = uVar9;
          local_1d8 = img_labels.img_._16_8_;
          local_1e0 = img_labels.accesses_._16_8_;
          local_2c0 = img_labels.img_._16_8_;
          local_2c8 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
          local_2f0 = img_labels.accesses_._16_8_;
          local_188 = img_labels.img_._16_8_;
          local_168 = img_labels.accesses_._16_8_;
          local_180 = img_labels.accesses_._16_8_;
          local_170 = img_labels.img_._16_8_;
          local_178 = img_labels.accesses_._16_8_;
          local_1b0 = img_labels.img_._16_8_;
          local_1b8 = img_labels.accesses_._16_8_;
          local_198 = img_labels.img_._16_8_;
          local_1a8 = img_labels.accesses_._16_8_;
          local_1f0 = img_labels.img_._16_8_;
          local_2d0 = img_labels.accesses_._16_8_;
          local_1c8 = img_labels.img_._16_8_;
          local_1d0 = img_labels.accesses_._16_8_;
          local_120 = img_labels.accesses_._16_8_;
          lVar34 = img_labels.accesses_._16_8_;
          uVar13 = img_labels.img_._16_8_;
          local_138 = img_labels.img_._16_8_;
          local_2f8 = lVar44;
          local_2e8 = local_158;
          local_1e8 = local_158;
          local_1c0 = local_158;
          local_1a0 = lVar44;
          local_190 = local_158;
        }
        else {
          piVar1 = (int *)(local_178 + local_2f8 * lVar28 + lVar34 * 4);
          *piVar1 = *piVar1 + 1;
          uVar10 = *(undefined4 *)(local_170 + local_2e8 * lVar28 + lVar34 * 4);
          piVar1 = (int *)(local_2f8 * lVar24 + local_180 + uVar16 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2e8 * lVar24 + local_188 + uVar16 * 4) = uVar10;
          local_170 = local_188;
          local_178 = local_180;
          local_1b0 = local_188;
          local_1b8 = local_180;
          local_190 = local_2e8;
          local_198 = local_188;
          local_1a0 = local_2f8;
          local_1a8 = local_180;
          local_1e8 = local_2e8;
          local_1f0 = local_188;
          local_2d0 = local_180;
          local_1c0 = local_2e8;
          local_1c8 = local_188;
          local_1d0 = local_180;
          local_120 = local_120;
          lVar34 = local_180;
          uVar13 = local_188;
          local_138 = local_138;
        }
        goto LAB_002c2a4a;
      }
      local_180 = local_180 + local_2f8 * lVar28;
      piVar1 = (int *)(local_180 + (long)iVar12 * 4);
      *piVar1 = *piVar1 + 1;
      local_188 = local_188 + local_2e8 * lVar28;
      uVar9 = *(uint *)(local_188 + (long)iVar12 * 4);
      piVar1 = (int *)(local_180 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(local_188 + lVar34 * 4);
LAB_002c77db:
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      lVar34 = lVar44 * lVar24 + img_labels.accesses_._16_8_;
    }
    else {
      if (cVar26 != '\0') {
        piVar1 = (int *)(local_1b8 + local_2f8 * lVar28 + uVar16 * 4);
        *piVar1 = *piVar1 + 1;
        uVar10 = *(undefined4 *)(local_1b0 + local_2e8 * lVar28 + uVar16 * 4);
        piVar1 = (int *)(local_2f8 * lVar24 + local_178 + uVar16 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2e8 * lVar24 + local_170 + uVar16 * 4) = uVar10;
        local_1b0 = local_170;
        local_1b8 = local_178;
        local_190 = local_2e8;
        local_198 = local_170;
        local_1a0 = local_2f8;
        local_1a8 = local_178;
        local_1e8 = local_2e8;
        local_1f0 = local_170;
        local_2d0 = local_178;
        local_1c0 = local_2e8;
        local_1c8 = local_170;
        local_1d0 = local_178;
        local_120 = local_120;
        lVar34 = local_178;
        uVar13 = local_170;
        local_138 = local_138;
        goto LAB_002c2a4a;
      }
      local_178 = local_178 + local_2f8 * lVar28;
      piVar1 = (int *)(local_178 + uVar16 * 4);
      *piVar1 = *piVar1 + 1;
      local_170 = local_170 + local_2e8 * lVar28;
      uVar9 = *(uint *)(local_170 + uVar16 * 4);
      piVar1 = (int *)(local_178 + lVar34 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = TTA::MemMerge(uVar9,*(uint *)(local_170 + lVar34 * 4));
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      lVar34 = lVar44 * lVar24 + img_labels.accesses_._16_8_;
    }
    piVar1 = (int *)(lVar34 + uVar16 * 4);
    *piVar1 = *piVar1 + 1;
    local_158 = *(long *)img_labels.img_._72_8_;
    *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + uVar16 * 4) = uVar9;
    local_120 = img_labels.accesses_._16_8_;
    lVar34 = img_labels.accesses_._16_8_;
    uVar13 = img_labels.img_._16_8_;
    local_138 = img_labels.img_._16_8_;
    local_3f8 = (long *)img_labels.img_._72_8_;
    local_3e0 = (long *)img_labels.accesses_._72_8_;
    local_2f8 = lVar44;
    local_2f0 = img_labels.accesses_._16_8_;
    local_2e8 = local_158;
    local_2d8 = img_labels.img_._16_8_;
    local_2d0 = img_labels.accesses_._16_8_;
    local_2c8 = img_labels.accesses_._16_8_;
    local_2c0 = img_labels.img_._16_8_;
    local_1f0 = img_labels.img_._16_8_;
    local_1e8 = local_158;
    local_1e0 = img_labels.accesses_._16_8_;
    local_1d8 = img_labels.img_._16_8_;
    local_1d0 = img_labels.accesses_._16_8_;
    local_1c8 = img_labels.img_._16_8_;
    local_1c0 = local_158;
    local_1b8 = img_labels.accesses_._16_8_;
    local_1b0 = img_labels.img_._16_8_;
    local_1a8 = img_labels.accesses_._16_8_;
    local_1a0 = lVar44;
    local_198 = img_labels.img_._16_8_;
    local_190 = local_158;
    local_188 = img_labels.img_._16_8_;
    local_180 = img_labels.accesses_._16_8_;
    local_178 = img_labels.accesses_._16_8_;
    local_170 = img_labels.img_._16_8_;
    local_168 = img_labels.accesses_._16_8_;
    goto LAB_002c2a4a;
  }
  if (cVar8 != '\0') {
    piVar1 = (int *)(local_180 + local_2f8 * lVar28 + uVar16 * 4);
    *piVar1 = *piVar1 + 1;
    uVar13 = local_188;
LAB_002c7a12:
    local_1e8 = local_2e8;
    local_1a0 = local_2f8;
    uVar15 = uVar16 & 0xffffffff;
    lVar40 = local_168;
    local_148 = local_2f8;
    local_308 = local_188;
    local_150 = local_2e8;
    local_2d0 = local_168;
    local_1f0 = local_188;
    local_1d0 = local_168;
    local_1c8 = local_188;
    local_1c0 = local_1e8;
    local_1b8 = local_168;
    local_1b0 = local_188;
    local_1a8 = local_168;
    local_198 = local_188;
    local_190 = local_1e8;
    local_180 = local_168;
    local_178 = local_168;
    local_170 = local_188;
    local_128 = local_1e8;
    goto LAB_002c4188;
  }
  piVar1 = (int *)(local_168 + local_2f8 * lVar28 + (long)iVar12 * 4);
  *piVar1 = *piVar1 + 1;
  uVar9 = *(uint *)(local_188 + local_2e8 * lVar28 + (long)iVar12 * 4);
  piVar1 = (int *)(local_2f8 * lVar24 + local_2f0 + uVar16 * 4);
  *piVar1 = *piVar1 + 1;
  local_308 = uVar16 & 0xffffffff;
  local_2d8 = local_2d8;
  local_120 = local_120;
  local_138 = local_138;
LAB_002c39da:
  *(uint *)(local_2e8 * lVar24 + local_2d8 + uVar16 * 4) = uVar9;
  iVar23 = (int)local_308;
  lVar42 = (long)iVar23;
  lVar44 = lVar42 << 0x20;
  lVar34 = lVar42 * 4;
  lVar21 = 0;
LAB_002c3a14:
  uVar16 = lVar42 + lVar21 + 2;
  lVar25 = lVar44 >> 0x1e;
  iVar12 = (int)lVar21;
  if (lVar36 <= (long)uVar16) {
    iVar12 = iVar23 + 2 + iVar12;
    local_308 = local_2d8;
    lVar40 = local_2f0;
    if (iVar27 < iVar12) goto LAB_002c85f7;
    lVar42 = lVar44 + 0x200000000 >> 0x20;
    piVar1 = (int *)((lVar44 + 0x200000000 >> 0x1e) +
                    img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
    *piVar1 = *piVar1 + 1;
    lVar36 = *(long *)img.img_._72_8_;
    lVar34 = lVar36 * lVar24 + img.img_._16_8_;
    lVar44 = lVar44 + 0x300000000 >> 0x20;
    if (*(char *)(lVar42 + lVar34) != '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + img.img_._16_8_ + lVar36 * lVar43) == '\0') {
        local_2f0 = local_2f0 + local_2f8 * lVar24;
        piVar1 = (int *)(lVar25 + local_2f0);
        *piVar1 = *piVar1 + 1;
        local_2d8 = local_2d8 + local_2e8 * lVar24;
        uVar10 = *(undefined4 *)(lVar25 + local_2d8);
        piVar1 = (int *)(local_2f0 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
LAB_002c9559:
        *(undefined4 *)(local_2d8 + lVar42 * 4) = uVar10;
        goto LAB_002c9b2c;
      }
      piVar1 = (int *)(local_2f8 * lVar28 + local_2f0 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = *(uint *)(lVar28 * local_2e8 + local_2d8 + lVar42 * 4);
      piVar1 = (int *)(lVar25 + local_2f8 * lVar24 + local_2f0);
      *piVar1 = *piVar1 + 1;
      uVar30 = *(uint *)(lVar25 + local_2e8 * lVar24 + local_2d8);
      goto LAB_002c9afb;
    }
    piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + lVar44 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar34 + lVar44) == '\0') {
      piVar1 = (int *)(local_2f0 + local_2f8 * lVar24 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2d8 + local_2e8 * lVar24 + lVar42 * 4) = 0;
    }
    else {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar44 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar44 + lVar43 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0')
      goto LAB_002c99f2;
      piVar1 = (int *)(local_2f8 * lVar28 + local_2f0 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(undefined4 *)(lVar28 * local_2e8 + local_2d8 + lVar42 * 4);
      piVar1 = (int *)(local_2f8 * lVar24 + local_2f0 + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2e8 * lVar24 + local_2d8 + lVar42 * 4) = uVar10;
    }
    goto LAB_002c9b2c;
  }
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar34 + 8 +
                  lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  lVar40 = *(long *)img.img_._72_8_;
  lVar18 = lVar40 * lVar24 + img.img_._16_8_ + lVar42;
  if (*(char *)(lVar21 + 2 + lVar18) == '\0') {
    piVar1 = (int *)(img.accesses_._16_8_ + lVar34 + *(long *)img.accesses_._72_8_ * lVar24 + 0xc +
                    lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    if (*(char *)(lVar21 + 3 + lVar18) == '\0') {
      iVar23 = iVar23 + iVar12;
      piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_ +
                       lVar42 * 4 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      local_2e8 = *(long *)img_labels.img_._72_8_;
      lVar42 = lVar42 + lVar21;
      goto LAB_002c4f8d;
    }
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar34 + 0xc +
                    lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    lVar40 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_ + lVar42;
    local_158 = local_2e8;
    if (*(char *)(lVar21 + 3 + lVar40) == '\0') {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar34 + 0x10
                      + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar21 + 4 + lVar40) == '\0') goto code_r0x002c3b15;
      piVar1 = (int *)(local_2f8 * lVar28 + local_2f0 + lVar42 * 4 + 0x10 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      uVar10 = *(undefined4 *)(local_2e8 * lVar28 + local_2d8 + lVar42 * 4 + 0x10 + lVar21 * 4);
      piVar1 = (int *)(local_2f8 * lVar24 + local_2f0 + lVar42 * 4 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(local_2e8 * lVar24 + local_2d8 + lVar42 * 4 + 8 + lVar21 * 4) = uVar10;
      local_188 = local_2d8;
      local_168 = local_2f0;
      local_180 = local_2f0;
      local_170 = local_2d8;
      local_178 = local_2f0;
      local_1b0 = local_2d8;
      local_1b8 = local_2f0;
      local_190 = local_2e8;
      local_198 = local_2d8;
      local_1a0 = local_2f8;
      local_1a8 = local_2f0;
      local_1e8 = local_2e8;
      local_1f0 = local_2d8;
      local_2d0 = local_2f0;
      local_1c0 = local_2e8;
      local_1c8 = local_2d8;
      local_1d0 = local_2f0;
      lVar34 = local_2f0;
      uVar13 = local_2d8;
      lVar44 = local_2f8;
      uVar16 = (ulong)(iVar23 + iVar12 + 2);
      goto LAB_002c2a4a;
    }
    piVar1 = (int *)(local_2f8 * lVar28 + local_2f0 + lVar42 * 4 + 8 + lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    local_308 = (ulong)(iVar23 + iVar12 + 2);
    uVar16 = lVar42 + lVar21 + 2;
    uVar13 = local_2d8;
    lVar34 = local_2f0;
LAB_002c4b9e:
    uVar10 = *(undefined4 *)(local_158 * lVar28 + uVar13 + uVar16 * 4);
    piVar1 = (int *)(local_2f8 * lVar24 + lVar34 + uVar16 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(local_158 * lVar24 + uVar13 + uVar16 * 4) = uVar10;
    local_3e0 = (long *)img_labels.accesses_._72_8_;
    local_3f8 = (long *)img_labels.img_._72_8_;
    iVar23 = (int)local_308;
    lVar42 = (long)iVar23;
    lVar18 = lVar42 << 0x20;
    lVar44 = img.accesses_._16_8_ + lVar42 * 4;
    lVar25 = img.img_._16_8_ + lVar42;
    lVar19 = img_labels.img_._16_8_ + lVar42 * 4 + 8;
    lVar32 = img_labels.accesses_._16_8_ + lVar42 * 4 + 8;
    lVar21 = 0;
    while( true ) {
      uVar16 = lVar42 + lVar21 + 2;
      lVar39 = lVar18 >> 0x1e;
      lVar40 = img_labels.accesses_._16_8_;
      if (lVar36 <= (long)uVar16) {
        iVar12 = iVar23 + 2 + (int)lVar21;
        local_308 = img_labels.img_._16_8_;
        if (iVar27 < iVar12) goto LAB_002c85f7;
        lVar42 = lVar18 + 0x200000000 >> 0x20;
        piVar1 = (int *)((lVar18 + 0x200000000 >> 0x1e) +
                        img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24);
        *piVar1 = *piVar1 + 1;
        lVar36 = *(long *)img.img_._72_8_;
        lVar34 = lVar36 * lVar24 + img.img_._16_8_;
        lVar44 = lVar18 + 0x300000000 >> 0x20;
        if (*(char *)(lVar42 + lVar34) == '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar34 + lVar44) == '\0') goto LAB_002c93e3;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ +
                          lVar44 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
          if (*(char *)(lVar44 + lVar36) == '\0') {
            piVar1 = (int *)(lVar43 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ +
                            lVar42 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar36 + lVar42) == '\0') goto LAB_002c99f2;
            lVar36 = *(long *)img_labels.accesses_._72_8_;
          }
          else {
            lVar36 = *(long *)img_labels.accesses_._72_8_;
          }
          goto LAB_002c99c2;
        }
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 + lVar44 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar44 + img.img_._16_8_ + lVar36 * lVar43) == '\0') {
          lVar36 = img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24;
          piVar1 = (int *)(lVar39 + lVar36);
          *piVar1 = *piVar1 + 1;
          local_2d8 = img_labels.img_._16_8_ + lVar24 * *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar39 + local_2d8);
          piVar1 = (int *)(lVar36 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002c9559;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar42 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar36 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar42 + lVar43 * lVar36 + img.img_._16_8_) != '\0') {
          lVar36 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar43 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar28 * lVar43 + img_labels.img_._16_8_ + lVar42 * 4);
          piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = lVar43 * lVar24 + img_labels.img_._16_8_;
          goto LAB_002c99ea;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar42 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)img_labels.accesses_._72_8_;
        lVar34 = lVar43 * lVar28 + img_labels.accesses_._16_8_;
        if (*(char *)(lVar42 + img.img_._16_8_ + lVar36 * lVar28) != '\0') {
          piVar1 = (int *)(lVar34 + lVar39);
          *piVar1 = *piVar1 + 1;
          lVar36 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(lVar39 + lVar28 * lVar36 + img_labels.img_._16_8_);
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar43 * lVar24 + lVar42 * 4);
          *piVar1 = *piVar1 + 1;
          lVar36 = lVar36 * lVar24 + img_labels.img_._16_8_;
          goto LAB_002c969c;
        }
        piVar1 = (int *)(lVar34 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar28 * lVar36 + img_labels.img_._16_8_ + lVar42 * 4);
        piVar1 = (int *)(lVar39 + img_labels.accesses_._16_8_ + lVar43 * lVar24);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar39 + lVar36 * lVar24 + img_labels.img_._16_8_);
        goto LAB_002c9afb;
      }
      lVar31 = *(long *)img.accesses_._72_8_;
      lVar41 = lVar31 * lVar24 + lVar44;
      piVar1 = (int *)(lVar41 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar4 = *(long *)img.img_._72_8_;
      lVar37 = lVar4 * lVar24 + lVar25;
      local_138 = img_labels.img_._16_8_;
      local_2d8 = img_labels.img_._16_8_;
      uVar13 = img_labels.img_._16_8_;
      local_120 = img_labels.accesses_._16_8_;
      lVar34 = img_labels.accesses_._16_8_;
      local_2f0 = img_labels.accesses_._16_8_;
      local_2d0 = img_labels.accesses_._16_8_;
      local_2c8 = img_labels.accesses_._16_8_;
      local_2c0 = img_labels.img_._16_8_;
      local_1f0 = img_labels.img_._16_8_;
      local_1e0 = img_labels.accesses_._16_8_;
      local_1d8 = img_labels.img_._16_8_;
      local_1d0 = img_labels.accesses_._16_8_;
      local_1c8 = img_labels.img_._16_8_;
      local_1b8 = img_labels.accesses_._16_8_;
      local_1b0 = img_labels.img_._16_8_;
      local_1a8 = img_labels.accesses_._16_8_;
      local_198 = img_labels.img_._16_8_;
      local_188 = img_labels.img_._16_8_;
      local_180 = img_labels.accesses_._16_8_;
      local_178 = img_labels.accesses_._16_8_;
      local_170 = img_labels.img_._16_8_;
      local_168 = img_labels.accesses_._16_8_;
      if (*(char *)(lVar21 + 2 + lVar37) != '\0') {
        uVar15 = (ulong)(iVar23 + 2) + lVar21;
        lVar25 = lVar18 + 0x300000000 >> 0x20;
        piVar1 = (int *)((lVar18 + 0x300000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img.img_._72_8_;
        lVar19 = lVar44 * lVar43 + img.img_._16_8_;
        if (*(char *)(lVar25 + lVar19) != '\0') {
          piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 +
                           lVar42 * 4 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          uVar22 = img_labels.img_._16_8_;
          if (*(char *)(lVar21 + 2 + lVar19 + lVar42) == '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ +
                             lVar42 * 4 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            local_148 = *(long *)img_labels.accesses_._72_8_;
            if (*(char *)(lVar21 + 2 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_ + lVar42)
                == '\0') {
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar28 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + lVar34 * lVar28 + 8 +
                               lVar21 * 4);
              piVar1 = (int *)(lVar39 + local_148 * lVar24 + img_labels.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar39 + lVar34 * lVar24 +
                                                             img_labels.img_._16_8_));
              local_148 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(local_148 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_150 = *(long *)img_labels.img_._72_8_;
              local_120 = img_labels.accesses_._16_8_;
              uVar22 = img_labels.img_._16_8_;
              lVar40 = img_labels.accesses_._16_8_;
              lVar34 = local_150;
              uVar13 = img_labels.img_._16_8_;
              local_3f8 = (long *)img_labels.img_._72_8_;
              local_3e0 = (long *)img_labels.accesses_._72_8_;
              local_2f8 = local_148;
              local_2f0 = img_labels.accesses_._16_8_;
              local_2e8 = local_150;
              local_2d8 = img_labels.img_._16_8_;
              local_2d0 = img_labels.accesses_._16_8_;
              local_2c8 = img_labels.accesses_._16_8_;
              local_2c0 = img_labels.img_._16_8_;
              local_1f0 = img_labels.img_._16_8_;
              local_1e8 = local_150;
              local_1e0 = img_labels.accesses_._16_8_;
              local_1d8 = img_labels.img_._16_8_;
              local_1d0 = img_labels.accesses_._16_8_;
              local_1c8 = img_labels.img_._16_8_;
              local_1c0 = local_150;
              local_1b8 = img_labels.accesses_._16_8_;
              local_1b0 = img_labels.img_._16_8_;
              local_1a8 = img_labels.accesses_._16_8_;
              local_1a0 = local_148;
              local_198 = img_labels.img_._16_8_;
              local_190 = local_150;
              local_188 = img_labels.img_._16_8_;
              local_180 = img_labels.accesses_._16_8_;
              local_178 = img_labels.accesses_._16_8_;
              local_170 = img_labels.img_._16_8_;
              local_168 = img_labels.accesses_._16_8_;
              local_138 = img_labels.img_._16_8_;
            }
            else {
              piVar1 = (int *)(local_148 * lVar28 + img_labels.accesses_._16_8_ + lVar39);
              *piVar1 = *piVar1 + 1;
              local_150 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(lVar39 + local_150 * lVar28 + img_labels.img_._16_8_);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar24 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = local_150;
              local_2f8 = local_148;
              local_2e8 = local_150;
              local_1e8 = local_150;
              local_1c0 = local_150;
              local_1a0 = local_148;
              local_190 = local_150;
            }
          }
          else {
            local_148 = *(long *)img_labels.accesses_._72_8_;
            lVar34 = img_labels.accesses_._16_8_ + lVar42 * 4;
            piVar1 = (int *)(local_148 * lVar28 + lVar34 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            local_150 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_150 * lVar28 + 8 +
                             lVar21 * 4);
            piVar1 = (int *)(lVar34 + local_148 * lVar24 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = local_150;
            local_2f8 = local_148;
            local_2e8 = local_150;
            local_1e8 = local_150;
            local_1c0 = local_150;
            local_1a0 = local_148;
            local_190 = local_150;
          }
          goto LAB_002c6cd0;
        }
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + lVar25 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar25 + img.img_._16_8_ + lVar44 * lVar24) == '\0') {
          lVar34 = img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24;
          piVar1 = (int *)(lVar39 + lVar34);
          *piVar1 = *piVar1 + 1;
          lVar44 = img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar24;
          uVar10 = *(undefined4 *)(lVar39 + lVar44);
          piVar1 = (int *)(lVar34 + lVar42 * 4 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar44 + lVar42 * 4 + 8 + lVar21 * 4) = uVar10;
          uVar16 = uVar15 & 0xffffffff;
          goto LAB_002c1370;
        }
        lVar40 = lVar18 + 0x400000000 >> 0x20;
        piVar1 = (int *)((lVar18 + 0x400000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar44 = *(long *)img.img_._72_8_;
        if (*(char *)(lVar40 + lVar44 * lVar43 + img.img_._16_8_) == '\0') {
          lVar34 = img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24;
          piVar1 = (int *)(lVar39 + lVar34);
          *piVar1 = *piVar1 + 1;
          local_2d8 = img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar24;
          uVar10 = *(undefined4 *)(lVar39 + local_2d8);
          piVar1 = (int *)(lVar34 + lVar42 * 4 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_2d8 = local_2d8 + lVar42 * 4;
          local_308 = uVar15;
          goto LAB_002c5903;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar25 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar25 + img.img_._16_8_ + lVar44 * lVar28) == '\0') {
          lVar34 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar34 * lVar28 + img_labels.accesses_._16_8_ + lVar40 * 4);
          *piVar1 = *piVar1 + 1;
          lVar44 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar44 * lVar28 + img_labels.img_._16_8_ + lVar40 * 4);
          piVar1 = (int *)(lVar39 + lVar34 * lVar24 + img_labels.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar39 + lVar44 * lVar24 + img_labels.img_._16_8_));
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4) =
               uVar9;
          local_120 = img_labels.accesses_._16_8_;
          lVar34 = img_labels.accesses_._16_8_;
          uVar13 = img_labels.img_._16_8_;
          local_138 = img_labels.img_._16_8_;
          uVar16 = uVar15;
          local_3f8 = (long *)img_labels.img_._72_8_;
          local_3e0 = (long *)img_labels.accesses_._72_8_;
          local_2f8 = lVar44;
          local_2f0 = img_labels.accesses_._16_8_;
          local_2e8 = local_158;
          local_2d8 = img_labels.img_._16_8_;
          local_2d0 = img_labels.accesses_._16_8_;
          local_2c8 = img_labels.accesses_._16_8_;
          local_2c0 = img_labels.img_._16_8_;
          local_1f0 = img_labels.img_._16_8_;
          local_1e8 = local_158;
          local_1e0 = img_labels.accesses_._16_8_;
          local_1d8 = img_labels.img_._16_8_;
          local_1d0 = img_labels.accesses_._16_8_;
          local_1c8 = img_labels.img_._16_8_;
          local_1c0 = local_158;
          local_1b8 = img_labels.accesses_._16_8_;
          local_1b0 = img_labels.img_._16_8_;
          local_1a8 = img_labels.accesses_._16_8_;
          local_1a0 = lVar44;
          local_198 = img_labels.img_._16_8_;
          local_190 = local_158;
          local_188 = img_labels.img_._16_8_;
          local_180 = img_labels.accesses_._16_8_;
          local_178 = img_labels.accesses_._16_8_;
          local_170 = img_labels.img_._16_8_;
          local_168 = img_labels.accesses_._16_8_;
        }
        else {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ +
                           lVar42 * 4 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar40 = *(long *)img.img_._72_8_;
          if (*(char *)(lVar21 + 2 + lVar40 * lVar43 + img.img_._16_8_ + lVar42) == '\0') {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ +
                             lVar42 * 4 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            if (*(char *)(lVar21 + 2 + img.img_._16_8_ + lVar42 + lVar40 * lVar28) == '\0') {
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar28 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = *(long *)img_labels.img_._72_8_;
              uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + lVar34 * lVar28 + 8 +
                               lVar21 * 4);
              piVar1 = (int *)(lVar39 + lVar44 * lVar24 + img_labels.accesses_._16_8_);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar39 + lVar34 * lVar24 +
                                                             img_labels.img_._16_8_));
              lVar44 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_158 = *(long *)img_labels.img_._72_8_;
              *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4) =
                   uVar9;
              local_120 = img_labels.accesses_._16_8_;
              lVar34 = img_labels.accesses_._16_8_;
              uVar13 = img_labels.img_._16_8_;
              local_138 = img_labels.img_._16_8_;
              uVar16 = uVar15 & 0xffffffff;
              local_3f8 = (long *)img_labels.img_._72_8_;
              local_3e0 = (long *)img_labels.accesses_._72_8_;
              local_2f8 = lVar44;
              local_2f0 = img_labels.accesses_._16_8_;
              local_2e8 = local_158;
              local_2d8 = img_labels.img_._16_8_;
              local_2d0 = img_labels.accesses_._16_8_;
              local_2c8 = img_labels.accesses_._16_8_;
              local_2c0 = img_labels.img_._16_8_;
              local_1f0 = img_labels.img_._16_8_;
              local_1e8 = local_158;
              local_1e0 = img_labels.accesses_._16_8_;
              local_1d8 = img_labels.img_._16_8_;
              local_1d0 = img_labels.accesses_._16_8_;
              local_1c8 = img_labels.img_._16_8_;
              local_1c0 = local_158;
              local_1b8 = img_labels.accesses_._16_8_;
              local_1b0 = img_labels.img_._16_8_;
              local_1a8 = img_labels.accesses_._16_8_;
              local_1a0 = lVar44;
              local_198 = img_labels.img_._16_8_;
              local_190 = local_158;
              local_188 = img_labels.img_._16_8_;
              local_180 = img_labels.accesses_._16_8_;
              local_178 = img_labels.accesses_._16_8_;
              local_170 = img_labels.img_._16_8_;
              local_168 = img_labels.accesses_._16_8_;
            }
            else {
              piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + lVar39);
              *piVar1 = *piVar1 + 1;
              local_158 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(undefined4 *)(lVar39 + local_158 * lVar28 + img_labels.img_._16_8_);
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)
               (img_labels.img_._16_8_ + lVar42 * 4 + local_158 * lVar24 + 8 + lVar21 * 4) = uVar10;
              uVar16 = uVar15 & 0xffffffff;
              local_2f8 = lVar44;
              local_2e8 = local_158;
              local_2d0 = local_2f0;
              local_2c8 = local_2f0;
              local_2c0 = local_2d8;
              local_1f0 = local_2d8;
              local_1e8 = local_158;
              local_1e0 = local_2f0;
              local_1d8 = local_2d8;
              local_1d0 = local_2f0;
              local_1c8 = local_2d8;
              local_1c0 = local_158;
              local_1b8 = local_2f0;
              local_1b0 = local_2d8;
              local_1a8 = local_2f0;
              local_1a0 = lVar44;
              local_198 = local_2d8;
              local_190 = local_158;
              local_188 = local_2d8;
              local_180 = local_2f0;
              local_178 = local_2f0;
              local_170 = local_2d8;
              local_168 = local_2f0;
            }
          }
          else {
            lVar44 = *(long *)img_labels.accesses_._72_8_;
            lVar40 = img_labels.accesses_._16_8_ + lVar42 * 4;
            piVar1 = (int *)(lVar44 * lVar28 + lVar40 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            local_158 = *(long *)img_labels.img_._72_8_;
            lVar42 = img_labels.img_._16_8_ + lVar42 * 4;
            uVar10 = *(undefined4 *)(local_158 * lVar28 + lVar42 + 8 + lVar21 * 4);
            piVar1 = (int *)(lVar40 + lVar44 * lVar24 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_158 * lVar24 + lVar42 + 8 + lVar21 * 4) = uVar10;
            uVar16 = uVar15 & 0xffffffff;
            local_2f8 = lVar44;
            local_2e8 = local_158;
            local_1e8 = local_158;
            local_1c0 = local_158;
            local_1a0 = lVar44;
            local_190 = local_158;
          }
        }
        goto LAB_002c2a4a;
      }
      piVar1 = (int *)(lVar41 + 0xc + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar21 + 3 + lVar37) == '\0') break;
      lVar39 = lVar44 + lVar31 * lVar43;
      piVar1 = (int *)(lVar39 + 0xc + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar37 = lVar25 + lVar4 * lVar43;
      if (*(char *)(lVar21 + 3 + lVar37) == '\0') {
        lVar19 = lVar18 + 0x400000000 >> 0x20;
        piVar1 = (int *)(img.accesses_._16_8_ + lVar31 * lVar43 + (lVar18 + 0x400000000 >> 0x1e));
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(img.img_._16_8_ + lVar4 * lVar43 + lVar19);
        piVar1 = (int *)(lVar39 + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        local_308 = (ulong)(iVar23 + 2) + lVar21;
        cVar8 = *(char *)(lVar21 + 2 + lVar37);
        if (cVar26 == '\0') {
          uVar16 = lVar42 + lVar21 + 2;
          if (cVar8 == '\0') goto LAB_002c6914;
          local_148 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar28 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_150 = *(long *)img_labels.img_._72_8_;
          uVar15 = local_308;
          local_308 = img_labels.img_._16_8_;
          local_2f8 = local_148;
          local_2e8 = local_150;
          local_1e8 = local_150;
          local_1c0 = local_150;
          local_1a0 = local_148;
          local_190 = local_150;
          local_128 = local_150;
          goto LAB_002c4188;
        }
        if (cVar8 == '\0') {
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(local_158 * lVar28 + img_labels.img_._16_8_ + lVar19 * 4);
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = img_labels.img_._16_8_ + lVar42 * 4;
          goto LAB_002c564f;
        }
        piVar1 = (int *)(lVar44 + lVar31 * lVar28 + 0xc + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar21 + 3 + lVar25 + lVar4 * lVar28);
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        lVar40 = lVar44 * lVar28 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar40 + lVar42 * 4 + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        local_158 = *(long *)img_labels.img_._72_8_;
        lVar25 = local_158 * lVar28 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar25 + lVar42 * 4 + 8 + lVar21 * 4);
        if (cVar26 == '\0') {
          piVar1 = (int *)(lVar40 + lVar19 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar25 + lVar19 * 4));
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          lVar34 = local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4;
          goto LAB_002c57e6;
        }
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 + lVar21 * 4
                        );
        *piVar1 = *piVar1 + 1;
        *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_158 * lVar24 + 8 + lVar21 * 4) = uVar9
        ;
        uVar16 = local_308;
        local_2f8 = lVar44;
        local_2f0 = local_168;
        local_2e8 = local_158;
        local_2d8 = local_188;
        local_2d0 = local_168;
        local_2c8 = local_168;
        local_2c0 = local_188;
        local_1f0 = local_188;
        local_1e8 = local_158;
        local_1e0 = local_168;
        local_1d8 = local_188;
        local_1d0 = local_168;
        local_1c8 = local_188;
        local_1c0 = local_158;
        local_1b8 = local_168;
        local_1b0 = local_188;
        local_1a8 = local_168;
        local_1a0 = lVar44;
        local_198 = local_188;
        local_190 = local_158;
        local_180 = local_168;
        local_178 = local_168;
        local_170 = local_188;
        goto LAB_002c2a4a;
      }
      lVar34 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar34 * lVar28 + lVar32 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar40 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar40 * lVar28 + lVar19 + lVar21 * 4);
      piVar1 = (int *)(lVar34 * lVar24 + lVar32 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(lVar40 * lVar24 + lVar19 + lVar21 * 4) = uVar10;
      lVar18 = lVar18 + 0x200000000;
      lVar21 = lVar21 + 2;
    }
    piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 +
                     *(long *)img_labels.accesses_._72_8_ * lVar24 + 8 + lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    iVar23 = iVar23 + (int)lVar21;
    local_2e8 = *(long *)img_labels.img_._72_8_;
    lVar42 = lVar42 + lVar21;
LAB_002c4f8d:
    iVar23 = iVar23 + 2;
    uVar16 = lVar42 + 2;
    local_138 = img_labels.img_._16_8_;
LAB_002c1b5a:
    *(undefined4 *)(local_2e8 * lVar24 + local_138 + uVar16 * 4) = 0;
    local_3e0 = (long *)img_labels.accesses_._72_8_;
    local_3f8 = (long *)img_labels.img_._72_8_;
    lVar42 = (long)iVar23;
    lVar44 = lVar42 << 0x20;
    lVar21 = 0;
LAB_002c1bed:
    uVar16 = lVar42 + lVar21 + 2;
    lVar25 = lVar44 >> 0x1e;
    if ((long)uVar16 < lVar36) {
      lVar18 = *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar42 * 4 + 8;
      piVar1 = (int *)(lVar18 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      lVar19 = *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_ + 2 + lVar42;
      uVar13 = img_labels.img_._16_8_;
      local_138 = img_labels.img_._16_8_;
      lVar40 = img_labels.accesses_._16_8_;
      local_2d8 = img_labels.img_._16_8_;
      local_120 = img_labels.accesses_._16_8_;
      lVar34 = img_labels.accesses_._16_8_;
      local_2f0 = img_labels.accesses_._16_8_;
      local_2d0 = img_labels.accesses_._16_8_;
      local_2c8 = img_labels.accesses_._16_8_;
      local_2c0 = img_labels.img_._16_8_;
      local_1f0 = img_labels.img_._16_8_;
      local_1e0 = img_labels.accesses_._16_8_;
      local_1d8 = img_labels.img_._16_8_;
      local_1d0 = img_labels.accesses_._16_8_;
      local_1c8 = img_labels.img_._16_8_;
      local_1b8 = img_labels.accesses_._16_8_;
      local_1b0 = img_labels.img_._16_8_;
      local_1a8 = img_labels.accesses_._16_8_;
      local_198 = img_labels.img_._16_8_;
      local_188 = img_labels.img_._16_8_;
      local_180 = img_labels.accesses_._16_8_;
      local_178 = img_labels.accesses_._16_8_;
      local_170 = img_labels.img_._16_8_;
      local_168 = img_labels.accesses_._16_8_;
      if (*(char *)(lVar21 + lVar19) == '\0') {
        piVar1 = (int *)(lVar18 + 4 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar21 + 1 + lVar19) != '\0') goto LAB_002c1e6f;
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 +
                         img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)
         (*(long *)img_labels.img_._72_8_ * lVar24 + img_labels.img_._16_8_ + lVar42 * 4 + 8 +
         lVar21 * 4) = 0;
        lVar44 = lVar44 + 0x200000000;
        lVar21 = lVar21 + 2;
        goto LAB_002c1bed;
      }
      uVar15 = (ulong)(iVar23 + 2) + lVar21;
      lVar19 = lVar44 + 0x300000000 >> 0x20;
      piVar1 = (int *)((lVar44 + 0x300000000 >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar18 = *(long *)img.img_._72_8_;
      lVar32 = lVar18 * lVar43 + img.img_._16_8_;
      if (*(char *)(lVar19 + lVar32) != '\0') {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 + lVar42 * 4
                         + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        uVar22 = img_labels.img_._16_8_;
        if (*(char *)(lVar21 + 2 + lVar32 + lVar42) == '\0') {
          piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          lVar34 = *(long *)img.img_._72_8_;
          if (*(char *)((lVar44 + 0x100000000 >> 0x20) + lVar34 * lVar43 + img.img_._16_8_) == '\0')
          {
            local_148 = *(long *)img_labels.accesses_._72_8_;
            lVar34 = img_labels.accesses_._16_8_ + lVar42 * 4;
            piVar1 = (int *)(local_148 * lVar28 + lVar34 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            local_150 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_150 * lVar28 + 8 +
                             lVar21 * 4);
            piVar1 = (int *)(lVar34 + local_148 * lVar24 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            lVar34 = local_150;
            local_2f8 = local_148;
            local_2f0 = local_168;
            local_2e8 = local_150;
            local_2d8 = local_138;
            local_2d0 = local_168;
            local_2c8 = local_168;
            local_2c0 = local_138;
            local_1f0 = local_138;
            local_1e8 = local_150;
            local_1e0 = local_168;
            local_1d8 = local_138;
            local_1d0 = local_168;
            local_1c8 = local_138;
            local_1c0 = local_150;
            local_1b8 = local_168;
            local_1b0 = local_138;
            local_1a8 = local_168;
            local_1a0 = local_148;
            local_198 = local_138;
            local_190 = local_150;
            local_188 = local_138;
            local_180 = local_168;
            local_178 = local_168;
            local_170 = local_138;
          }
          else {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ +
                             lVar42 * 4 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            cVar26 = *(char *)(lVar21 + 2 + img.img_._16_8_ + lVar42 + lVar34 * lVar28);
            local_148 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar25 + img_labels.accesses_._16_8_ + local_148 * lVar28);
            *piVar1 = *piVar1 + 1;
            local_150 = *(long *)img_labels.img_._72_8_;
            uVar9 = *(uint *)(lVar25 + img_labels.img_._16_8_ + local_150 * lVar28);
            if (cVar26 == '\0') {
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar28 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              uVar9 = TTA::MemMerge(uVar9,*(uint *)(img_labels.img_._16_8_ + lVar42 * 4 +
                                                    local_150 * lVar28 + 8 + lVar21 * 4));
              local_148 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(local_148 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              local_150 = *(long *)img_labels.img_._72_8_;
              local_120 = img_labels.accesses_._16_8_;
              uVar22 = img_labels.img_._16_8_;
              lVar40 = img_labels.accesses_._16_8_;
              lVar34 = local_150;
              uVar13 = img_labels.img_._16_8_;
              local_3f8 = (long *)img_labels.img_._72_8_;
              local_3e0 = (long *)img_labels.accesses_._72_8_;
              local_2f8 = local_148;
              local_2f0 = img_labels.accesses_._16_8_;
              local_2e8 = local_150;
              local_2d8 = img_labels.img_._16_8_;
              local_2d0 = img_labels.accesses_._16_8_;
              local_2c8 = img_labels.accesses_._16_8_;
              local_2c0 = img_labels.img_._16_8_;
              local_1f0 = img_labels.img_._16_8_;
              local_1e8 = local_150;
              local_1e0 = img_labels.accesses_._16_8_;
              local_1d8 = img_labels.img_._16_8_;
              local_1d0 = img_labels.accesses_._16_8_;
              local_1c8 = img_labels.img_._16_8_;
              local_1c0 = local_150;
              local_1b8 = img_labels.accesses_._16_8_;
              local_1b0 = img_labels.img_._16_8_;
              local_1a8 = img_labels.accesses_._16_8_;
              local_1a0 = local_148;
              local_198 = img_labels.img_._16_8_;
              local_190 = local_150;
              local_188 = img_labels.img_._16_8_;
              local_180 = img_labels.accesses_._16_8_;
              local_178 = img_labels.accesses_._16_8_;
              local_170 = img_labels.img_._16_8_;
              local_168 = img_labels.accesses_._16_8_;
              local_138 = img_labels.img_._16_8_;
            }
            else {
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar24 + 8 +
                              lVar21 * 4);
              *piVar1 = *piVar1 + 1;
              lVar34 = local_150;
              local_2f8 = local_148;
              local_2e8 = local_150;
              local_1e8 = local_150;
              local_1c0 = local_150;
              local_1a0 = local_148;
              local_190 = local_150;
            }
          }
        }
        else {
          local_148 = *(long *)img_labels.accesses_._72_8_;
          lVar34 = img_labels.accesses_._16_8_ + lVar42 * 4;
          piVar1 = (int *)(local_148 * lVar28 + lVar34 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_150 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_150 * lVar28 + 8 +
                           lVar21 * 4);
          piVar1 = (int *)(lVar34 + local_148 * lVar24 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = local_150;
          local_2f8 = local_148;
          local_2e8 = local_150;
          local_1e8 = local_150;
          local_1c0 = local_150;
          local_1a0 = local_148;
          local_190 = local_150;
        }
        goto LAB_002c6cd0;
      }
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + lVar19 * 4);
      *piVar1 = *piVar1 + 1;
      lVar32 = *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_;
      if (*(char *)(lVar19 + img.img_._16_8_ + lVar18 * lVar24) == '\0') {
        piVar1 = (int *)(lVar32 + lVar42 * 4 + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        lVar34 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
        if (*(char *)(lVar21 + 2 + lVar34 + lVar42) == '\0') {
          piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                          *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar34 + (lVar44 + 0x100000000 >> 0x20)) == '\0') {
            uVar9 = TTA::MemNewLabel();
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 +
                             img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(*(long *)img_labels.img_._72_8_ * lVar24 + img_labels.img_._16_8_ + lVar42 * 4
                      + 8 + lVar21 * 4) = uVar9;
            uVar16 = uVar15 & 0xffffffff;
          }
          else {
            lVar34 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar25 + lVar34 * lVar28 + img_labels.accesses_._16_8_);
            *piVar1 = *piVar1 + 1;
            lVar44 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(undefined4 *)(lVar25 + lVar44 * lVar28 + img_labels.img_._16_8_);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar34 * lVar24 + 8 +
                            lVar21 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(img_labels.img_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 + lVar21 * 4)
                 = uVar10;
            uVar16 = uVar15 & 0xffffffff;
          }
        }
        else {
          lVar40 = *(long *)img_labels.accesses_._72_8_;
          lVar34 = img_labels.accesses_._16_8_ + lVar42 * 4;
          piVar1 = (int *)(lVar40 * lVar28 + lVar34 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar25 = *(long *)img_labels.img_._72_8_;
          lVar44 = img_labels.img_._16_8_ + lVar42 * 4;
          uVar10 = *(undefined4 *)(lVar25 * lVar28 + lVar44 + 8 + lVar21 * 4);
          piVar1 = (int *)(lVar40 * lVar24 + lVar34 + 8 + lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(lVar25 * lVar24 + lVar44 + 8 + lVar21 * 4) = uVar10;
          uVar16 = uVar15 & 0xffffffff;
        }
        goto LAB_002c1370;
      }
      piVar1 = (int *)(lVar32 + (lVar44 + 0x400000000 >> 0x1e));
      *piVar1 = *piVar1 + 1;
      lVar18 = lVar44 + 0x400000000 >> 0x20;
      lVar32 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
      cVar26 = *(char *)(lVar18 + lVar32);
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar42 * 4 +
                       8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      cVar8 = *(char *)(lVar21 + 2 + lVar32 + lVar42);
      local_308 = uVar15;
      if (cVar26 == '\0') {
        if (cVar8 != '\0') {
          local_148 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar28 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_150 = *(long *)img_labels.img_._72_8_;
          local_308 = img_labels.img_._16_8_;
          local_2f8 = local_148;
          local_2e8 = local_150;
          local_1e8 = local_150;
          local_1c0 = local_150;
          local_1a0 = local_148;
          local_190 = local_150;
          local_128 = local_150;
          goto LAB_002c4188;
        }
        piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                        *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        if (*(char *)((lVar44 + 0x100000000 >> 0x20) +
                     *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_) == '\0') {
          uVar9 = TTA::MemNewLabel();
          local_2f8 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_2e8 = *(long *)img_labels.img_._72_8_;
        }
        else {
          local_2f8 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar25 + local_2f8 * lVar28 + img_labels.accesses_._16_8_);
          *piVar1 = *piVar1 + 1;
          local_2e8 = *(long *)img_labels.img_._72_8_;
          uVar9 = *(uint *)(lVar25 + local_2e8 * lVar28 + img_labels.img_._16_8_);
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_2f8 * lVar24 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
        }
        local_2c8 = img_labels.accesses_._16_8_;
        local_2f0 = img_labels.accesses_._16_8_;
        local_2d8 = img_labels.img_._16_8_;
        local_120 = img_labels.accesses_._16_8_;
        local_138 = img_labels.img_._16_8_;
        local_3f8 = (long *)img_labels.img_._72_8_;
        local_3e0 = (long *)img_labels.accesses_._72_8_;
        local_2c0 = img_labels.img_._16_8_;
        local_1e0 = img_labels.accesses_._16_8_;
        local_1d8 = img_labels.img_._16_8_;
        goto LAB_002c39da;
      }
      if (cVar8 == '\0') {
        piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                        img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43);
        *piVar1 = *piVar1 + 1;
        lVar40 = *(long *)img.img_._72_8_;
        if (*(char *)((lVar44 + 0x100000000 >> 0x20) + lVar40 * lVar43 + img.img_._16_8_) == '\0') {
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          local_158 = *(long *)img_labels.img_._72_8_;
          uVar10 = *(undefined4 *)(local_158 * lVar28 + img_labels.img_._16_8_ + lVar18 * 4);
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          lVar34 = img_labels.img_._16_8_ + lVar42 * 4;
LAB_002c564f:
          *(undefined4 *)(lVar34 + local_158 * lVar24 + 8 + lVar21 * 4) = uVar10;
          local_120 = img_labels.accesses_._16_8_;
          lVar34 = img_labels.accesses_._16_8_;
          uVar13 = img_labels.img_._16_8_;
          local_138 = img_labels.img_._16_8_;
          uVar16 = local_308 & 0xffffffff;
          local_3f8 = (long *)img_labels.img_._72_8_;
          local_3e0 = (long *)img_labels.accesses_._72_8_;
          local_2f8 = lVar44;
          local_2f0 = img_labels.accesses_._16_8_;
          local_2e8 = local_158;
          local_2d8 = img_labels.img_._16_8_;
          local_2d0 = img_labels.accesses_._16_8_;
          local_2c8 = img_labels.accesses_._16_8_;
          local_2c0 = img_labels.img_._16_8_;
          local_1f0 = img_labels.img_._16_8_;
          local_1e8 = local_158;
          local_1e0 = img_labels.accesses_._16_8_;
          local_1d8 = img_labels.img_._16_8_;
          local_1d0 = img_labels.accesses_._16_8_;
          local_1c8 = img_labels.img_._16_8_;
          local_1c0 = local_158;
          local_1b8 = img_labels.accesses_._16_8_;
          local_1b0 = img_labels.img_._16_8_;
          local_1a8 = img_labels.accesses_._16_8_;
          local_1a0 = lVar44;
          local_198 = img_labels.img_._16_8_;
          local_190 = local_158;
          local_188 = img_labels.img_._16_8_;
          local_180 = img_labels.accesses_._16_8_;
          local_178 = img_labels.accesses_._16_8_;
          local_170 = img_labels.img_._16_8_;
          local_168 = img_labels.accesses_._16_8_;
          goto LAB_002c2a4a;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar19 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar19 + img.img_._16_8_ + lVar40 * lVar28) == '\0') {
          lVar44 = img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar28;
          piVar1 = (int *)(lVar25 + lVar44);
          *piVar1 = *piVar1 + 1;
          lVar34 = img_labels.img_._16_8_ + *(long *)img_labels.img_._72_8_ * lVar28;
          uVar9 = *(uint *)(lVar25 + lVar34);
          piVar1 = (int *)(lVar44 + lVar18 * 4);
          *piVar1 = *piVar1 + 1;
          uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar34 + lVar18 * 4));
          local_3e0 = (long *)img_labels.accesses_._72_8_;
          lVar44 = *(long *)img_labels.accesses_._72_8_;
          piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          local_3f8 = (long *)img_labels.img_._72_8_;
          local_158 = *(long *)img_labels.img_._72_8_;
          *(uint *)(local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4) =
               uVar9;
          local_1d8 = img_labels.img_._16_8_;
          local_1e0 = img_labels.accesses_._16_8_;
          local_2c0 = img_labels.img_._16_8_;
          local_2c8 = img_labels.accesses_._16_8_;
          local_2d8 = img_labels.img_._16_8_;
          local_2f0 = img_labels.accesses_._16_8_;
          local_188 = img_labels.img_._16_8_;
          local_168 = img_labels.accesses_._16_8_;
          local_180 = img_labels.accesses_._16_8_;
          local_170 = img_labels.img_._16_8_;
          local_178 = img_labels.accesses_._16_8_;
          local_1b0 = img_labels.img_._16_8_;
          local_1b8 = img_labels.accesses_._16_8_;
          local_198 = img_labels.img_._16_8_;
          local_1a8 = img_labels.accesses_._16_8_;
          local_1f0 = img_labels.img_._16_8_;
          local_2d0 = img_labels.accesses_._16_8_;
          local_1c8 = img_labels.img_._16_8_;
          local_1d0 = img_labels.accesses_._16_8_;
          local_120 = img_labels.accesses_._16_8_;
          lVar34 = img_labels.accesses_._16_8_;
          uVar13 = img_labels.img_._16_8_;
          local_138 = img_labels.img_._16_8_;
          uVar16 = uVar15 & 0xffffffff;
          local_2f8 = lVar44;
          local_2e8 = local_158;
          local_1e8 = local_158;
          local_1c0 = local_158;
          local_1a0 = lVar44;
          local_190 = local_158;
          goto LAB_002c2a4a;
        }
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar42 * 4
                         + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar21 + 2 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_ + lVar42
                          );
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar25 + img_labels.accesses_._16_8_ + lVar44 * lVar28);
        *piVar1 = *piVar1 + 1;
        local_158 = *(long *)img_labels.img_._72_8_;
        uVar9 = *(uint *)(lVar25 + img_labels.img_._16_8_ + local_158 * lVar28);
        if (cVar26 != '\0') {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          goto LAB_002c2284;
        }
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar28 + 8 + lVar21 * 4
                        );
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_158 * lVar28 + 8 + lVar21 * 4
                          );
      }
      else {
        piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar28 + lVar19 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar19 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_);
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        lVar40 = lVar44 * lVar28 + img_labels.accesses_._16_8_;
        piVar1 = (int *)(lVar40 + lVar42 * 4 + 8 + lVar21 * 4);
        *piVar1 = *piVar1 + 1;
        local_158 = *(long *)img_labels.img_._72_8_;
        lVar25 = local_158 * lVar28 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar25 + lVar42 * 4 + 8 + lVar21 * 4);
        if (cVar26 != '\0') {
          piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 +
                          lVar21 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_158 * lVar24 + 8 + lVar21 * 4) =
               uVar9;
          uVar16 = uVar15 & 0xffffffff;
          local_2f8 = lVar44;
          local_2f0 = local_168;
          local_2e8 = local_158;
          local_2d8 = local_170;
          local_2d0 = local_168;
          local_2c8 = local_168;
          local_2c0 = local_170;
          local_1f0 = local_170;
          local_1e8 = local_158;
          local_1e0 = local_168;
          local_1d8 = local_170;
          local_1d0 = local_168;
          local_1c8 = local_170;
          local_1c0 = local_158;
          local_1b8 = local_168;
          local_1b0 = local_170;
          local_1a8 = local_168;
          local_1a0 = lVar44;
          local_198 = local_170;
          local_190 = local_158;
          local_188 = local_170;
          local_180 = local_168;
          local_178 = local_168;
          goto LAB_002c2a4a;
        }
        piVar1 = (int *)(lVar40 + lVar18 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar25 + lVar18 * 4);
      }
      uVar9 = TTA::MemMerge(uVar9,uVar30);
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      local_158 = *(long *)img_labels.img_._72_8_;
      lVar34 = local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4;
      goto LAB_002c57e6;
    }
    lVar42 = lVar44 + 0x200000000 >> 0x20;
    piVar1 = (int *)((lVar44 + 0x200000000 >> 0x1e) +
                    *(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_);
    *piVar1 = *piVar1 + 1;
    lVar36 = *(long *)img.img_._72_8_;
    lVar34 = lVar36 * lVar24 + img.img_._16_8_;
    cVar26 = *(char *)(lVar42 + lVar34);
    if (iVar27 < iVar23 + (int)lVar21 + 2) {
      if (cVar26 == '\0') {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24
                        + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)
         (img_labels.img_._16_8_ + lVar24 * *(long *)img_labels.img_._72_8_ + lVar42 * 4) = 0;
        goto LAB_002c9b2c;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar42 + img.img_._16_8_ + lVar36 * lVar43) != '\0') {
        lVar36 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar28 * lVar43 + img_labels.img_._16_8_ + lVar42 * 4);
        piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = lVar43 * lVar24 + img_labels.img_._16_8_;
        goto LAB_002c99ea;
      }
      piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                      *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      if (*(char *)((lVar44 + 0x100000000 >> 0x20) +
                   lVar43 * *(long *)img.img_._72_8_ + img.img_._16_8_) == '\0') goto LAB_002c99f2;
      lVar36 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar25 + lVar36 * lVar28 + img_labels.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      lVar43 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(lVar25 + lVar28 * lVar43 + img_labels.img_._16_8_);
      piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = lVar43 * lVar24 + img_labels.img_._16_8_;
      goto LAB_002c969c;
    }
    lVar40 = lVar44 + 0x300000000 >> 0x20;
    if (cVar26 == '\0') {
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar24 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar34 + lVar40) == '\0') {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24
                        + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)
         (img_labels.img_._16_8_ + lVar24 * *(long *)img_labels.img_._72_8_ + lVar42 * 4) = 0;
        goto LAB_002c9b2c;
      }
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
      if (*(char *)(lVar40 + lVar36) != '\0') goto LAB_002c8f74;
      piVar1 = (int *)(lVar43 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar36 + lVar42) == '\0') goto LAB_002c99f2;
LAB_002c98ac:
      lVar36 = *(long *)img_labels.accesses_._72_8_;
    }
    else {
      piVar1 = (int *)(img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43 + lVar40 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar40 + img.img_._16_8_ + lVar36 * lVar43);
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar42 * 4);
      *piVar1 = *piVar1 + 1;
      lVar36 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
      if (cVar26 == '\0') {
        if (*(char *)(lVar42 + lVar36) != '\0') goto LAB_002c98ac;
        piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                        lVar43 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar36 + (lVar44 + 0x100000000 >> 0x20)) == '\0') goto LAB_002c99f2;
        lVar36 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar25 + lVar36 * lVar28 + img_labels.accesses_._16_8_);
        *piVar1 = *piVar1 + 1;
        lVar43 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(undefined4 *)(lVar25 + lVar28 * lVar43 + img_labels.img_._16_8_);
        piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        lVar36 = lVar43 * lVar24 + img_labels.img_._16_8_;
LAB_002c969c:
        *(undefined4 *)(lVar36 + lVar42 * 4) = uVar10;
        goto LAB_002c9b2c;
      }
      if (*(char *)(lVar42 + lVar36) != '\0') goto LAB_002c98ac;
      piVar1 = (int *)((lVar44 + 0x100000000 >> 0x1e) +
                      lVar43 * *(long *)img.accesses_._72_8_ + img.accesses_._16_8_);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(lVar36 + (lVar44 + 0x100000000 >> 0x20)) != '\0') {
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar42 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        cVar26 = *(char *)(lVar42 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_);
        lVar36 = *(long *)img_labels.accesses_._72_8_;
        lVar34 = lVar36 * lVar28 + img_labels.accesses_._16_8_;
        *(int *)(lVar25 + lVar34) = *(int *)(lVar25 + lVar34) + 1;
        lVar43 = *(long *)img_labels.img_._72_8_;
        lVar28 = lVar28 * lVar43 + img_labels.img_._16_8_;
        uVar9 = *(uint *)(lVar25 + lVar28);
        if (cVar26 == '\0') goto LAB_002c9982;
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar36 * lVar24 + lVar42 * 4);
        *piVar1 = *piVar1 + 1;
        goto LAB_002c8c63;
      }
LAB_002c8f74:
      lVar36 = *(long *)img_labels.accesses_._72_8_;
    }
    piVar1 = (int *)(lVar36 * lVar28 + img_labels.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar43 = *(long *)img_labels.img_._72_8_;
    uVar10 = *(undefined4 *)(lVar28 * lVar43 + img_labels.img_._16_8_ + lVar42 * 4);
    piVar1 = (int *)(lVar36 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4);
    *piVar1 = *piVar1 + 1;
    lVar36 = lVar43 * lVar24 + img_labels.img_._16_8_;
    goto LAB_002c99ea;
  }
  uVar15 = (ulong)(iVar23 + 2) + lVar21;
  lVar34 = lVar44 + 0x300000000 >> 0x20;
  piVar1 = (int *)((lVar44 + 0x300000000 >> 0x1e) +
                  img.accesses_._16_8_ + *(long *)img.accesses_._72_8_ * lVar43);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar34 + img.img_._16_8_ + lVar40 * lVar43) != '\0') {
    piVar1 = (int *)(local_2f8 * lVar28 + local_2f0 + lVar42 * 4 + 8 + lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    uVar9 = *(uint *)(local_2e8 * lVar28 + local_2d8 + lVar42 * 4 + 8 + lVar21 * 4);
    piVar1 = (int *)(lVar25 + local_2f8 * lVar24 + local_2f0);
    *piVar1 = *piVar1 + 1;
    uVar9 = TTA::MemMerge(uVar9,*(uint *)(lVar25 + local_2e8 * lVar24 + local_2d8));
    local_148 = *(long *)img_labels.accesses_._72_8_;
    piVar1 = (int *)(local_148 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    local_150 = *(long *)img_labels.img_._72_8_;
    local_120 = img_labels.accesses_._16_8_;
    uVar22 = img_labels.img_._16_8_;
    lVar40 = img_labels.accesses_._16_8_;
    lVar34 = local_150;
    uVar13 = img_labels.img_._16_8_;
    local_3f8 = (long *)img_labels.img_._72_8_;
    local_3e0 = (long *)img_labels.accesses_._72_8_;
    local_2f8 = local_148;
    local_2f0 = img_labels.accesses_._16_8_;
    local_2e8 = local_150;
    local_2d8 = img_labels.img_._16_8_;
    local_2d0 = img_labels.accesses_._16_8_;
    local_2c8 = img_labels.accesses_._16_8_;
    local_2c0 = img_labels.img_._16_8_;
    local_1f0 = img_labels.img_._16_8_;
    local_1e8 = local_150;
    local_1e0 = img_labels.accesses_._16_8_;
    local_1d8 = img_labels.img_._16_8_;
    local_1d0 = img_labels.accesses_._16_8_;
    local_1c8 = img_labels.img_._16_8_;
    local_1c0 = local_150;
    local_1b8 = img_labels.accesses_._16_8_;
    local_1b0 = img_labels.img_._16_8_;
    local_1a8 = img_labels.accesses_._16_8_;
    local_1a0 = local_148;
    local_198 = img_labels.img_._16_8_;
    local_190 = local_150;
    local_188 = img_labels.img_._16_8_;
    local_180 = img_labels.accesses_._16_8_;
    local_178 = img_labels.accesses_._16_8_;
    local_170 = img_labels.img_._16_8_;
    local_168 = img_labels.accesses_._16_8_;
    local_138 = img_labels.img_._16_8_;
    goto LAB_002c6cd0;
  }
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar34 * 4);
  *piVar1 = *piVar1 + 1;
  lVar40 = *(long *)img.img_._72_8_;
  if (*(char *)(lVar34 + lVar40 * lVar24 + img.img_._16_8_) == '\0') {
    local_2f0 = local_2f0 + local_2f8 * lVar24;
    piVar1 = (int *)(lVar25 + local_2f0);
    *piVar1 = *piVar1 + 1;
    local_2d8 = local_2d8 + local_2e8 * lVar24;
    uVar10 = *(undefined4 *)(lVar25 + local_2d8);
    piVar1 = (int *)(local_2f0 + lVar42 * 4 + 8 + lVar21 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(local_2d8 + lVar42 * 4 + 8 + lVar21 * 4) = uVar10;
    uVar16 = uVar15 & 0xffffffff;
    goto LAB_002c1370;
  }
  lVar18 = lVar44 + 0x400000000 >> 0x20;
  piVar1 = (int *)((lVar44 + 0x400000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  local_308 = uVar15;
  if (*(char *)(lVar18 + img.img_._16_8_ + lVar40 * lVar43) != '\0') {
    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar34 * 4);
    *piVar1 = *piVar1 + 1;
    lVar40 = local_2f8 * lVar28 + local_2f0;
    lVar25 = local_2e8 * lVar28 + local_2d8;
    if (*(char *)(lVar34 + *(long *)img.img_._72_8_ * lVar28 + img.img_._16_8_) == '\0') {
      piVar1 = (int *)(lVar40 + lVar18 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = *(uint *)(lVar25 + lVar18 * 4);
    }
    else {
      piVar1 = (int *)(lVar40 + lVar42 * 4 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      uVar9 = *(uint *)(lVar25 + lVar42 * 4 + 8 + lVar21 * 4);
    }
    piVar1 = (int *)(local_2f8 * lVar24 + local_2f0 + (lVar44 >> 0x20) * 4);
    *piVar1 = *piVar1 + 1;
    uVar30 = *(uint *)(local_2e8 * lVar24 + local_2d8 + (lVar44 >> 0x20) * 4);
    goto LAB_002c4135;
  }
  local_2f0 = local_2f0 + local_2f8 * lVar24;
  piVar1 = (int *)(lVar25 + local_2f0);
  *piVar1 = *piVar1 + 1;
  local_2d8 = local_2d8 + local_2e8 * lVar24;
  uVar10 = *(undefined4 *)(lVar25 + local_2d8);
  piVar1 = (int *)(local_2f0 + lVar42 * 4 + 8 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  local_2d8 = local_2d8 + lVar42 * 4;
LAB_002c5903:
  *(undefined4 *)(local_2d8 + 8 + lVar21 * 4) = uVar10;
  uVar16 = local_308;
  goto LAB_002c5e54;
code_r0x002c3b15:
  uVar9 = TTA::MemNewLabel();
  local_2f0 = img_labels.accesses_._16_8_;
  local_3e0 = (long *)img_labels.accesses_._72_8_;
  local_2f8 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + lVar34 + 8 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  local_2c0 = img_labels.img_._16_8_;
  local_3f8 = (long *)img_labels.img_._72_8_;
  local_2e8 = *(long *)img_labels.img_._72_8_;
  *(uint *)(local_2e8 * lVar24 + img_labels.img_._16_8_ + lVar34 + 8 + lVar21 * 4) = uVar9;
  lVar44 = lVar44 + 0x200000000;
  lVar21 = lVar21 + 2;
  local_2d8 = img_labels.img_._16_8_;
  local_120 = img_labels.accesses_._16_8_;
  local_138 = img_labels.img_._16_8_;
  local_2c8 = local_2f0;
  local_1e0 = local_2f0;
  local_1d8 = local_2c0;
  goto LAB_002c3a14;
LAB_002c1e6f:
  local_308 = (ulong)(iVar23 + 2) + lVar21;
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar42 * 4 + 0xc
                  + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  lVar25 = *(long *)img.img_._72_8_ * lVar43 + img.img_._16_8_;
  uVar16 = lVar42 + 2 + lVar21;
  if (*(char *)(lVar42 + lVar21 + 3 + lVar25) == '\0') goto LAB_002c215c;
  local_2f8 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_2f8 * lVar28 + 8 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  local_158 = *(long *)img_labels.img_._72_8_;
  goto LAB_002c4b9e;
LAB_002c215c:
  piVar1 = (int *)((lVar44 + 0x400000000 >> 0x1e) +
                  *(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_);
  *piVar1 = *piVar1 + 1;
  lVar18 = lVar44 + 0x400000000 >> 0x20;
  cVar26 = *(char *)(lVar25 + lVar18);
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar43 + img.accesses_._16_8_ + lVar42 * 4 + 8 +
                  lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  lVar44 = *(long *)img.img_._72_8_;
  cVar8 = *(char *)(lVar21 + 2 + lVar44 * lVar43 + img.img_._16_8_ + lVar42);
  if (cVar26 != '\0') {
    if (cVar8 == '\0') {
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      piVar1 = (int *)(lVar44 * lVar28 + img_labels.accesses_._16_8_ + lVar18 * 4);
      *piVar1 = *piVar1 + 1;
      local_158 = *(long *)img_labels.img_._72_8_;
      uVar10 = *(undefined4 *)(local_158 * lVar28 + img_labels.img_._16_8_ + lVar18 * 4);
      piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(img_labels.img_._16_8_ + lVar42 * 4 + local_158 * lVar24 + 8 + lVar21 * 4) =
           uVar10;
      uVar16 = local_308 & 0xffffffff;
      local_2f8 = lVar44;
      local_2f0 = local_168;
      local_2e8 = local_158;
      local_2d8 = local_170;
      local_2d0 = local_168;
      local_2c8 = local_168;
      local_2c0 = local_170;
      local_1f0 = local_170;
      local_1e8 = local_158;
      local_1e0 = local_168;
      local_1d8 = local_170;
      local_1d0 = local_168;
      local_1c8 = local_170;
      local_1c0 = local_158;
      local_1b8 = local_168;
      local_1b0 = local_170;
      local_1a8 = local_168;
      local_1a0 = lVar44;
      local_198 = local_170;
      local_190 = local_158;
      local_188 = local_170;
      local_180 = local_168;
      local_178 = local_168;
    }
    else {
      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar28 + img.accesses_._16_8_ + lVar42 * 4 +
                       0xc + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      cVar26 = *(char *)(lVar21 + 3 + img.img_._16_8_ + lVar42 + lVar44 * lVar28);
      lVar44 = *(long *)img_labels.accesses_._72_8_;
      lVar40 = lVar44 * lVar28 + img_labels.accesses_._16_8_;
      piVar1 = (int *)(lVar40 + lVar42 * 4 + 8 + lVar21 * 4);
      *piVar1 = *piVar1 + 1;
      local_158 = *(long *)img_labels.img_._72_8_;
      lVar25 = local_158 * lVar28 + img_labels.img_._16_8_;
      uVar9 = *(uint *)(lVar25 + lVar42 * 4 + 8 + lVar21 * 4);
      if (cVar26 == '\0') {
        piVar1 = (int *)(lVar40 + lVar18 * 4);
        *piVar1 = *piVar1 + 1;
        uVar30 = *(uint *)(lVar25 + lVar18 * 4);
LAB_002c4135:
        uVar9 = TTA::MemMerge(uVar9,uVar30);
        lVar44 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar44 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4
                        );
        *piVar1 = *piVar1 + 1;
        local_158 = *(long *)img_labels.img_._72_8_;
        lVar34 = local_158 * lVar24 + img_labels.img_._16_8_ + lVar42 * 4;
LAB_002c57e6:
        *(uint *)(lVar34 + 8 + lVar21 * 4) = uVar9;
        local_120 = img_labels.accesses_._16_8_;
        lVar34 = img_labels.accesses_._16_8_;
        uVar13 = img_labels.img_._16_8_;
        local_138 = img_labels.img_._16_8_;
        uVar16 = local_308 & 0xffffffff;
        local_3f8 = (long *)img_labels.img_._72_8_;
        local_3e0 = (long *)img_labels.accesses_._72_8_;
        local_2f8 = lVar44;
        local_2f0 = img_labels.accesses_._16_8_;
        local_2e8 = local_158;
        local_2d8 = img_labels.img_._16_8_;
        local_2d0 = img_labels.accesses_._16_8_;
        local_2c8 = img_labels.accesses_._16_8_;
        local_2c0 = img_labels.img_._16_8_;
        local_1f0 = img_labels.img_._16_8_;
        local_1e8 = local_158;
        local_1e0 = img_labels.accesses_._16_8_;
        local_1d8 = img_labels.img_._16_8_;
        local_1d0 = img_labels.accesses_._16_8_;
        local_1c8 = img_labels.img_._16_8_;
        local_1c0 = local_158;
        local_1b8 = img_labels.accesses_._16_8_;
        local_1b0 = img_labels.img_._16_8_;
        local_1a8 = img_labels.accesses_._16_8_;
        local_1a0 = lVar44;
        local_198 = img_labels.img_._16_8_;
        local_190 = local_158;
        local_188 = img_labels.img_._16_8_;
        local_180 = img_labels.accesses_._16_8_;
        local_178 = img_labels.accesses_._16_8_;
        local_170 = img_labels.img_._16_8_;
        local_168 = img_labels.accesses_._16_8_;
      }
      else {
        piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + lVar44 * lVar24 + 8 + lVar21 * 4
                        );
        *piVar1 = *piVar1 + 1;
LAB_002c2284:
        *(uint *)(img_labels.img_._16_8_ + lVar42 * 4 + local_158 * lVar24 + 8 + lVar21 * 4) = uVar9
        ;
        uVar16 = local_308 & 0xffffffff;
        local_2f8 = lVar44;
        local_2e8 = local_158;
        local_1e8 = local_158;
        local_1c0 = local_158;
        local_1a0 = lVar44;
        local_190 = local_158;
      }
    }
    goto LAB_002c2a4a;
  }
  if (cVar8 != '\0') {
    local_148 = *(long *)img_labels.accesses_._72_8_;
    piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar42 * 4 + local_148 * lVar28 + 8 + lVar21 * 4)
    ;
    *piVar1 = *piVar1 + 1;
    local_150 = *(long *)img_labels.img_._72_8_;
    uVar15 = local_308;
    local_308 = img_labels.img_._16_8_;
    local_2f8 = local_148;
    local_2e8 = local_150;
    local_1e8 = local_150;
    local_1c0 = local_150;
    local_1a0 = local_148;
    local_190 = local_150;
    local_128 = local_150;
    goto LAB_002c4188;
  }
  uVar9 = TTA::MemNewLabel();
  local_2f8 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  local_2e8 = *(long *)img_labels.img_._72_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_120 = img_labels.accesses_._16_8_;
  local_138 = img_labels.img_._16_8_;
  local_3f8 = (long *)img_labels.img_._72_8_;
  local_3e0 = (long *)img_labels.accesses_._72_8_;
  local_2f0 = img_labels.accesses_._16_8_;
  local_2c8 = img_labels.accesses_._16_8_;
  local_2c0 = img_labels.img_._16_8_;
  local_1e0 = img_labels.accesses_._16_8_;
  local_1d8 = img_labels.img_._16_8_;
  goto LAB_002c39da;
LAB_002c6914:
  uVar9 = TTA::MemNewLabel();
  local_2f8 = *(long *)img_labels.accesses_._72_8_;
  piVar1 = (int *)(local_2f8 * lVar24 + img_labels.accesses_._16_8_ + lVar42 * 4 + 8 + lVar21 * 4);
  *piVar1 = *piVar1 + 1;
  local_2e8 = *(long *)img_labels.img_._72_8_;
  local_2d8 = img_labels.img_._16_8_;
  local_120 = img_labels.accesses_._16_8_;
  local_138 = img_labels.img_._16_8_;
  local_3f8 = (long *)img_labels.img_._72_8_;
  local_3e0 = (long *)img_labels.accesses_._72_8_;
  local_2f0 = img_labels.accesses_._16_8_;
  local_2c8 = img_labels.accesses_._16_8_;
  local_2c0 = img_labels.img_._16_8_;
  local_1e0 = img_labels.accesses_._16_8_;
  local_1d8 = img_labels.img_._16_8_;
  goto LAB_002c39da;
LAB_002c93e3:
  piVar1 = (int *)(img_labels.accesses_._16_8_ + *(long *)img_labels.accesses_._72_8_ * lVar24 +
                  lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(img_labels.img_._16_8_ + lVar24 * *(long *)img_labels.img_._72_8_ + lVar42 * 4) =
       0;
  goto LAB_002c9b2c;
LAB_002c99f2:
  uVar9 = TTA::MemNewLabel();
LAB_002c9b00:
  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar24 + img_labels.accesses_._16_8_ +
                  lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  *(uint *)(lVar24 * *(long *)img_labels.img_._72_8_ + img_labels.img_._16_8_ + lVar42 * 4) = uVar9;
  goto LAB_002c9b2c;
LAB_002c85f7:
  lVar36 = (long)iVar12;
  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar24 + img.accesses_._16_8_ + lVar36 * 4);
  *piVar1 = *piVar1 + 1;
  if (*(char *)(lVar36 + *(long *)img.img_._72_8_ * lVar24 + img.img_._16_8_) == '\0') {
    piVar1 = (int *)(lVar40 + *local_3e0 * lVar24 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(local_308 + lVar24 * *local_3f8 + lVar36 * 4) = 0;
  }
  else {
    lVar40 = lVar40 + *local_3e0 * lVar24;
    piVar1 = (int *)(lVar40 + -8 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    lVar28 = local_308 + lVar24 * *local_3f8;
    uVar10 = *(undefined4 *)(lVar28 + -8 + lVar36 * 4);
    piVar1 = (int *)(lVar40 + lVar36 * 4);
    *piVar1 = *piVar1 + 1;
    *(undefined4 *)(lVar28 + lVar36 * 4) = uVar10;
  }
  goto LAB_002c9b2c;
LAB_002b018c:
  uVar16 = (ulong)(iVar11 + iVar35 + 2);
LAB_002b01f4:
  *(int *)(img_labels.accesses_._16_8_ + lVar40) =
       *(int *)(img_labels.accesses_._16_8_ + lVar40) + 1;
  uVar10 = *(undefined4 *)(img_labels.img_._16_8_ + lVar40);
  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar34 * 4 + 8 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(img_labels.img_._16_8_ + lVar34 * 4 + 8 + lVar42 * 4) = uVar10;
  uVar13 = uVar16;
  goto LAB_002afee4;
LAB_002afd8e:
  *(int *)(lVar34 + lVar40) = *(int *)(lVar34 + lVar40) + 1;
  uVar10 = *(undefined4 *)(lVar44 + lVar40);
  piVar1 = (int *)(lVar34 + lVar36 * 4 + 0x10 + lVar42 * 4);
  *piVar1 = *piVar1 + 1;
  *(undefined4 *)(lVar44 + lVar36 * 4 + 0x10 + lVar42 * 4) = uVar10;
LAB_002afdd9:
  iVar23 = iVar12 + (int)lVar42 + 4;
  goto LAB_002afbfe;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

#define CONDITION_B img(r-2, c-1)>0
#define CONDITION_C img(r-2, c)>0
#define CONDITION_D img(r-2, c+1)>0
#define CONDITION_E img(r-2, c+2)>0

#define CONDITION_G img(r-1, c-2)>0
#define CONDITION_H img(r-1, c-1)>0
#define CONDITION_I img(r-1, c)>0
#define CONDITION_J img(r-1, c+1)>0
#define CONDITION_K img(r-1, c+2)>0

#define CONDITION_M img(r, c-2)>0
#define CONDITION_N img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P img(r,c+1)>0

#define CONDITION_R img(r+1, c-1)>0
#define CONDITION_S img(r+1, c)>0
#define CONDITION_T img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2);
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c);
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2);
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c));
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2));
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2));
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2));
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2));
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2));
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2));
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2));
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2));


        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }